

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  short *psVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined4 uVar11;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  _func_int *p_Var45;
  Layer *pLVar46;
  size_t sVar47;
  undefined4 uVar48;
  undefined1 uVar49;
  undefined1 uVar51;
  undefined1 uVar53;
  undefined1 uVar55;
  undefined1 uVar56;
  undefined1 uVar57;
  undefined1 uVar59;
  undefined1 uVar61;
  undefined4 uVar62;
  undefined1 uVar63;
  undefined1 uVar65;
  undefined1 uVar67;
  undefined1 uVar69;
  undefined1 uVar70;
  undefined1 uVar71;
  undefined1 uVar73;
  undefined1 uVar75;
  undefined1 auVar76 [14];
  undefined1 auVar77 [12];
  unkbyte10 Var78;
  undefined1 auVar79 [14];
  undefined1 auVar80 [12];
  unkbyte10 Var81;
  undefined1 auVar82 [14];
  undefined1 auVar83 [12];
  unkbyte10 Var84;
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [14];
  undefined1 auVar93 [12];
  undefined1 auVar94 [14];
  undefined1 auVar95 [12];
  undefined1 auVar96 [12];
  undefined1 auVar97 [14];
  undefined1 auVar98 [12];
  undefined1 auVar99 [14];
  undefined1 auVar100 [12];
  undefined1 auVar101 [14];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [12];
  unkbyte10 Var105;
  int n_2;
  int iVar106;
  ulong uVar107;
  undefined1 (*pauVar108) [16];
  short asVar109 [4];
  int *piVar110;
  uint uVar111;
  uint uVar112;
  ulong uVar113;
  undefined1 (*pauVar114) [16];
  short asVar115 [4];
  short asVar116 [4];
  long lVar117;
  short asVar118 [4];
  ulong uVar119;
  undefined1 *puVar120;
  ulong uVar121;
  undefined1 (*pauVar122) [16];
  void *pvVar123;
  undefined1 (*pauVar124) [16];
  int j_2;
  short asVar125 [4];
  int u;
  uint uVar126;
  long lVar127;
  long lVar128;
  ulong uVar129;
  long lVar130;
  long lVar131;
  short asVar132 [4];
  short asVar133 [4];
  long lVar134;
  int j_1;
  uint uVar135;
  undefined8 *puVar136;
  Mat *pMVar137;
  undefined8 *puVar138;
  short asVar139 [4];
  int u_1;
  int iVar140;
  undefined1 *puVar141;
  ulong uVar142;
  ulong uVar143;
  void *pvVar144;
  int i;
  int iVar145;
  long lVar146;
  ulong uVar147;
  short asVar148 [4];
  short asVar149 [4];
  short asVar150 [4];
  short asVar151 [4];
  void *pvVar152;
  int v_1;
  undefined1 *puVar153;
  ulong uVar154;
  void *pvVar155;
  size_t sVar156;
  short asVar157 [4];
  int iVar158;
  long lVar159;
  short asVar160 [4];
  void *pvVar161;
  long lVar162;
  long lVar163;
  int u_4;
  int iVar164;
  uint uVar165;
  ulong uVar166;
  void *pvVar167;
  long lVar168;
  int i_2;
  int iVar169;
  short asVar170 [4];
  int *piVar171;
  int i_5;
  short asVar172 [4];
  undefined1 (*pauVar173) [16];
  short asVar174 [4];
  short asVar175 [4];
  void *pvVar176;
  long lVar177;
  long lVar178;
  uint uVar179;
  int iVar180;
  char cVar191;
  char cVar192;
  char cVar193;
  char cVar194;
  char cVar195;
  char cVar196;
  undefined1 auVar181 [16];
  undefined1 auVar189 [16];
  int iVar197;
  undefined1 auVar190 [16];
  undefined8 uVar203;
  uint uVar200;
  int iVar201;
  undefined1 auVar205 [12];
  short sVar230;
  short sVar234;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  short sVar229;
  short sVar233;
  short sVar237;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  int iVar227;
  int iVar231;
  int iVar235;
  undefined1 auVar224 [16];
  int iVar228;
  int iVar232;
  int iVar236;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined8 uVar241;
  short sVar263;
  undefined1 auVar242 [12];
  undefined1 auVar247 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar244 [12];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  short sVar264;
  int iVar266;
  undefined1 auVar270 [12];
  int iVar281;
  undefined1 auVar273 [16];
  undefined1 auVar275 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  int iVar282;
  int iVar283;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  short sVar284;
  short sVar304;
  int iVar285;
  short sVar305;
  short sVar307;
  int iVar306;
  short sVar308;
  undefined1 auVar286 [12];
  short sVar311;
  undefined1 auVar296 [16];
  short sVar310;
  int iVar309;
  int iVar312;
  undefined1 auVar303 [16];
  short sVar313;
  int iVar328;
  int iVar331;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  int iVar334;
  undefined1 auVar325 [16];
  int iVar336;
  int iVar364;
  int iVar365;
  undefined1 auVar337 [16];
  undefined1 auVar343 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  int iVar366;
  int iVar367;
  int iVar387;
  int iVar388;
  int iVar391;
  int iVar392;
  undefined1 auVar368 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  int iVar395;
  int iVar396;
  short sVar414;
  short sVar415;
  short sVar416;
  short sVar417;
  short sVar418;
  undefined1 auVar398 [12];
  undefined1 auVar400 [16];
  undefined1 auVar407 [16];
  short sVar425;
  undefined1 auVar419 [12];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  short sVar428;
  undefined1 auVar426 [12];
  short sVar431;
  undefined1 auVar429 [12];
  undefined1 auVar432 [16];
  undefined1 auVar440 [16];
  Mat *local_710;
  void *local_6f8;
  void *local_6f0;
  undefined1 local_6c8 [24];
  int *local_6b0;
  Mat local_698;
  short local_648 [4];
  ulong local_640;
  short local_638 [4];
  void *local_630;
  short local_628 [4];
  ulong local_620;
  Mat local_618;
  void *local_5c8;
  ulong local_5c0;
  short d0 [4];
  Allocator *local_598;
  int iStack_590;
  int iStack_58c;
  undefined1 auStack_588 [12];
  size_t local_578;
  Mat local_568;
  ulong local_520;
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  short d1 [4];
  void *local_4a8;
  Option opt_b;
  size_t local_458;
  int *local_448;
  void *local_438;
  short w3 [4];
  short local_420 [2];
  short local_41c [2];
  short w2 [4];
  int local_410;
  int local_40c;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 uStack_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  short w1 [4];
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  Option opt_q;
  int aiStack_380 [2];
  undefined1 local_378 [16];
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined1 local_318 [16];
  int aiStack_308 [20];
  undefined1 local_2b8 [16];
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  undefined1 local_258 [16];
  short asStack_248 [48];
  undefined1 auStack_1e8 [96];
  undefined8 local_188;
  long local_180;
  long local_178;
  size_t local_170;
  undefined8 local_168;
  short local_160 [4];
  int local_158 [2];
  int o0 [2];
  short w0 [4];
  Mat local_100;
  short d3 [4];
  short d2 [4];
  undefined7 uVar14;
  undefined7 uVar15;
  undefined6 uVar18;
  undefined6 uVar19;
  undefined5 uVar22;
  undefined5 uVar23;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined3 uVar33;
  undefined3 uVar34;
  undefined3 uVar35;
  undefined2 uVar39;
  undefined2 uVar40;
  undefined2 uVar41;
  undefined4 uVar50;
  undefined3 uVar52;
  undefined2 uVar54;
  undefined3 uVar58;
  undefined2 uVar60;
  undefined4 uVar64;
  undefined3 uVar66;
  undefined2 uVar68;
  undefined3 uVar72;
  undefined2 uVar74;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  short sVar198;
  undefined4 uVar199;
  undefined6 uVar202;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar204 [12];
  undefined1 auVar206 [14];
  undefined1 auVar207 [14];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  short sVar238;
  undefined4 uVar239;
  undefined6 uVar240;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar243 [12];
  undefined1 auVar255 [16];
  undefined1 auVar245 [14];
  undefined1 auVar246 [14];
  undefined1 auVar257 [16];
  undefined1 auVar259 [16];
  undefined4 uVar265;
  undefined6 uVar267;
  undefined8 uVar268;
  undefined1 auVar269 [12];
  undefined1 auVar271 [14];
  undefined1 auVar272 [14];
  undefined1 auVar274 [16];
  undefined1 auVar276 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar297 [16];
  undefined1 auVar291 [16];
  undefined1 auVar298 [16];
  undefined1 auVar292 [16];
  undefined1 auVar299 [16];
  undefined1 auVar287 [14];
  undefined1 auVar293 [16];
  undefined1 auVar300 [16];
  undefined1 auVar294 [16];
  undefined1 auVar301 [16];
  undefined1 auVar288 [16];
  undefined1 auVar295 [16];
  undefined1 auVar302 [16];
  short sVar314;
  undefined1 auVar315 [12];
  undefined1 auVar316 [14];
  undefined1 auVar317 [16];
  short sVar326;
  short sVar327;
  short sVar329;
  short sVar330;
  short sVar332;
  short sVar333;
  short sVar335;
  undefined1 auVar338 [16];
  undefined1 auVar344 [16];
  undefined1 auVar354 [16];
  undefined1 auVar345 [16];
  undefined1 auVar355 [16];
  undefined1 auVar339 [16];
  undefined1 auVar346 [16];
  undefined1 auVar356 [16];
  undefined1 auVar340 [16];
  undefined1 auVar347 [16];
  undefined1 auVar357 [16];
  undefined1 auVar341 [16];
  undefined1 auVar348 [16];
  undefined1 auVar358 [16];
  undefined1 auVar342 [16];
  undefined1 auVar349 [16];
  undefined1 auVar359 [16];
  undefined1 auVar350 [16];
  undefined1 auVar360 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  short sVar385;
  short sVar386;
  short sVar389;
  short sVar390;
  short sVar393;
  short sVar394;
  short sVar397;
  undefined1 auVar401 [16];
  undefined1 auVar408 [16];
  undefined1 auVar402 [16];
  undefined1 auVar409 [16];
  undefined1 auVar403 [16];
  undefined1 auVar410 [16];
  undefined1 auVar399 [16];
  undefined1 auVar404 [16];
  undefined1 auVar411 [16];
  undefined1 auVar405 [16];
  undefined1 auVar412 [16];
  undefined1 auVar406 [16];
  undefined1 auVar413 [16];
  undefined1 auVar420 [16];
  undefined1 auVar427 [16];
  undefined1 auVar430 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  
  local_100.elempack = bottom_blob->elempack;
  local_100.elemsize = bottom_blob->elemsize;
  local_100.data = bottom_blob->data;
  local_100.refcount = bottom_blob->refcount;
  local_100.allocator = bottom_blob->allocator;
  local_100.dims = bottom_blob->dims;
  local_100.w = bottom_blob->w;
  local_100.h = bottom_blob->h;
  local_100.d = bottom_blob->d;
  local_100.c = bottom_blob->c;
  local_100.cstep = bottom_blob->cstep;
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + 1;
    UNLOCK();
  }
  if (local_100.elempack == 0 || ((int)local_100.elemsize * 8) / local_100.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    uVar8 = opt->workspace_allocator;
    uVar11 = opt->openmp_blocktime;
    uVar24 = opt->use_winograd_convolution;
    uVar30 = opt->use_sgemm_convolution;
    uVar36 = opt->use_int8_inference;
    uVar42 = opt->use_vulkan_compute;
    uVar39 = CONCAT11(uVar42,uVar36);
    uVar33 = CONCAT21(uVar39,uVar30);
    uVar27 = CONCAT31(uVar33,uVar24);
    auVar424[0] = opt->use_bf16_storage;
    auVar424[1] = opt->use_fp16_packed;
    auVar424[2] = opt->use_fp16_storage;
    auVar424[3] = opt->use_fp16_arithmetic;
    auVar424[4] = opt->use_int8_packed;
    auVar424[5] = opt->use_int8_storage;
    auVar424[6] = opt->use_int8_arithmetic;
    auVar424[7] = opt->use_packing_layout;
    uVar9 = opt->use_shader_pack8;
    uVar12 = opt->use_subgroup_basic;
    uVar16 = opt->use_subgroup_vote;
    uVar20 = opt->use_subgroup_ballot;
    uVar25 = opt->use_subgroup_shuffle;
    uVar31 = opt->use_image_storage;
    uVar37 = opt->use_tensor_storage;
    uVar43 = opt->use_reserved_0;
    uVar40 = CONCAT11(uVar43,uVar37);
    uVar34 = CONCAT21(uVar40,uVar31);
    uVar28 = CONCAT31(uVar34,uVar25);
    uVar22 = CONCAT41(uVar28,uVar20);
    uVar18 = CONCAT51(uVar22,uVar16);
    uVar14 = CONCAT61(uVar18,uVar12);
    auVar424._8_8_ = CONCAT71(uVar14,uVar9);
    auVar423._0_4_ = opt->flush_denormals;
    auVar423[4] = opt->use_local_pool_allocator;
    auVar423[5] = opt->use_shader_local_memory;
    auVar423[6] = opt->use_cooperative_matrix;
    auVar423[7] = opt->use_winograd23_convolution;
    uVar10 = opt->use_winograd43_convolution;
    uVar13 = opt->use_winograd63_convolution;
    uVar17 = opt->use_a53_a55_optimized_kernel;
    uVar21 = opt->use_reserved_7;
    uVar26 = opt->use_reserved_8;
    uVar32 = opt->use_reserved_9;
    uVar38 = opt->use_reserved_10;
    uVar44 = opt->use_reserved_11;
    uVar41 = CONCAT11(uVar44,uVar38);
    uVar35 = CONCAT21(uVar41,uVar32);
    uVar29 = CONCAT31(uVar35,uVar26);
    uVar23 = CONCAT41(uVar29,uVar21);
    uVar19 = CONCAT51(uVar23,uVar17);
    uVar15 = CONCAT61(uVar19,uVar13);
    auVar423._8_8_ = CONCAT71(uVar15,uVar10);
    opt_q._48_8_ = auVar423._0_8_;
    opt_q._56_4_ = SUB84(auVar423._8_8_,0);
    opt_q._32_8_ = auVar424._0_8_;
    opt_q._40_4_ = SUB84(auVar424._8_8_,0);
    opt_q.workspace_allocator._0_4_ = (undefined4)uVar8;
    opt_q.workspace_allocator._4_4_ = (int)((ulong)uVar8 >> 0x20);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar11;
    opt_q._28_4_ = uVar27;
    opt_q._44_4_ = uVar28;
    opt_q._60_4_ = uVar29;
    quantize_to_int8(bottom_blob,&local_100,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86[-3]),&opt_q);
  }
  local_698.cstep = 0;
  local_698.data = (void *)0x0;
  local_698.refcount._0_4_ = 0;
  local_698.refcount._4_4_ = 0;
  local_698.elemsize = 0;
  local_698.elempack = 0;
  local_698.allocator = (Allocator *)0x0;
  local_698.dims = 0;
  local_698.w = 0;
  local_698.h = 0;
  local_698.d = 0;
  local_698.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),&local_100
             ,&local_698,opt);
  iVar180 = local_698.elempack;
  iVar145 = -100;
  if ((local_698.data == (void *)0x0) || (local_698.cstep * (long)local_698.c == 0))
  goto LAB_001b4854;
  p_Var45 = this->_vptr_Convolution_x86[-3];
  uVar179 = *(uint *)((long)&(this->weight_winograd23_data).dims + (long)p_Var45);
  iVar164 = (~((*(int *)((long)&(this->weight_winograd23_data).w + (long)p_Var45) + -1) *
              *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45)) + local_698.w) /
            *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) + 1;
  iVar158 = (~((*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) + -1) *
              *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45)) + local_698.h) /
            *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) + 1;
  iVar106 = *(int *)((long)&(this->weight_winograd43_data).elempack + (long)p_Var45);
  if (opt->use_packing_layout == true) {
    if (iVar106 < 0x65) {
      uVar135 = (uint)((uVar179 & 3) == 0) * 3 + 1;
    }
    else {
      uVar135 = 1;
      if ((uVar179 & 7) == 0) {
        uVar135 = 8;
      }
    }
  }
  else {
    uVar135 = 1;
  }
  uVar200 = uVar135 * 4;
  if (100 < iVar106) {
    uVar200 = uVar135;
  }
  local_628 = (short  [4])(long)local_698.c;
  Mat::create(top_blob,iVar164,iVar158,(int)uVar179 / (int)uVar135,(ulong)uVar200,uVar135,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001b4854;
  if (opt->use_packing_layout == true) {
    iVar140 = (uint)((*(byte *)((long)&(this->weight_winograd23_data).dims +
                               (long)this->_vptr_Convolution_x86[-3]) & 3) == 0) * 3 + 1;
  }
  else {
    iVar140 = 1;
  }
  local_618.cstep = 0;
  local_618.data = (void *)0x0;
  local_618.refcount._0_4_ = 0;
  local_618.refcount._4_4_ = 0;
  local_618.elemsize = 0;
  local_618.elempack = 0;
  local_618.allocator = (Allocator *)0x0;
  local_618.dims = 0;
  local_618.w = 0;
  local_618.h = 0;
  local_618.d = 0;
  local_618.c = 0;
  local_3f0 = top_blob;
  local_3dc = iVar106;
  Mat::create(&local_618,iVar164,iVar158,
              *(int *)((long)&(this->weight_winograd23_data).dims +
                      (long)this->_vptr_Convolution_x86[-3]) / iVar140,(ulong)(uint)(iVar140 * 4),
              iVar140,opt->workspace_allocator);
  iVar158 = local_618.c;
  uVar200 = local_618.h;
  uVar135 = local_618.w;
  uVar179 = local_698.c;
  iVar106 = local_698.w;
  iVar145 = -100;
  if (((short  [4])local_618.data != (short  [4])0x0) && (local_618.cstep * (long)local_618.c != 0))
  {
    if ((iVar180 != 8) || (iVar140 != 4)) goto LAB_001b251b;
    p_Var45 = this->_vptr_Convolution_x86[-3];
    uVar165 = *(uint *)((long)&(this->weight_winograd23_data).w + (long)p_Var45);
    uVar107 = (ulong)uVar165;
    if ((uVar165 == 1) && (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) == 1))
    {
      if ((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1) ||
         (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1 ||
           (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1)) ||
          (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)))) {
        if (((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1) ||
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1)) ||
           ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 2 ||
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 2))))
        goto LAB_001b1eb9;
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator._0_4_ = 0;
        opt_q.workspace_allocator._4_4_ = 0;
        opt_q.openmp_blocktime = 0;
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_reserved_0 = false;
        opt_q.flush_denormals = 0;
        opt_q.use_local_pool_allocator = false;
        opt_q.use_shader_local_memory = false;
        opt_q.use_cooperative_matrix = false;
        opt_q.use_winograd23_convolution = false;
        opt_q.use_winograd43_convolution = false;
        opt_q.use_winograd63_convolution = false;
        opt_q.use_a53_a55_optimized_kernel = false;
        opt_q.use_reserved_7 = false;
        Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_698.c,local_698.elemsize,
                    local_698.elempack,opt->workspace_allocator);
        uVar129 = 0;
        uVar107 = (ulong)uVar135;
        if ((int)uVar135 < 1) {
          uVar107 = uVar129;
        }
        uVar143 = (ulong)uVar200;
        if ((int)uVar200 < 1) {
          uVar143 = uVar129;
        }
        uVar113 = (ulong)uVar179;
        if ((int)uVar179 < 1) {
          uVar113 = uVar129;
        }
        for (; uVar129 != uVar113; uVar129 = uVar129 + 1) {
          puVar136 = (undefined8 *)
                     (local_698.cstep * uVar129 * local_698.elemsize + (long)local_698.data);
          puVar138 = (undefined8 *)opt_q._0_8_;
          for (iVar145 = 0; uVar166 = uVar107, iVar145 != (int)uVar143; iVar145 = iVar145 + 1) {
            while (iVar158 = (int)uVar166, uVar166 = (ulong)(iVar158 - 1), iVar158 != 0) {
              *puVar138 = *puVar136;
              puVar136 = puVar136 + 2;
              puVar138 = puVar138 + 1;
            }
            puVar136 = puVar136 + (int)((iVar106 - uVar135) * 2);
          }
        }
        conv1x1s1_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
        piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar171 != (int *)0x0) {
          LOCK();
          *piVar171 = *piVar171 + -1;
          UNLOCK();
          if (*piVar171 == 0) {
            if (opt_q._32_8_ == 0) {
LAB_001b4939:
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        goto LAB_001b251b;
      }
      conv1x1s1_sgemm_pack8to4_int8_sse(&local_698,&local_618,&this->weight_sgemm_data,opt);
    }
    else {
LAB_001b1eb9:
      if ((((opt->use_winograd_convolution == true) && (uVar165 == 3)) &&
          (opt->use_winograd43_convolution != false)) &&
         ((((*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) == 3 &&
            (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) == 1)) &&
           (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1)) &&
          ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1 &&
           (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1)))))) {
        iVar106 = cpu_support_x86_xop();
        iVar145 = local_618.c;
        if (iVar106 != 0) {
          conv3x3s1_winograd43_pack8to4_int8_sse_xop
                    (&local_698,&local_618,&this->weight_winograd43_data,opt);
          goto LAB_001b4773;
        }
        local_648[2] = 0;
        local_648[3] = 0;
        local_648[0] = (undefined2)local_698.elempack;
        local_648[1] = local_698.elempack._2_2_;
        piVar171 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
        local_568.data = local_698.data;
        local_568.refcount._0_4_ = local_698.refcount._0_4_;
        local_568.refcount._4_4_ = local_698.refcount._4_4_;
        local_568.elemsize = local_698.elemsize;
        local_568.elempack = local_698.elempack;
        local_568.allocator = local_698.allocator;
        local_568.d = local_698.d;
        local_568.h = local_698.h;
        local_568.dims = local_698.dims;
        local_568.w = local_698.w;
        local_638[0] = (undefined2)local_698.c;
        local_638[1] = local_698.c._2_2_;
        local_568.c = local_698.c;
        local_568.cstep = local_698.cstep;
        if (piVar171 != (int *)0x0) {
          LOCK();
          *piVar171 = *piVar171 + 1;
          UNLOCK();
        }
        auVar256._0_4_ = ((uint)((int)(local_618.w + 3U) >> 0x1f) >> 0x1e) + local_618.w + 3U;
        auVar256._4_4_ = ((uint)((int)(local_618.h + 3U) >> 0x1f) >> 0x1e) + local_618.h + 3U;
        auVar256._8_8_ = 0;
        uVar200 = SUB164(_DAT_004ff130 & auVar256,0);
        uVar165 = SUB164(_DAT_004ff130 & auVar256,4);
        local_5c0 = (ulong)uVar165;
        local_520 = (ulong)uVar200;
        copy_make_border(&local_698,&local_568,0,(uVar165 + 2) - local_698.h,0,
                         (uVar200 + 2) - local_698.w,0,0.0,opt);
        asVar109 = local_638;
        uVar179 = auVar256._0_4_ >> 2;
        uVar135 = auVar256._4_4_ >> 2;
        local_578 = 0;
        iVar106 = uVar179 * 6;
        local_630 = (void *)CONCAT44(local_630._4_4_,iVar106 * uVar135);
        uVar107 = (long)(int)(iVar106 * uVar135) / 6;
        uVar143 = (ulong)(uint)(local_648._0_4_ * 2);
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        local_598 = (Allocator *)0x0;
        iStack_590 = 0;
        iStack_58c = 0;
        auStack_588 = SUB1612((undefined1  [16])0x0,4);
        uVar199 = local_638._0_4_;
        iVar158 = (int)uVar107;
        Mat::create((Mat *)d0,iVar158,0x24,local_638._0_4_,uVar143,local_648._0_4_,
                    opt->workspace_allocator);
        auVar424 = _DAT_004ff140;
        lVar146 = (long)(iVar158 * 8);
        lVar131 = (long)(iVar158 << 4);
        uVar113 = 0;
        local_5c8 = (void *)CONCAT44(local_5c8._4_4_,uVar179);
        uVar129 = 0;
        if (0 < (int)uVar179) {
          uVar129 = (ulong)uVar179;
        }
        local_6c8._4_12_ = ZEXT412(0);
        uVar166 = (ulong)uVar135;
        if ((int)uVar135 < 1) {
          uVar166 = uVar113;
        }
        uVar119 = 0;
        if (0 < (int)uVar199) {
          uVar119 = (ulong)asVar109 & 0xffffffff;
        }
        for (; uVar113 != uVar119; uVar113 = uVar113 + 1) {
          local_710 = (Mat *)((long)local_568.data +
                             local_568.cstep * local_568.elemsize * uVar113 + 0x20);
          for (uVar147 = 0; uVar147 != uVar166; uVar147 = uVar147 + 1) {
            pauVar173 = (undefined1 (*) [16])
                        ((long)((iVar106 * (int)uVar147) / 6) * 0x10 + (long)d0);
            pMVar137 = local_710;
            for (uVar142 = 0; pauVar124 = (undefined1 (*) [16])pMVar137, lVar117 = -0x60,
                uVar142 != uVar129; uVar142 = uVar142 + 1) {
              while( true ) {
                sVar263 = auVar424._0_2_;
                sVar313 = auVar424._2_2_;
                sVar414 = auVar424._4_2_;
                sVar415 = auVar424._6_2_;
                sVar416 = auVar424._8_2_;
                sVar431 = auVar424._10_2_;
                sVar417 = auVar424._12_2_;
                sVar418 = auVar424._14_2_;
                pauVar108 = pauVar173;
                lVar159 = 0x50;
                if (lVar117 == 0) break;
                auVar423 = pauVar124[-2];
                auVar361 = pauVar124[-1];
                auVar273 = *pauVar124;
                auVar350._0_14_ = auVar423._0_14_;
                auVar350[0xe] = auVar423[7];
                auVar350[0xf] = -(auVar423[7] < '\0');
                auVar349._14_2_ = auVar350._14_2_;
                auVar349._0_13_ = auVar423._0_13_;
                auVar349[0xd] = -(auVar423[6] < '\0');
                auVar348._13_3_ = auVar349._13_3_;
                auVar348._0_12_ = auVar423._0_12_;
                auVar348[0xc] = auVar423[6];
                auVar347._12_4_ = auVar348._12_4_;
                auVar347._0_11_ = auVar423._0_11_;
                auVar347[0xb] = -(auVar423[5] < '\0');
                auVar346._11_5_ = auVar347._11_5_;
                auVar346._0_10_ = auVar423._0_10_;
                auVar346[10] = auVar423[5];
                auVar345._10_6_ = auVar346._10_6_;
                auVar345._0_9_ = auVar423._0_9_;
                auVar345[9] = -(auVar423[4] < '\0');
                auVar344._9_7_ = auVar345._9_7_;
                auVar344._0_8_ = auVar423._0_8_;
                auVar344[8] = auVar423[4];
                auVar343._8_8_ = auVar344._8_8_;
                auVar343[7] = -(auVar423[3] < '\0');
                auVar343[6] = auVar423[3];
                auVar343[5] = -(auVar423[2] < '\0');
                auVar343[4] = auVar423[2];
                auVar343[3] = -(auVar423[1] < '\0');
                auVar343[2] = auVar423[1];
                auVar343[1] = -(auVar423[0] < '\0');
                auVar343[0] = auVar423[0];
                sVar238 = CONCAT11(-(auVar423[8] < '\0'),auVar423[8]);
                uVar239 = CONCAT13(-(auVar423[9] < '\0'),CONCAT12(auVar423[9],sVar238));
                uVar240 = CONCAT15(-(auVar423[10] < '\0'),CONCAT14(auVar423[10],uVar239));
                uVar241 = CONCAT17(-(auVar423[0xb] < '\0'),CONCAT16(auVar423[0xb],uVar240));
                auVar243._0_10_ = CONCAT19(-(auVar423[0xc] < '\0'),CONCAT18(auVar423[0xc],uVar241));
                auVar243[10] = auVar423[0xd];
                auVar243[0xb] = -(auVar423[0xd] < '\0');
                auVar245[0xc] = auVar423[0xe];
                auVar245._0_12_ = auVar243;
                auVar245[0xd] = -(auVar423[0xe] < '\0');
                auVar257[0xe] = auVar423[0xf];
                auVar257._0_14_ = auVar245;
                auVar257[0xf] = -(auVar423[0xf] < '\0');
                auVar406._0_14_ = auVar361._0_14_;
                auVar406[0xe] = auVar361[7];
                auVar406[0xf] = -(auVar361[7] < '\0');
                auVar405._14_2_ = auVar406._14_2_;
                auVar405._0_13_ = auVar361._0_13_;
                auVar405[0xd] = -(auVar361[6] < '\0');
                auVar404._13_3_ = auVar405._13_3_;
                auVar404._0_12_ = auVar361._0_12_;
                auVar404[0xc] = auVar361[6];
                auVar403._12_4_ = auVar404._12_4_;
                auVar403._0_11_ = auVar361._0_11_;
                auVar403[0xb] = -(auVar361[5] < '\0');
                auVar402._11_5_ = auVar403._11_5_;
                auVar402._0_10_ = auVar361._0_10_;
                auVar402[10] = auVar361[5];
                auVar401._10_6_ = auVar402._10_6_;
                auVar401._0_9_ = auVar361._0_9_;
                auVar401[9] = -(auVar361[4] < '\0');
                auVar400._9_7_ = auVar401._9_7_;
                auVar400._0_8_ = auVar361._0_8_;
                auVar400[8] = auVar361[4];
                Var78 = CONCAT91(CONCAT81(auVar400._8_8_,-(auVar361[3] < '\0')),auVar361[3]);
                auVar98._2_10_ = Var78;
                auVar98[1] = -(auVar361[2] < '\0');
                auVar98[0] = auVar361[2];
                auVar97._2_12_ = auVar98;
                auVar97[1] = -(auVar361[1] < '\0');
                auVar97[0] = auVar361[1];
                sVar314 = CONCAT11(-(auVar361[0] < '\0'),auVar361[0]);
                sVar198 = CONCAT11(-(auVar361[8] < '\0'),auVar361[8]);
                uVar199 = CONCAT13(-(auVar361[9] < '\0'),CONCAT12(auVar361[9],sVar198));
                uVar202 = CONCAT15(-(auVar361[10] < '\0'),CONCAT14(auVar361[10],uVar199));
                uVar203 = CONCAT17(-(auVar361[0xb] < '\0'),CONCAT16(auVar361[0xb],uVar202));
                auVar204._0_10_ = CONCAT19(-(auVar361[0xc] < '\0'),CONCAT18(auVar361[0xc],uVar203));
                auVar204[10] = auVar361[0xd];
                auVar204[0xb] = -(auVar361[0xd] < '\0');
                auVar206[0xc] = auVar361[0xe];
                auVar206._0_12_ = auVar204;
                auVar206[0xd] = -(auVar361[0xe] < '\0');
                auVar217[0xe] = auVar361[0xf];
                auVar217._0_14_ = auVar206;
                auVar217[0xf] = -(auVar361[0xf] < '\0');
                auVar295._0_14_ = auVar273._0_14_;
                auVar295[0xe] = auVar273[7];
                auVar295[0xf] = -(auVar273[7] < '\0');
                auVar294._14_2_ = auVar295._14_2_;
                auVar294._0_13_ = auVar273._0_13_;
                auVar294[0xd] = -(auVar273[6] < '\0');
                auVar293._13_3_ = auVar294._13_3_;
                auVar293._0_12_ = auVar273._0_12_;
                auVar293[0xc] = auVar273[6];
                auVar292._12_4_ = auVar293._12_4_;
                auVar292._0_11_ = auVar273._0_11_;
                auVar292[0xb] = -(auVar273[5] < '\0');
                auVar291._11_5_ = auVar292._11_5_;
                auVar291._0_10_ = auVar273._0_10_;
                auVar291[10] = auVar273[5];
                auVar290._10_6_ = auVar291._10_6_;
                auVar290._0_9_ = auVar273._0_9_;
                auVar290[9] = -(auVar273[4] < '\0');
                auVar289._9_7_ = auVar290._9_7_;
                auVar289._0_8_ = auVar273._0_8_;
                auVar289[8] = auVar273[4];
                Var81 = CONCAT91(CONCAT81(auVar289._8_8_,-(auVar273[3] < '\0')),auVar273[3]);
                auVar100._2_10_ = Var81;
                auVar100[1] = -(auVar273[2] < '\0');
                auVar100[0] = auVar273[2];
                auVar99._2_12_ = auVar100;
                auVar99[1] = -(auVar273[1] < '\0');
                auVar99[0] = auVar273[1];
                sVar284 = CONCAT11(-(auVar273[0] < '\0'),auVar273[0]);
                sVar264 = CONCAT11(-(auVar273[8] < '\0'),auVar273[8]);
                uVar265 = CONCAT13(-(auVar273[9] < '\0'),CONCAT12(auVar273[9],sVar264));
                uVar267 = CONCAT15(-(auVar273[10] < '\0'),CONCAT14(auVar273[10],uVar265));
                uVar268 = CONCAT17(-(auVar273[0xb] < '\0'),CONCAT16(auVar273[0xb],uVar267));
                auVar269._0_10_ = CONCAT19(-(auVar273[0xc] < '\0'),CONCAT18(auVar273[0xc],uVar268));
                auVar269[10] = auVar273[0xd];
                auVar269[0xb] = -(auVar273[0xd] < '\0');
                auVar271[0xc] = auVar273[0xe];
                auVar271._0_12_ = auVar269;
                auVar271[0xd] = -(auVar273[0xe] < '\0');
                auVar274[0xe] = auVar273[0xf];
                auVar274._0_14_ = auVar271;
                auVar274[0xf] = -(auVar273[0xf] < '\0');
                auVar361 = psllw(auVar343,2);
                sVar304 = auVar99._0_2_;
                sVar305 = auVar100._0_2_;
                sVar307 = (short)Var81;
                sVar308 = auVar289._8_2_;
                sVar310 = auVar291._10_2_;
                sVar311 = auVar293._12_2_;
                auVar377._0_2_ = sVar238 - sVar314;
                sVar385 = (short)((uint)uVar239 >> 0x10);
                sVar326 = auVar97._0_2_;
                auVar377._2_2_ = sVar385 - sVar326;
                sVar386 = (short)((uint6)uVar240 >> 0x20);
                sVar327 = auVar98._0_2_;
                auVar377._4_2_ = sVar386 - sVar327;
                sVar389 = (short)((ulong)uVar241 >> 0x30);
                sVar329 = (short)Var78;
                auVar377._6_2_ = sVar389 - sVar329;
                sVar390 = (short)((unkuint10)auVar243._0_10_ >> 0x40);
                sVar330 = auVar400._8_2_;
                auVar377._8_2_ = sVar390 - sVar330;
                sVar393 = auVar243._10_2_;
                sVar332 = auVar402._10_2_;
                auVar377._10_2_ = sVar393 - sVar332;
                sVar394 = auVar245._12_2_;
                sVar397 = auVar257._14_2_;
                sVar333 = auVar404._12_2_;
                auVar377._12_2_ = sVar394 - sVar333;
                auVar377._14_2_ = sVar397 - auVar405._14_2_;
                sVar425 = (short)((uint)uVar199 >> 0x10);
                sVar428 = (short)((uint6)uVar202 >> 0x20);
                sVar229 = (short)((ulong)uVar203 >> 0x30);
                sVar230 = (short)((unkuint10)auVar204._0_10_ >> 0x40);
                sVar233 = auVar204._10_2_;
                sVar234 = auVar206._12_2_;
                sVar237 = auVar217._14_2_;
                auVar421._0_2_ = sVar314 + sVar238;
                auVar421._2_2_ = sVar326 + sVar385;
                auVar421._4_2_ = sVar327 + sVar386;
                auVar421._6_2_ = sVar329 + sVar389;
                auVar421._8_2_ = sVar330 + sVar390;
                auVar421._10_2_ = sVar332 + sVar393;
                auVar421._12_2_ = sVar333 + sVar394;
                auVar421._14_2_ = auVar405._14_2_ + sVar397;
                auVar423 = psllw(auVar421,2);
                auVar318._0_2_ = (sVar284 + sVar198) - auVar423._0_2_;
                auVar318._2_2_ = (sVar304 + sVar425) - auVar423._2_2_;
                auVar318._4_2_ = (sVar305 + sVar428) - auVar423._4_2_;
                auVar318._6_2_ = (sVar307 + sVar229) - auVar423._6_2_;
                auVar318._8_2_ = (sVar308 + sVar230) - auVar423._8_2_;
                auVar318._10_2_ = (sVar310 + sVar233) - auVar423._10_2_;
                auVar318._12_2_ = (sVar311 + sVar234) - auVar423._12_2_;
                auVar318._14_2_ = (auVar294._14_2_ + sVar237) - auVar423._14_2_;
                auVar423 = psllw(auVar377,2);
                auVar378._0_2_ = auVar423._0_2_ + (sVar284 - sVar198);
                auVar378._2_2_ = auVar423._2_2_ + (sVar304 - sVar425);
                auVar378._4_2_ = auVar423._4_2_ + (sVar305 - sVar428);
                auVar378._6_2_ = auVar423._6_2_ + (sVar307 - sVar229);
                auVar378._8_2_ = auVar423._8_2_ + (sVar308 - sVar230);
                auVar378._10_2_ = auVar423._10_2_ + (sVar310 - sVar233);
                auVar378._12_2_ = auVar423._12_2_ + (sVar311 - sVar234);
                auVar378._14_2_ = auVar423._14_2_ + (auVar294._14_2_ - sVar237);
                auVar351._0_2_ = (sVar238 - sVar198) * 2 + (sVar284 - sVar314);
                auVar351._2_2_ = (sVar385 - sVar425) * 2 + (sVar304 - sVar326);
                auVar351._4_2_ = (sVar386 - sVar428) * 2 + (sVar305 - sVar327);
                auVar351._6_2_ = (sVar389 - sVar229) * 2 + (sVar307 - sVar329);
                auVar351._8_2_ = (sVar390 - sVar230) * 2 + (sVar308 - sVar330);
                auVar351._10_2_ = (sVar393 - sVar233) * 2 + (sVar310 - sVar332);
                auVar351._12_2_ = (sVar394 - sVar234) * 2 + (sVar311 - sVar333);
                auVar351._14_2_ = (sVar397 - sVar237) * 2 + (auVar294._14_2_ - auVar405._14_2_);
                auVar423 = psllw(auVar257,2);
                auVar218._0_2_ = sVar198 * sVar263 + auVar423._0_2_ + sVar264;
                auVar218._2_2_ = sVar425 * sVar313 + auVar423._2_2_ + (short)((uint)uVar265 >> 0x10)
                ;
                auVar218._4_2_ =
                     sVar428 * sVar414 + auVar423._4_2_ + (short)((uint6)uVar267 >> 0x20);
                auVar218._6_2_ =
                     sVar229 * sVar415 + auVar423._6_2_ + (short)((ulong)uVar268 >> 0x30);
                auVar218._8_2_ =
                     sVar230 * sVar416 +
                     auVar423._8_2_ + (short)((unkuint10)auVar269._0_10_ >> 0x40);
                auVar218._10_2_ = sVar233 * sVar431 + auVar423._10_2_ + auVar269._10_2_;
                auVar218._12_2_ = sVar234 * sVar417 + auVar423._12_2_ + auVar271._12_2_;
                auVar218._14_2_ = sVar237 * sVar418 + auVar423._14_2_ + auVar274._14_2_;
                *(short *)((long)&uStack_368 + lVar117) =
                     sVar314 * sVar263 + auVar361._0_2_ + sVar284;
                *(short *)((long)&uStack_368 + lVar117 + 2) =
                     sVar326 * sVar313 + auVar361._2_2_ + sVar304;
                *(short *)((long)&uStack_364 + lVar117) =
                     sVar327 * sVar414 + auVar361._4_2_ + sVar305;
                *(short *)((long)&uStack_364 + lVar117 + 2) =
                     sVar329 * sVar415 + auVar361._6_2_ + sVar307;
                *(short *)((long)&uStack_360 + lVar117) =
                     sVar330 * sVar416 + auVar361._8_2_ + sVar308;
                *(short *)((long)&uStack_360 + lVar117 + 2) =
                     sVar332 * sVar431 + auVar361._10_2_ + sVar310;
                *(short *)((long)&uStack_35c + lVar117) =
                     sVar333 * sVar417 + auVar361._12_2_ + sVar311;
                *(short *)((long)&uStack_35c + lVar117 + 2) =
                     auVar405._14_2_ * sVar418 + auVar361._14_2_ + auVar294._14_2_;
                *(undefined1 (*) [16])((long)aiStack_308 + lVar117) = auVar318;
                *(undefined1 (*) [16])((long)&uStack_2a8 + lVar117) = auVar378;
                *(short *)((long)asStack_248 + lVar117) =
                     (sVar284 - sVar314) + (sVar238 - sVar198) * -2;
                *(short *)((long)asStack_248 + lVar117 + 2) =
                     (sVar304 - sVar326) + (sVar385 - sVar425) * -2;
                *(short *)((long)asStack_248 + lVar117 + 4) =
                     (sVar305 - sVar327) + (sVar386 - sVar428) * -2;
                *(short *)((long)asStack_248 + lVar117 + 6) =
                     (sVar307 - sVar329) + (sVar389 - sVar229) * -2;
                *(short *)((long)asStack_248 + lVar117 + 8) =
                     (sVar308 - sVar330) + (sVar390 - sVar230) * -2;
                *(short *)((long)asStack_248 + lVar117 + 10) =
                     (sVar310 - sVar332) + (sVar393 - sVar233) * -2;
                *(short *)((long)asStack_248 + lVar117 + 0xc) =
                     (sVar311 - sVar333) + (sVar394 - sVar234) * -2;
                *(short *)((long)asStack_248 + lVar117 + 0xe) =
                     (auVar294._14_2_ - auVar405._14_2_) + (sVar397 - sVar237) * -2;
                *(undefined1 (*) [16])(auStack_1e8 + lVar117) = auVar351;
                *(undefined1 (*) [16])((long)&local_188 + lVar117) = auVar218;
                pauVar124 = (undefined1 (*) [16])(*pauVar124 + (int)((uVar200 + 2) * 8));
                lVar117 = lVar117 + 0x10;
              }
              for (; lVar159 != 0x290; lVar159 = lVar159 + 0x60) {
                auVar423 = *(undefined1 (*) [16])((long)&local_408 + lVar159);
                sVar198 = *(short *)((long)&local_3f8 + lVar159);
                sVar425 = *(short *)((long)&local_3f8 + lVar159 + 2);
                sVar428 = *(short *)((long)&local_3f8 + lVar159 + 4);
                sVar229 = *(short *)((long)&local_3f8 + lVar159 + 6);
                sVar230 = *(short *)((long)&local_3f0 + lVar159);
                sVar233 = *(short *)((long)&local_3f0 + lVar159 + 2);
                sVar234 = *(short *)((long)&local_3f0 + lVar159 + 4);
                sVar237 = *(short *)((long)&local_3f0 + lVar159 + 6);
                sVar238 = *(short *)((long)w1 + lVar159);
                sVar264 = *(short *)((long)w1 + lVar159 + 2);
                sVar284 = *(short *)((long)w1 + lVar159 + 4);
                sVar304 = *(short *)((long)w1 + lVar159 + 6);
                sVar305 = *(short *)((long)&uStack_3d0 + lVar159);
                sVar307 = *(short *)((long)&uStack_3d0 + lVar159 + 2);
                sVar308 = *(short *)((long)&uStack_3cc + lVar159);
                sVar310 = *(short *)((long)&uStack_3cc + lVar159 + 2);
                auVar361 = psllw(*(undefined1 (*) [16])((long)w2 + lVar159),2);
                sVar314 = auVar423._0_2_;
                auVar319._0_2_ = sVar314 - sVar198;
                sVar326 = auVar423._2_2_;
                auVar319._2_2_ = sVar326 - sVar425;
                sVar327 = auVar423._4_2_;
                auVar319._4_2_ = sVar327 - sVar428;
                sVar329 = auVar423._6_2_;
                auVar319._6_2_ = sVar329 - sVar229;
                sVar330 = auVar423._8_2_;
                auVar319._8_2_ = sVar330 - sVar230;
                sVar332 = auVar423._10_2_;
                auVar319._10_2_ = sVar332 - sVar233;
                sVar333 = auVar423._12_2_;
                sVar335 = auVar423._14_2_;
                auVar319._12_2_ = sVar333 - sVar234;
                auVar319._14_2_ = sVar335 - sVar237;
                auVar219._0_2_ = auVar361._0_2_ + sVar238 + sVar198 * sVar263;
                auVar219._2_2_ = auVar361._2_2_ + sVar264 + sVar425 * sVar313;
                auVar219._4_2_ = auVar361._4_2_ + sVar284 + sVar428 * sVar414;
                auVar219._6_2_ = auVar361._6_2_ + sVar304 + sVar229 * sVar415;
                auVar219._8_2_ = auVar361._8_2_ + sVar305 + sVar230 * sVar416;
                auVar219._10_2_ = auVar361._10_2_ + sVar307 + sVar233 * sVar431;
                auVar219._12_2_ = auVar361._12_2_ + sVar308 + sVar234 * sVar417;
                auVar219._14_2_ = auVar361._14_2_ + sVar310 + sVar237 * sVar418;
                sVar311 = *(short *)((long)&uStack_3e8 + lVar159);
                sVar385 = *(short *)((long)&uStack_3e8 + lVar159 + 2);
                sVar386 = *(short *)((long)&local_3e4 + lVar159);
                sVar389 = *(short *)((long)&local_3e4 + lVar159 + 2);
                sVar390 = *(short *)((long)&local_3e0 + lVar159);
                sVar393 = *(short *)((long)&local_3e0 + lVar159 + 2);
                sVar394 = *(short *)((long)w1 + lVar159 + -4);
                sVar397 = *(short *)((long)w1 + lVar159 + -2);
                auVar379._0_2_ = sVar198 + sVar314;
                auVar379._2_2_ = sVar425 + sVar326;
                auVar379._4_2_ = sVar428 + sVar327;
                auVar379._6_2_ = sVar229 + sVar329;
                auVar379._8_2_ = sVar230 + sVar330;
                auVar379._10_2_ = sVar233 + sVar332;
                auVar379._12_2_ = sVar234 + sVar333;
                auVar379._14_2_ = sVar237 + sVar335;
                auVar361 = psllw(auVar379,2);
                auVar275._0_2_ = (sVar238 + sVar311) - auVar361._0_2_;
                auVar275._2_2_ = (sVar264 + sVar385) - auVar361._2_2_;
                auVar275._4_2_ = (sVar284 + sVar386) - auVar361._4_2_;
                auVar275._6_2_ = (sVar304 + sVar389) - auVar361._6_2_;
                auVar275._8_2_ = (sVar305 + sVar390) - auVar361._8_2_;
                auVar275._10_2_ = (sVar307 + sVar393) - auVar361._10_2_;
                auVar275._12_2_ = (sVar308 + sVar394) - auVar361._12_2_;
                auVar275._14_2_ = (sVar310 + sVar397) - auVar361._14_2_;
                auVar361 = psllw(auVar319,2);
                auVar320._0_2_ = auVar361._0_2_ + (sVar238 - sVar311);
                auVar320._2_2_ = auVar361._2_2_ + (sVar264 - sVar385);
                auVar320._4_2_ = auVar361._4_2_ + (sVar284 - sVar386);
                auVar320._6_2_ = auVar361._6_2_ + (sVar304 - sVar389);
                auVar320._8_2_ = auVar361._8_2_ + (sVar305 - sVar390);
                auVar320._10_2_ = auVar361._10_2_ + (sVar307 - sVar393);
                auVar320._12_2_ = auVar361._12_2_ + (sVar308 - sVar394);
                auVar320._14_2_ = auVar361._14_2_ + (sVar310 - sVar397);
                auVar380._0_2_ = (sVar314 - sVar311) * 2 + (sVar238 - sVar198);
                auVar380._2_2_ = (sVar326 - sVar385) * 2 + (sVar264 - sVar425);
                auVar380._4_2_ = (sVar327 - sVar386) * 2 + (sVar284 - sVar428);
                auVar380._6_2_ = (sVar329 - sVar389) * 2 + (sVar304 - sVar229);
                auVar380._8_2_ = (sVar330 - sVar390) * 2 + (sVar305 - sVar230);
                auVar380._10_2_ = (sVar332 - sVar393) * 2 + (sVar307 - sVar233);
                auVar380._12_2_ = (sVar333 - sVar394) * 2 + (sVar308 - sVar234);
                auVar380._14_2_ = (sVar335 - sVar397) * 2 + (sVar310 - sVar237);
                auVar423 = psllw(auVar423,2);
                auVar352._0_2_ =
                     sVar311 * sVar263 + auVar423._0_2_ + *(short *)(&opt_q.lightmode + lVar159);
                auVar352._2_2_ =
                     sVar385 * sVar313 + auVar423._2_2_ + *(short *)(&opt_q.field_0x2 + lVar159);
                auVar352._4_2_ =
                     sVar386 * sVar414 + auVar423._4_2_ +
                     *(short *)((long)&opt_q.num_threads + lVar159);
                auVar352._6_2_ =
                     sVar389 * sVar415 + auVar423._6_2_ +
                     *(short *)((long)&opt_q.num_threads + lVar159 + 2);
                auVar352._8_2_ =
                     sVar390 * sVar416 + auVar423._8_2_ +
                     *(short *)((long)&opt_q.blob_allocator + lVar159);
                auVar352._10_2_ =
                     sVar393 * sVar431 + auVar423._10_2_ +
                     *(short *)((long)&opt_q.blob_allocator + lVar159 + 2);
                auVar352._12_2_ =
                     sVar394 * sVar417 + auVar423._12_2_ +
                     *(short *)((long)&opt_q.blob_allocator + lVar159 + 4);
                auVar352._14_2_ =
                     sVar397 * sVar418 + auVar423._14_2_ +
                     *(short *)((long)&opt_q.blob_allocator + lVar159 + 6);
                *pauVar108 = auVar219;
                *(undefined1 (*) [16])(*pauVar108 + lVar146 * 2) = auVar275;
                *(undefined1 (*) [16])(*pauVar108 + lVar131 * 2) = auVar320;
                psVar1 = (short *)(*pauVar108 + (long)(iVar158 * 0x18) * 2);
                *psVar1 = (sVar238 - sVar198) + (sVar314 - sVar311) * -2;
                psVar1[1] = (sVar264 - sVar425) + (sVar326 - sVar385) * -2;
                psVar1[2] = (sVar284 - sVar428) + (sVar327 - sVar386) * -2;
                psVar1[3] = (sVar304 - sVar229) + (sVar329 - sVar389) * -2;
                psVar1[4] = (sVar305 - sVar230) + (sVar330 - sVar390) * -2;
                psVar1[5] = (sVar307 - sVar233) + (sVar332 - sVar393) * -2;
                psVar1[6] = (sVar308 - sVar234) + (sVar333 - sVar394) * -2;
                psVar1[7] = (sVar310 - sVar237) + (sVar335 - sVar397) * -2;
                *(undefined1 (*) [16])(*pauVar108 + (long)(iVar158 << 5) * 2) = auVar380;
                *(undefined1 (*) [16])(*pauVar108 + (long)(iVar158 * 0x28) * 2) = auVar352;
                pauVar108 = (undefined1 (*) [16])(*pauVar108 + (long)(iVar158 * 0x30) * 2);
              }
              pMVar137 = (Mat *)((long)pMVar137 + 0x20);
              pauVar173 = pauVar173 + 1;
            }
            local_710 = (Mat *)((long)&local_710->data + (long)local_568.w * local_568.elemsize * 4)
            ;
          }
        }
        piVar171 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
        if (piVar171 != (int *)0x0) {
          LOCK();
          *piVar171 = *piVar171 + -1;
          UNLOCK();
          if (*piVar171 == 0) {
            if (local_568.allocator == (Allocator *)0x0) {
              free(local_568.data);
            }
            else {
              (*(local_568.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_568.cstep = 0;
        local_568.data = (void *)0x0;
        local_568.refcount._0_4_ = 0;
        local_568.refcount._4_4_ = 0;
        local_568.elemsize = 0;
        local_568.elempack = 0;
        local_568.h = 0;
        local_568.d = 0;
        local_568.c = 0;
        local_568.allocator = (Allocator *)0x0;
        local_568.dims = 0;
        local_568.w = 0;
        d1[0] = 0;
        d1[1] = 0;
        d1[2] = 0;
        d1[3] = 0;
        opt_q.workspace_allocator._0_4_ = 0;
        opt_q.workspace_allocator._4_4_ = 0;
        opt_q.openmp_blocktime = 0;
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.flush_denormals = 0;
        opt_q.use_local_pool_allocator = false;
        opt_q.use_shader_local_memory = false;
        opt_q.use_cooperative_matrix = false;
        opt_q.use_winograd23_convolution = false;
        opt_q.use_winograd43_convolution = false;
        opt_q.use_winograd63_convolution = false;
        opt_q.use_a53_a55_optimized_kernel = false;
        opt_q.use_reserved_7 = false;
        iVar164 = 0;
        if (0xb < (int)local_630) {
          iVar164 = (int)((uVar107 & 0xffffffff) >> 1);
        }
        opt_q.use_bf16_storage = false;
        opt_q.use_fp16_packed = false;
        opt_q.use_fp16_storage = false;
        opt_q.use_fp16_arithmetic = false;
        opt_q.use_int8_packed = false;
        opt_q.use_int8_storage = false;
        opt_q.use_int8_arithmetic = false;
        opt_q.use_packing_layout = false;
        opt_q.use_shader_pack8 = false;
        opt_q.use_subgroup_basic = false;
        opt_q.use_subgroup_vote = false;
        opt_q.use_subgroup_ballot = false;
        opt_q.use_subgroup_shuffle = false;
        opt_q.use_image_storage = false;
        opt_q.use_tensor_storage = false;
        opt_q.use_reserved_0 = false;
        Mat::create((Mat *)&opt_q,local_638._0_4_ << (0xb < (int)local_630),iVar158 - iVar164,0x24,
                    uVar143,local_648._0_4_,opt->workspace_allocator);
        lVar117 = (long)iVar158;
        for (lVar159 = 0; lVar159 != 0x24; lVar159 = lVar159 + 1) {
          lVar127 = (long)(int)opt_q._44_4_ *
                    CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
          for (uVar107 = 0; (long)(uVar107 | 1) < lVar117; uVar107 = uVar107 + 2) {
            puVar138 = (undefined8 *)((uVar107 >> 1) * lVar127 + opt_q._0_8_);
            puVar136 = (undefined8 *)((uVar107 + lVar159 * lVar117) * 0x10 + (long)d0);
            uVar143 = uVar119;
            while (iVar164 = (int)uVar143, uVar143 = (ulong)(iVar164 - 1), iVar164 != 0) {
              uVar203 = puVar136[1];
              auVar424 = *(undefined1 (*) [16])(puVar136 + 2);
              *puVar138 = *puVar136;
              puVar138[1] = uVar203;
              *(undefined1 (*) [16])(puVar138 + 2) = auVar424;
              puVar136 = puVar136 + local_578 * 2;
              puVar138 = puVar138 + 4;
            }
          }
          for (; (long)uVar107 < lVar117; uVar107 = uVar107 + 1) {
            puVar138 = (undefined8 *)
                       ((ulong)(((uint)uVar107 & 1) + ((uint)(uVar107 >> 1) & 0x7fffffff)) * lVar127
                       + opt_q._0_8_);
            puVar136 = (undefined8 *)((uVar107 + lVar159 * lVar117) * 0x10 + (long)d0);
            uVar143 = uVar119;
            while (iVar164 = (int)uVar143, uVar143 = (ulong)(iVar164 - 1), iVar164 != 0) {
              uVar203 = puVar136[1];
              *puVar138 = *puVar136;
              puVar138[1] = uVar203;
              puVar136 = puVar136 + local_578 * 2;
              puVar138 = puVar138 + 2;
            }
          }
        }
        local_578 = 0;
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        auStack_588 = SUB1612((undefined1  [16])0x0,4);
        local_598 = (Allocator *)0x0;
        iStack_590 = 0;
        iStack_58c = 0;
        Mat::create((Mat *)d1,iVar158,0x24,iVar145,0x10,4,opt->workspace_allocator);
        uVar143 = 0;
        uVar107 = 0;
        if (0 < iVar145) {
          uVar107 = (ulong)(uint)iVar145;
        }
        for (; uVar143 != uVar107; uVar143 = uVar143 + 1) {
          iVar164 = (this->weight_winograd43_data).w;
          sVar156 = (this->weight_winograd43_data).elemsize;
          pvVar144 = (void *)(sVar156 * (this->weight_winograd43_data).cstep * uVar143 +
                             (long)(this->weight_winograd43_data).data);
          asVar109 = d1;
          for (lVar159 = 0; lVar159 != 0x24; lVar159 = lVar159 + 1) {
            lVar127 = opt_q._0_8_;
            for (uVar113 = 0; (long)(uVar113 | 1) < lVar117; uVar113 = uVar113 + 2) {
              iVar312 = 0;
              iVar336 = 0;
              iVar364 = 0;
              iVar365 = 0;
              lVar163 = 0;
              auVar223 = (undefined1  [16])0x0;
              auVar324 = (undefined1  [16])0x0;
              iVar197 = 0;
              iVar201 = 0;
              iVar228 = 0;
              iVar232 = 0;
              iVar366 = 0;
              iVar367 = 0;
              iVar388 = 0;
              iVar392 = 0;
              iVar283 = 0;
              iVar285 = 0;
              iVar306 = 0;
              iVar309 = 0;
              iVar396 = 0;
              iVar387 = 0;
              iVar391 = 0;
              iVar395 = 0;
              iVar236 = 0;
              iVar266 = 0;
              iVar281 = 0;
              iVar282 = 0;
              uVar147 = uVar119;
              while( true ) {
                iVar169 = (int)uVar147;
                uVar147 = (ulong)(iVar169 - 1);
                iVar328 = auVar324._4_4_;
                iVar235 = auVar223._12_4_;
                iVar334 = auVar324._12_4_;
                iVar227 = auVar223._4_4_;
                iVar231 = auVar223._8_4_;
                iVar331 = auVar324._8_4_;
                if (iVar169 == 0) break;
                auVar424 = *(undefined1 (*) [16])(lVar127 + lVar163);
                auVar423 = *(undefined1 (*) [16])(lVar127 + 0x10 + lVar163);
                auVar361 = *(undefined1 (*) [16])((long)pvVar144 + lVar163 * 2);
                auVar273 = *(undefined1 (*) [16])((long)pvVar144 + lVar163 * 2 + 0x10);
                auVar288 = *(undefined1 (*) [16])((long)pvVar144 + lVar163 * 2 + 0x20);
                auVar317 = *(undefined1 (*) [16])((long)pvVar144 + lVar163 * 2 + 0x30);
                auVar440 = pmaddwd(auVar424,auVar361);
                iVar236 = iVar236 + auVar440._0_4_;
                iVar266 = iVar266 + auVar440._4_4_;
                iVar281 = iVar281 + auVar440._8_4_;
                iVar282 = iVar282 + auVar440._12_4_;
                auVar440 = pmaddwd(auVar424,auVar273);
                iVar396 = iVar396 + auVar440._0_4_;
                iVar387 = iVar387 + auVar440._4_4_;
                iVar391 = iVar391 + auVar440._8_4_;
                iVar395 = iVar395 + auVar440._12_4_;
                auVar440 = pmaddwd(auVar424,auVar288);
                iVar283 = iVar283 + auVar440._0_4_;
                iVar285 = iVar285 + auVar440._4_4_;
                iVar306 = iVar306 + auVar440._8_4_;
                iVar309 = iVar309 + auVar440._12_4_;
                auVar424 = pmaddwd(auVar424,auVar317);
                iVar366 = iVar366 + auVar424._0_4_;
                iVar367 = iVar367 + auVar424._4_4_;
                iVar388 = iVar388 + auVar424._8_4_;
                iVar392 = iVar392 + auVar424._12_4_;
                auVar424 = pmaddwd(auVar361,auVar423);
                iVar197 = iVar197 + auVar424._0_4_;
                iVar201 = iVar201 + auVar424._4_4_;
                iVar228 = iVar228 + auVar424._8_4_;
                iVar232 = iVar232 + auVar424._12_4_;
                auVar424 = pmaddwd(auVar273,auVar423);
                auVar324._0_4_ = auVar324._0_4_ + auVar424._0_4_;
                auVar324._4_4_ = iVar328 + auVar424._4_4_;
                auVar324._8_4_ = iVar331 + auVar424._8_4_;
                auVar324._12_4_ = iVar334 + auVar424._12_4_;
                auVar424 = pmaddwd(auVar288,auVar423);
                auVar223._0_4_ = auVar223._0_4_ + auVar424._0_4_;
                auVar223._4_4_ = iVar227 + auVar424._4_4_;
                auVar223._8_4_ = iVar231 + auVar424._8_4_;
                auVar223._12_4_ = iVar235 + auVar424._12_4_;
                auVar424 = pmaddwd(auVar423,auVar317);
                iVar312 = iVar312 + auVar424._0_4_;
                iVar336 = iVar336 + auVar424._4_4_;
                iVar364 = iVar364 + auVar424._8_4_;
                iVar365 = iVar365 + auVar424._12_4_;
                lVar163 = lVar163 + 0x20;
              }
              auVar260._0_4_ = iVar282 + iVar281 + iVar266 + iVar236;
              auVar260._4_4_ = iVar395 + iVar391 + iVar387 + iVar396;
              auVar260._8_4_ = iVar309 + iVar306 + iVar285 + iVar283;
              auVar260._12_4_ = iVar392 + iVar388 + iVar367 + iVar366;
              *(undefined1 (*) [16])asVar109 = auVar260;
              *(int *)*(undefined1 (*) [16])((long)asVar109 + 0x10) =
                   iVar232 + iVar228 + iVar201 + iVar197;
              *(int *)((long)asVar109 + 0x14) = iVar334 + iVar331 + iVar328 + auVar324._0_4_;
              *(int *)((long)asVar109 + 0x18) = iVar235 + iVar231 + iVar227 + auVar223._0_4_;
              *(int *)((long)asVar109 + 0x1c) = iVar365 + iVar364 + iVar336 + iVar312;
              asVar109 = (short  [4])((long)asVar109 + 0x20);
              lVar127 = lVar127 + CONCAT44(opt_q.workspace_allocator._4_4_,
                                           opt_q.workspace_allocator._0_4_) *
                                  (long)(int)opt_q._44_4_;
            }
            while (uVar179 = (uint)uVar113, (int)uVar179 < iVar158) {
              iVar236 = 0;
              iVar266 = 0;
              iVar281 = 0;
              iVar282 = 0;
              lVar127 = 0;
              auVar224 = (undefined1  [16])0x0;
              auVar278 = (undefined1  [16])0x0;
              iVar197 = 0;
              iVar201 = 0;
              iVar228 = 0;
              iVar232 = 0;
              uVar147 = uVar119;
              while( true ) {
                iVar283 = (int)uVar147;
                uVar147 = (ulong)(iVar283 - 1);
                iVar312 = auVar278._4_4_;
                iVar309 = auVar224._12_4_;
                iVar364 = auVar278._12_4_;
                iVar285 = auVar224._4_4_;
                iVar306 = auVar224._8_4_;
                iVar336 = auVar278._8_4_;
                if (iVar283 == 0) break;
                auVar424 = *(undefined1 (*) [16])
                            ((ulong)((uVar179 & 1) + ((uint)(uVar113 >> 1) & 0x7fffffff)) *
                             (long)(int)opt_q._44_4_ *
                             CONCAT44(opt_q.workspace_allocator._4_4_,
                                      opt_q.workspace_allocator._0_4_) + opt_q._0_8_ + lVar127);
                auVar423 = pmaddwd(*(undefined1 (*) [16])((long)pvVar144 + lVar127 * 4),auVar424);
                iVar197 = iVar197 + auVar423._0_4_;
                iVar201 = iVar201 + auVar423._4_4_;
                iVar228 = iVar228 + auVar423._8_4_;
                iVar232 = iVar232 + auVar423._12_4_;
                auVar423 = pmaddwd(*(undefined1 (*) [16])((long)pvVar144 + lVar127 * 4 + 0x10),
                                   auVar424);
                auVar278._0_4_ = auVar278._0_4_ + auVar423._0_4_;
                auVar278._4_4_ = iVar312 + auVar423._4_4_;
                auVar278._8_4_ = iVar336 + auVar423._8_4_;
                auVar278._12_4_ = iVar364 + auVar423._12_4_;
                auVar423 = pmaddwd(*(undefined1 (*) [16])((long)pvVar144 + lVar127 * 4 + 0x20),
                                   auVar424);
                auVar224._0_4_ = auVar224._0_4_ + auVar423._0_4_;
                auVar224._4_4_ = iVar285 + auVar423._4_4_;
                auVar224._8_4_ = iVar306 + auVar423._8_4_;
                auVar224._12_4_ = iVar309 + auVar423._12_4_;
                auVar424 = pmaddwd(*(undefined1 (*) [16])((long)pvVar144 + lVar127 * 4 + 0x30),
                                   auVar424);
                iVar236 = iVar236 + auVar424._0_4_;
                iVar266 = iVar266 + auVar424._4_4_;
                iVar281 = iVar281 + auVar424._8_4_;
                iVar282 = iVar282 + auVar424._12_4_;
                lVar127 = lVar127 + 0x10;
              }
              *(int *)asVar109 = iVar232 + iVar228 + iVar201 + iVar197;
              *(int *)((long)asVar109 + 4) = iVar364 + iVar336 + iVar312 + auVar278._0_4_;
              *(int *)((long)asVar109 + 8) = iVar309 + iVar306 + iVar285 + auVar224._0_4_;
              *(int *)((long)asVar109 + 0xc) = iVar282 + iVar281 + iVar266 + iVar236;
              asVar109 = (short  [4])((long)asVar109 + 0x10);
              uVar113 = (ulong)(uVar179 + 1);
            }
            pvVar144 = (void *)((long)pvVar144 + (long)iVar164 * sVar156);
          }
        }
        piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar171 != (int *)0x0) {
          LOCK();
          *piVar171 = *piVar171 + -1;
          UNLOCK();
          if (*piVar171 == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        local_578 = 0;
        d0[0] = 0;
        d0[1] = 0;
        d0[2] = 0;
        d0[3] = 0;
        auStack_588 = SUB1612((undefined1  [16])0x0,4);
        local_598 = (Allocator *)0x0;
        iStack_590 = 0;
        iStack_58c = 0;
        local_458 = 0;
        opt_b.lightmode = false;
        opt_b._1_3_ = 0;
        opt_b.num_threads = 0;
        opt_b.blob_allocator._0_4_ = 0;
        opt_b.blob_allocator._4_4_ = 0;
        opt_b.workspace_allocator = (Allocator *)0x0;
        opt_b.openmp_blocktime = 0;
        opt_b.use_bf16_storage = false;
        opt_b.use_fp16_packed = false;
        opt_b.use_fp16_storage = false;
        opt_b.use_fp16_arithmetic = false;
        opt_b.use_int8_packed = false;
        opt_b.use_int8_storage = false;
        opt_b.use_int8_arithmetic = false;
        opt_b.use_packing_layout = false;
        opt_b.use_shader_pack8 = false;
        opt_b.use_subgroup_basic = false;
        opt_b.use_subgroup_vote = false;
        opt_b.use_subgroup_ballot = false;
        opt_b.use_subgroup_shuffle = false;
        opt_b.use_image_storage = false;
        opt_b.use_tensor_storage = false;
        opt_b.use_reserved_0 = false;
        opt_b.flush_denormals = 0;
        opt_b.use_local_pool_allocator = false;
        opt_b.use_shader_local_memory = false;
        opt_b.use_cooperative_matrix = false;
        opt_b.use_winograd23_convolution = false;
        opt_b.use_winograd43_convolution = false;
        opt_b.use_winograd63_convolution = false;
        opt_b.use_a53_a55_optimized_kernel = false;
        opt_b.use_reserved_7 = false;
        auVar189._4_4_ = -(uint)(uVar200 == local_618.w);
        auVar189._0_4_ = -(uint)(uVar200 == local_618.w);
        auVar189._8_4_ = -(uint)(uVar165 == local_618.h);
        auVar189._12_4_ = -(uint)(uVar165 == local_618.h);
        iVar164 = movmskpd((int)&local_598,auVar189);
        if (iVar164 == 3) {
          piVar171 = (int *)CONCAT44(local_618.refcount._4_4_,local_618.refcount._0_4_);
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + 1;
            UNLOCK();
          }
          opt_b._0_8_ = local_618.data;
          opt_b.blob_allocator._0_4_ = local_618.refcount._0_4_;
          opt_b.blob_allocator._4_4_ = local_618.refcount._4_4_;
          opt_b.workspace_allocator = (Allocator *)local_618.elemsize;
          opt_b.openmp_blocktime = local_618.elempack;
          opt_b._32_8_ = local_618.allocator;
          opt_b.use_shader_pack8 = (bool)(undefined1)local_618.dims;
          opt_b.use_subgroup_basic = (bool)local_618.dims._1_1_;
          opt_b.use_subgroup_vote = (bool)local_618.dims._2_1_;
          opt_b.use_subgroup_ballot = (bool)local_618.dims._3_1_;
          opt_b.use_subgroup_shuffle = (bool)(undefined1)local_618.w;
          opt_b.use_image_storage = (bool)local_618.w._1_1_;
          opt_b.use_tensor_storage = (bool)local_618.w._2_1_;
          opt_b.use_reserved_0 = (bool)local_618.w._3_1_;
          opt_b.flush_denormals = local_618.h;
          opt_b.use_local_pool_allocator = (bool)(undefined1)local_618.d;
          opt_b.use_shader_local_memory = (bool)local_618.d._1_1_;
          opt_b.use_cooperative_matrix = (bool)local_618.d._2_1_;
          opt_b.use_winograd23_convolution = (bool)local_618.d._3_1_;
          opt_b.use_winograd43_convolution = (bool)(undefined1)local_618.c;
          opt_b.use_winograd63_convolution = (bool)local_618.c._1_1_;
          opt_b.use_a53_a55_optimized_kernel = (bool)local_618.c._2_1_;
          opt_b.use_reserved_7 = (bool)local_618.c._3_1_;
          local_458 = local_618.cstep;
        }
        else {
          Mat::create((Mat *)&opt_b,(int)local_520,(int)local_5c0,iVar145,0x10,4,
                      opt->workspace_allocator);
        }
        for (uVar143 = 0; uVar143 != uVar107; uVar143 = uVar143 + 1) {
          pauVar173 = (undefined1 (*) [16])
                      (opt_b._0_8_ + local_458 * (long)opt_b.workspace_allocator * uVar143 + 0x30);
          for (uVar113 = 0; uVar113 != uVar166; uVar113 = uVar113 + 1) {
            piVar171 = (int *)((long)((iVar106 * (int)uVar113) / 6) * 0x10 + (long)d1);
            pauVar124 = pauVar173;
            for (uVar119 = 0; piVar110 = piVar171, lVar117 = -0x50, uVar119 != uVar129;
                uVar119 = uVar119 + 1) {
              for (; lVar117 != 0; lVar117 = lVar117 + 0x10) {
                iVar145 = piVar110[1];
                iVar164 = piVar110[2];
                iVar197 = piVar110[3];
                piVar2 = piVar110 + iVar158 * 4;
                piVar3 = piVar110 + lVar146;
                piVar4 = piVar110 + iVar158 * 0xc;
                piVar5 = piVar110 + lVar131;
                piVar6 = piVar110 + iVar158 * 0x14;
                iVar201 = *piVar6;
                iVar228 = piVar6[1];
                iVar232 = piVar6[2];
                iVar236 = piVar6[3];
                iVar367 = *piVar3 + *piVar2;
                iVar388 = piVar3[1] + piVar2[1];
                iVar392 = piVar3[2] + piVar2[2];
                iVar396 = piVar3[3] + piVar2[3];
                iVar285 = *piVar2 - *piVar3;
                iVar306 = piVar2[1] - piVar3[1];
                iVar309 = piVar2[2] - piVar3[2];
                iVar312 = piVar2[3] - piVar3[3];
                iVar336 = *piVar5 + *piVar4;
                iVar364 = piVar5[1] + piVar4[1];
                iVar365 = piVar5[2] + piVar4[2];
                iVar366 = piVar5[3] + piVar4[3];
                iVar266 = *piVar4 - *piVar5;
                iVar281 = piVar4[1] - piVar5[1];
                iVar282 = piVar4[2] - piVar5[2];
                iVar283 = piVar4[3] - piVar5[3];
                *(int *)(local_378 + lVar117) = *piVar110 + iVar367 + iVar336;
                *(int *)(local_378 + lVar117 + 4) = iVar145 + iVar388 + iVar364;
                *(int *)(local_378 + lVar117 + 8) = iVar164 + iVar392 + iVar365;
                *(int *)(local_378 + lVar117 + 0xc) = iVar197 + iVar396 + iVar366;
                *(int *)(local_318 + lVar117) = iVar266 * 2 + iVar285;
                *(int *)(local_318 + lVar117 + 4) = iVar281 * 2 + iVar306;
                *(int *)(local_318 + lVar117 + 8) = iVar282 * 2 + iVar309;
                *(int *)(local_318 + lVar117 + 0xc) = iVar283 * 2 + iVar312;
                *(int *)(local_2b8 + lVar117) = iVar336 * 4 + iVar367;
                *(int *)(local_2b8 + lVar117 + 4) = iVar364 * 4 + iVar388;
                *(int *)(local_2b8 + lVar117 + 8) = iVar365 * 4 + iVar392;
                *(int *)(local_2b8 + lVar117 + 0xc) = iVar366 * 4 + iVar396;
                *(int *)(local_258 + lVar117) = iVar266 * 8 + iVar201 * 4 + iVar285;
                *(int *)(local_258 + lVar117 + 4) = iVar281 * 8 + iVar228 * 4 + iVar306;
                *(int *)(local_258 + lVar117 + 8) = iVar282 * 8 + iVar232 * 4 + iVar309;
                *(int *)(local_258 + lVar117 + 0xc) = iVar283 * 8 + iVar236 * 4 + iVar312;
                piVar110 = piVar110 + iVar158 * 0x18;
              }
              piVar2 = piVar110 + iVar158 * 0x14;
              auVar424 = *(undefined1 (*) [16])(piVar110 + iVar158 * 4);
              piVar3 = piVar110 + lVar146;
              iVar145 = (auVar424._0_4_ - *piVar3) * 4;
              iVar164 = (auVar424._4_4_ - piVar3[1]) * 4;
              iVar197 = (auVar424._8_4_ - piVar3[2]) * 4;
              iVar201 = (auVar424._12_4_ - piVar3[3]) * 4;
              auVar423 = *(undefined1 (*) [16])(piVar110 + iVar158 * 0xc);
              piVar4 = piVar110 + lVar131;
              iVar281 = auVar423._0_4_ - *piVar4;
              iVar282 = auVar423._4_4_ - piVar4[1];
              iVar283 = auVar423._8_4_ - piVar4[2];
              iVar285 = auVar423._12_4_ - piVar4[3];
              local_258._0_4_ = iVar281 * 0x20 + *piVar2 * 0x10 + iVar145;
              local_258._4_4_ = iVar282 * 0x20 + piVar2[1] * 0x10 + iVar164;
              local_258._8_4_ = iVar283 * 0x20 + piVar2[2] * 0x10 + iVar197;
              local_258._12_4_ = iVar285 * 0x20 + piVar2[3] * 0x10 + iVar201;
              iVar306 = *piVar4 + auVar423._0_4_;
              iVar309 = piVar4[1] + auVar423._4_4_;
              iVar312 = piVar4[2] + auVar423._8_4_;
              iVar336 = piVar4[3] + auVar423._12_4_;
              iVar228 = *piVar3 + auVar424._0_4_;
              iVar232 = piVar3[1] + auVar424._4_4_;
              iVar236 = piVar3[2] + auVar424._8_4_;
              iVar266 = piVar3[3] + auVar424._12_4_;
              local_2b8._0_4_ = iVar228 * 4 + iVar306 * 0x10;
              local_2b8._4_4_ = iVar232 * 4 + iVar309 * 0x10;
              local_2b8._8_4_ = iVar236 * 4 + iVar312 * 0x10;
              local_2b8._12_4_ = iVar266 * 4 + iVar336 * 0x10;
              local_318._0_4_ = iVar281 * 8 + iVar145;
              local_318._4_4_ = iVar282 * 8 + iVar164;
              local_318._8_4_ = iVar283 * 8 + iVar197;
              local_318._12_4_ = iVar285 * 8 + iVar201;
              local_378._0_4_ = (*piVar110 + iVar228 + iVar306) * 4;
              local_378._4_4_ = (piVar110[1] + iVar232 + iVar309) * 4;
              local_378._8_4_ = (piVar110[2] + iVar236 + iVar312) * 4;
              local_378._12_4_ = (piVar110[3] + iVar266 + iVar336) * 4;
              pauVar108 = pauVar124;
              for (lVar117 = 0x50; lVar117 != 0x1d0; lVar117 = lVar117 + 0x60) {
                iVar145 = *(int *)((long)&local_408 + lVar117 + 4);
                iVar164 = *(int *)((long)&local_400 + lVar117 + 4);
                iVar197 = *(int *)((long)&local_3f8 + lVar117 + 4);
                iVar201 = *(int *)((long)&local_3f0 + lVar117 + 4);
                iVar228 = *(int *)((long)w1 + lVar117 + -4);
                iVar232 = *(int *)((long)w1 + lVar117 + 4);
                iVar306 = *(int *)((long)&local_3f8 + lVar117) +
                          *(int *)((long)&local_408 + lVar117);
                iVar309 = iVar197 + iVar145;
                iVar312 = *(int *)((long)&local_3f0 + lVar117) +
                          *(int *)((long)&local_400 + lVar117);
                iVar336 = iVar201 + iVar164;
                iVar236 = *(int *)((long)&local_408 + lVar117) -
                          *(int *)((long)&local_3f8 + lVar117);
                iVar145 = iVar145 - iVar197;
                iVar266 = *(int *)((long)&local_400 + lVar117) -
                          *(int *)((long)&local_3f0 + lVar117);
                iVar164 = iVar164 - iVar201;
                iVar281 = *(int *)((long)w1 + lVar117) + *(int *)((long)&uStack_3e8 + lVar117);
                iVar282 = iVar232 + *(int *)((long)&local_3e4 + lVar117);
                iVar283 = *(int *)((long)&uStack_3d0 + lVar117) +
                          *(int *)((long)&local_3e0 + lVar117);
                iVar285 = *(int *)((long)&uStack_3cc + lVar117) + iVar228;
                iVar197 = *(int *)((long)&uStack_3e8 + lVar117) - *(int *)((long)w1 + lVar117);
                iVar232 = *(int *)((long)&local_3e4 + lVar117) - iVar232;
                iVar201 = *(int *)((long)&local_3e0 + lVar117) -
                          *(int *)((long)&uStack_3d0 + lVar117);
                iVar228 = iVar228 - *(int *)((long)&uStack_3cc + lVar117);
                auVar262._0_4_ =
                     (int)((float)(*(int *)((long)w2 + lVar117) + iVar306 + iVar281) * 0.0017361111)
                ;
                auVar262._4_4_ =
                     (int)((float)(*(int *)((long)w2 + lVar117 + 4) + iVar309 + iVar282) *
                          0.0017361111);
                auVar262._8_4_ =
                     (int)((float)(*(int *)((long)&local_410 + lVar117) + iVar312 + iVar283) *
                          0.0017361111);
                auVar262._12_4_ =
                     (int)((float)(*(int *)((long)&local_40c + lVar117) + iVar336 + iVar285) *
                          0.0017361111);
                auVar303._0_4_ = (int)((float)(iVar197 * 2 + iVar236) * 0.0017361111);
                auVar303._4_4_ = (int)((float)(iVar232 * 2 + iVar145) * 0.0017361111);
                auVar303._8_4_ = (int)((float)(iVar201 * 2 + iVar266) * 0.0017361111);
                auVar303._12_4_ = (int)((float)(iVar228 * 2 + iVar164) * 0.0017361111);
                auVar280._0_4_ = (int)((float)(iVar281 * 4 + iVar306) * 0.0017361111);
                auVar280._4_4_ = (int)((float)(iVar282 * 4 + iVar309) * 0.0017361111);
                auVar280._8_4_ = (int)((float)(iVar283 * 4 + iVar312) * 0.0017361111);
                auVar280._12_4_ = (int)((float)(iVar285 * 4 + iVar336) * 0.0017361111);
                auVar226._0_4_ =
                     (int)((float)(iVar197 * 8 + iVar236 + *(int *)(&opt_q.lightmode + lVar117)) *
                          0.0017361111);
                auVar226._4_4_ =
                     (int)((float)(iVar232 * 8 +
                                  iVar145 + *(int *)((long)&opt_q.num_threads + lVar117)) *
                          0.0017361111);
                auVar226._8_4_ =
                     (int)((float)(iVar201 * 8 +
                                  iVar266 + *(int *)((long)&opt_q.blob_allocator + lVar117)) *
                          0.0017361111);
                auVar226._12_4_ =
                     (int)((float)(iVar228 * 8 +
                                  iVar164 + *(int *)((long)&opt_q.blob_allocator + lVar117 + 4)) *
                          0.0017361111);
                pauVar108[-3] = auVar262;
                pauVar108[-2] = auVar303;
                pauVar108[-1] = auVar280;
                *pauVar108 = auVar226;
                pauVar108 = (undefined1 (*) [16])(*pauVar108 + (long)((int)local_5c8 << 4) * 4);
              }
              piVar171 = piVar171 + 4;
              pauVar124 = pauVar124 + 4;
            }
            pauVar173 = (undefined1 (*) [16])
                        (*pauVar173 + (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4)
            ;
          }
        }
        copy_cut_border((Mat *)&opt_b,&local_618,0,opt_b.flush_denormals - local_618.h,0,
                        opt_b._44_4_ - local_618.w,opt);
        piVar171 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
        if (piVar171 != (int *)0x0) {
          LOCK();
          *piVar171 = *piVar171 + -1;
          UNLOCK();
          if (*piVar171 == 0) {
            if (opt_b._32_8_ == 0) {
              free((void *)opt_b._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
            }
          }
        }
        piVar171 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
        if (piVar171 != (int *)0x0) {
          LOCK();
          *piVar171 = *piVar171 + -1;
          UNLOCK();
          if (*piVar171 == 0) {
            if (local_568.allocator == (Allocator *)0x0) {
              free(local_568.data);
            }
            else {
              (*(local_568.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        uVar112 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var45);
        uVar129 = (ulong)uVar112;
        iVar145 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
        iVar164 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
        iVar197 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
        iVar201 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
        local_6c8._0_4_ = local_698.w;
        lVar131 = (long)local_618.w;
        if (opt->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_a53_a55_optimized_kernel = false;
          opt_q.use_reserved_7 = false;
          Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar112 * uVar165,local_698.c,8,8,
                      opt->workspace_allocator);
          iVar158 = iVar197 * uVar135;
          if ((int)uVar135 < 1) {
            uVar135 = 0;
          }
          if ((int)uVar200 < 1) {
            uVar200 = 0;
          }
          if ((int)uVar165 < 1) {
            uVar107 = 0;
          }
          if ((int)uVar112 < 1) {
            uVar129 = 0;
          }
          if ((int)uVar179 < 1) {
            uVar179 = 0;
          }
          for (uVar143 = 0; uVar143 != uVar179; uVar143 = uVar143 + 1) {
            pvVar144 = (void *)(local_698.cstep * uVar143 * local_698.elemsize +
                               (long)local_698.data);
            local_6c8._0_8_ = pvVar144;
            puVar138 = (undefined8 *)opt_q._0_8_;
            for (uVar113 = 0; uVar113 != uVar129; uVar113 = uVar113 + 1) {
              for (uVar166 = 0; uVar166 != uVar107; uVar166 = uVar166 + 1) {
                puVar136 = (undefined8 *)
                           ((long)pvVar144 +
                           uVar166 * (long)iVar145 * 8 +
                           local_698.elemsize * (long)local_698.w * (long)iVar164 * uVar113);
                for (uVar165 = 0; uVar112 = uVar135, uVar165 != uVar200; uVar165 = uVar165 + 1) {
                  while (uVar112 != 0) {
                    *puVar138 = *puVar136;
                    puVar138 = puVar138 + 1;
                    puVar136 = puVar136 + iVar197;
                    uVar112 = uVar112 - 1;
                  }
                  puVar136 = puVar136 + ((long)(iVar106 * iVar201) - (long)iVar158);
                }
              }
            }
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
          piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + -1;
            UNLOCK();
            if (*piVar171 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_001b4939;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else {
          uVar126 = uVar112 * uVar165;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar126,
                     (allocator_type *)&local_568);
          local_6c8._0_4_ = iVar106 * iVar164 - iVar145 * uVar165;
          uVar111 = 0;
          if ((int)uVar165 < 1) {
            uVar107 = 0;
          }
          if ((int)uVar112 < 1) {
            uVar112 = 0;
          }
          iVar164 = 0;
          uVar129 = uVar107;
          iVar106 = 0;
          for (; uVar111 != uVar112; uVar111 = uVar111 + 1) {
            for (lVar146 = (long)iVar106; (int)uVar129 != lVar146; lVar146 = lVar146 + 1) {
              *(int *)(opt_q._0_8_ + lVar146 * 4) = iVar164;
              iVar164 = iVar164 + iVar145;
            }
            iVar164 = iVar164 + local_6c8._0_4_;
            uVar129 = (ulong)(uint)((int)uVar129 + (int)uVar107);
            iVar106 = iVar106 + (int)uVar107;
          }
          uVar129 = 0;
          uVar107 = (ulong)uVar126;
          if ((int)uVar126 < 1) {
            uVar107 = uVar129;
          }
          uVar143 = (ulong)uVar179;
          if ((int)uVar179 < 1) {
            uVar143 = uVar129;
          }
          uVar113 = 0;
          if (0 < (int)uVar135) {
            uVar113 = (ulong)uVar135;
          }
          uVar166 = (ulong)uVar200;
          if ((int)uVar200 < 1) {
            uVar166 = uVar129;
          }
          uVar119 = (ulong)(uint)iVar158;
          if (iVar158 < 1) {
            uVar119 = uVar129;
          }
          for (; uVar129 != uVar119; uVar129 = uVar129 + 1) {
            local_6c8._0_8_ =
                 (Mat *)(local_618.cstep * uVar129 * local_618.elemsize + (long)local_618.data);
            for (uVar147 = 0; uVar147 != uVar166; uVar147 = uVar147 + 1) {
              for (uVar142 = 0; uVar142 != uVar113; uVar142 = uVar142 + 1) {
                pvVar144 = (void *)((this->weight_data_tm).cstep * uVar129 *
                                    (this->weight_data_tm).elemsize +
                                   (long)(this->weight_data_tm).data);
                iVar228 = 0;
                iVar232 = 0;
                iVar236 = 0;
                iVar266 = 0;
                auVar361 = (undefined1  [16])0x0;
                auVar273 = (undefined1  [16])0x0;
                iVar145 = 0;
                iVar106 = 0;
                iVar158 = 0;
                iVar164 = 0;
                for (uVar121 = 0; uVar121 != uVar143; uVar121 = uVar121 + 1) {
                  for (lVar146 = 0; uVar107 * 4 != lVar146; lVar146 = lVar146 + 4) {
                    uVar154 = *(ulong *)((long)local_698.data +
                                        (long)*(int *)(opt_q._0_8_ + lVar146) * 8 +
                                        local_698.cstep * local_698.elemsize * uVar121 +
                                        (long)(iVar197 * 8 * (int)uVar142) +
                                        (long)local_698.w * uVar147 * (long)iVar201 *
                                        local_698.elemsize);
                    cVar191 = (char)(uVar154 >> 8);
                    cVar192 = (char)(uVar154 >> 0x10);
                    cVar193 = (char)(uVar154 >> 0x18);
                    cVar194 = (char)(uVar154 >> 0x20);
                    cVar195 = (char)(uVar154 >> 0x28);
                    cVar196 = (char)(uVar154 >> 0x30);
                    auVar439._8_6_ = 0;
                    auVar439._0_8_ = uVar154;
                    auVar439[0xe] = (char)(uVar154 >> 0x38);
                    auVar439[0xf] = -((long)uVar154 < 0);
                    auVar438._14_2_ = auVar439._14_2_;
                    auVar438._8_5_ = 0;
                    auVar438._0_8_ = uVar154;
                    auVar438[0xd] = -(cVar196 < '\0');
                    auVar437._13_3_ = auVar438._13_3_;
                    auVar437._8_4_ = 0;
                    auVar437._0_8_ = uVar154;
                    auVar437[0xc] = cVar196;
                    auVar436._12_4_ = auVar437._12_4_;
                    auVar436._8_3_ = 0;
                    auVar436._0_8_ = uVar154;
                    auVar436[0xb] = -(cVar195 < '\0');
                    auVar435._11_5_ = auVar436._11_5_;
                    auVar435._8_2_ = 0;
                    auVar435._0_8_ = uVar154;
                    auVar435[10] = cVar195;
                    auVar434._10_6_ = auVar435._10_6_;
                    auVar434[8] = 0;
                    auVar434._0_8_ = uVar154;
                    auVar434[9] = -(cVar194 < '\0');
                    auVar433._9_7_ = auVar434._9_7_;
                    auVar433[8] = cVar194;
                    auVar433._0_8_ = uVar154;
                    Var78 = CONCAT91(CONCAT81(auVar433._8_8_,-(cVar193 < '\0')),cVar193);
                    auVar77._2_10_ = Var78;
                    auVar77[1] = -(cVar192 < '\0');
                    auVar77[0] = cVar192;
                    auVar76._2_12_ = auVar77;
                    auVar76[1] = -(cVar191 < '\0');
                    auVar76[0] = cVar191;
                    auVar432._0_2_ = CONCAT11(-((char)uVar154 < '\0'),(char)uVar154);
                    auVar432._2_14_ = auVar76;
                    auVar424 = *(undefined1 (*) [16])((long)pvVar144 + lVar146 * 8);
                    auVar423 = *(undefined1 (*) [16])((long)pvVar144 + lVar146 * 8 + 0x10);
                    auVar375._0_14_ = auVar424._0_14_;
                    auVar375[0xe] = auVar424[7];
                    auVar375[0xf] = -(auVar424[7] < '\0');
                    auVar374._14_2_ = auVar375._14_2_;
                    auVar374._0_13_ = auVar424._0_13_;
                    auVar374[0xd] = -(auVar424[6] < '\0');
                    auVar373._13_3_ = auVar374._13_3_;
                    auVar373._0_12_ = auVar424._0_12_;
                    auVar373[0xc] = auVar424[6];
                    auVar372._12_4_ = auVar373._12_4_;
                    auVar372._0_11_ = auVar424._0_11_;
                    auVar372[0xb] = -(auVar424[5] < '\0');
                    auVar371._11_5_ = auVar372._11_5_;
                    auVar371._0_10_ = auVar424._0_10_;
                    auVar371[10] = auVar424[5];
                    auVar370._10_6_ = auVar371._10_6_;
                    auVar370._0_9_ = auVar424._0_9_;
                    auVar370[9] = -(auVar424[4] < '\0');
                    auVar369._9_7_ = auVar370._9_7_;
                    auVar369._0_8_ = auVar424._0_8_;
                    auVar369[8] = auVar424[4];
                    Var81 = CONCAT91(CONCAT81(auVar369._8_8_,-(auVar424[3] < '\0')),auVar424[3]);
                    auVar80._2_10_ = Var81;
                    auVar80[1] = -(auVar424[2] < '\0');
                    auVar80[0] = auVar424[2];
                    auVar79._2_12_ = auVar80;
                    auVar79[1] = -(auVar424[1] < '\0');
                    auVar79[0] = auVar424[1];
                    auVar368._0_2_ = CONCAT11(-(auVar424[0] < '\0'),auVar424[0]);
                    auVar368._2_14_ = auVar79;
                    sVar313 = CONCAT11(-(auVar424[8] < '\0'),auVar424[8]);
                    uVar239 = CONCAT13(-(auVar424[9] < '\0'),CONCAT12(auVar424[9],sVar313));
                    uVar240 = CONCAT15(-(auVar424[10] < '\0'),CONCAT14(auVar424[10],uVar239));
                    uVar241 = CONCAT17(-(auVar424[0xb] < '\0'),CONCAT16(auVar424[0xb],uVar240));
                    auVar315._0_10_ =
                         CONCAT19(-(auVar424[0xc] < '\0'),CONCAT18(auVar424[0xc],uVar241));
                    auVar315[10] = auVar424[0xd];
                    auVar315[0xb] = -(auVar424[0xd] < '\0');
                    auVar316[0xc] = auVar424[0xe];
                    auVar316._0_12_ = auVar315;
                    auVar316[0xd] = -(auVar424[0xe] < '\0');
                    auVar317[0xe] = auVar424[0xf];
                    auVar317._0_14_ = auVar316;
                    auVar317[0xf] = -(auVar424[0xf] < '\0');
                    auVar376._0_14_ = auVar423._0_14_;
                    auVar376[0xe] = auVar423[7];
                    auVar376[0xf] = -(auVar423[7] < '\0');
                    auVar342._14_2_ = auVar376._14_2_;
                    auVar342._0_13_ = auVar423._0_13_;
                    auVar342[0xd] = -(auVar423[6] < '\0');
                    auVar341._13_3_ = auVar342._13_3_;
                    auVar341._0_12_ = auVar423._0_12_;
                    auVar341[0xc] = auVar423[6];
                    auVar340._12_4_ = auVar341._12_4_;
                    auVar340._0_11_ = auVar423._0_11_;
                    auVar340[0xb] = -(auVar423[5] < '\0');
                    auVar339._11_5_ = auVar340._11_5_;
                    auVar339._0_10_ = auVar423._0_10_;
                    auVar339[10] = auVar423[5];
                    auVar440._10_6_ = auVar339._10_6_;
                    auVar440._0_9_ = auVar423._0_9_;
                    auVar440[9] = -(auVar423[4] < '\0');
                    auVar338._9_7_ = auVar440._9_7_;
                    auVar338._0_8_ = auVar423._0_8_;
                    auVar338[8] = auVar423[4];
                    Var84 = CONCAT91(CONCAT81(auVar338._8_8_,-(auVar423[3] < '\0')),auVar423[3]);
                    auVar83._2_10_ = Var84;
                    auVar83[1] = -(auVar423[2] < '\0');
                    auVar83[0] = auVar423[2];
                    auVar82._2_12_ = auVar83;
                    auVar82[1] = -(auVar423[1] < '\0');
                    auVar82[0] = auVar423[1];
                    auVar337._0_2_ = CONCAT11(-(auVar423[0] < '\0'),auVar423[0]);
                    auVar337._2_14_ = auVar82;
                    sVar263 = CONCAT11(-(auVar423[8] < '\0'),auVar423[8]);
                    uVar199 = CONCAT13(-(auVar423[9] < '\0'),CONCAT12(auVar423[9],sVar263));
                    uVar202 = CONCAT15(-(auVar423[10] < '\0'),CONCAT14(auVar423[10],uVar199));
                    uVar203 = CONCAT17(-(auVar423[0xb] < '\0'),CONCAT16(auVar423[0xb],uVar202));
                    auVar286._0_10_ =
                         CONCAT19(-(auVar423[0xc] < '\0'),CONCAT18(auVar423[0xc],uVar203));
                    auVar286[10] = auVar423[0xd];
                    auVar286[0xb] = -(auVar423[0xd] < '\0');
                    auVar287[0xc] = auVar423[0xe];
                    auVar287._0_12_ = auVar286;
                    auVar287[0xd] = -(auVar423[0xe] < '\0');
                    auVar288[0xe] = auVar423[0xf];
                    auVar288._0_14_ = auVar287;
                    auVar288[0xf] = -(auVar423[0xf] < '\0');
                    sVar414 = auVar76._0_2_;
                    sVar415 = auVar77._0_2_;
                    sVar431 = (short)Var78;
                    sVar416 = sVar431 * (short)Var81;
                    sVar417 = auVar433._8_2_;
                    sVar418 = auVar435._10_2_;
                    sVar198 = auVar437._12_2_;
                    auVar376 = pmulhw(auVar368,auVar432);
                    sVar425 = sVar431 * (short)((ulong)uVar241 >> 0x30);
                    auVar423 = pmulhw(auVar317,auVar432);
                    sVar428 = sVar431 * (short)Var84;
                    auVar440 = pmulhw(auVar337,auVar432);
                    sVar431 = sVar431 * (short)((ulong)uVar203 >> 0x30);
                    auVar424 = pmulhw(auVar288,auVar432);
                    iVar281 = CONCAT22(auVar376._6_2_,sVar416);
                    Var78 = CONCAT64(CONCAT42(iVar281,auVar376._4_2_),
                                     CONCAT22(sVar415 * auVar80._0_2_,sVar416));
                    auVar85._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                    auVar85._2_2_ = auVar376._2_2_;
                    auVar85._0_2_ = sVar414 * auVar79._0_2_;
                    iVar282 = CONCAT22(auVar423._6_2_,sVar425);
                    Var81 = CONCAT64(CONCAT42(iVar282,auVar423._4_2_),
                                     CONCAT22(sVar415 * (short)((uint6)uVar240 >> 0x20),sVar425));
                    auVar86._4_8_ = (long)((unkuint10)Var81 >> 0x10);
                    auVar86._2_2_ = auVar423._2_2_;
                    auVar86._0_2_ = sVar414 * (short)((uint)uVar239 >> 0x10);
                    iVar336 = auVar273._4_4_;
                    iVar364 = auVar273._8_4_;
                    iVar365 = auVar273._12_4_;
                    iVar283 = CONCAT22(auVar440._6_2_,sVar428);
                    Var84 = CONCAT64(CONCAT42(iVar283,auVar440._4_2_),
                                     CONCAT22(sVar415 * auVar83._0_2_,sVar428));
                    auVar87._4_8_ = (long)((unkuint10)Var84 >> 0x10);
                    auVar87._2_2_ = auVar440._2_2_;
                    auVar87._0_2_ = sVar414 * auVar82._0_2_;
                    iVar306 = auVar361._4_4_;
                    iVar309 = auVar361._8_4_;
                    iVar312 = auVar361._12_4_;
                    iVar285 = CONCAT22(auVar424._6_2_,sVar431);
                    Var105 = CONCAT64(CONCAT42(iVar285,auVar424._4_2_),
                                      CONCAT22(sVar415 * (short)((uint6)uVar202 >> 0x20),sVar431));
                    auVar88._4_8_ = (long)((unkuint10)Var105 >> 0x10);
                    auVar88._2_2_ = auVar424._2_2_;
                    auVar88._0_2_ = sVar414 * (short)((uint)uVar199 >> 0x10);
                    iVar366 = CONCAT22(auVar376._8_2_,sVar417 * auVar369._8_2_);
                    auVar398._0_8_ =
                         CONCAT26(auVar376._10_2_,CONCAT24(sVar418 * auVar371._10_2_,iVar366));
                    auVar398._8_2_ = sVar198 * auVar373._12_2_;
                    auVar398._10_2_ = auVar376._12_2_;
                    auVar399._12_2_ = auVar438._14_2_ * auVar374._14_2_;
                    auVar399._0_12_ = auVar398;
                    auVar399._14_2_ = auVar376._14_2_;
                    iVar145 = iVar145 + CONCAT22(auVar376._0_2_,auVar432._0_2_ * auVar368._0_2_) +
                              iVar366;
                    iVar106 = iVar106 + auVar85._0_4_ + (int)((ulong)auVar398._0_8_ >> 0x20);
                    iVar158 = iVar158 + (int)((unkuint10)Var78 >> 0x10) + auVar398._8_4_;
                    iVar164 = iVar164 + iVar281 + auVar399._12_4_;
                    iVar281 = CONCAT22(auVar423._8_2_,
                                       sVar417 * (short)((unkuint10)auVar315._0_10_ >> 0x40));
                    auVar419._0_8_ =
                         CONCAT26(auVar423._10_2_,CONCAT24(sVar418 * auVar315._10_2_,iVar281));
                    auVar419._8_2_ = sVar198 * auVar316._12_2_;
                    auVar419._10_2_ = auVar423._12_2_;
                    auVar420._12_2_ = auVar438._14_2_ * auVar317._14_2_;
                    auVar420._0_12_ = auVar419;
                    auVar420._14_2_ = auVar423._14_2_;
                    auVar273._0_4_ =
                         auVar273._0_4_ + CONCAT22(auVar423._0_2_,auVar432._0_2_ * sVar313) +
                         iVar281;
                    auVar273._4_4_ = iVar336 + auVar86._0_4_ + (int)((ulong)auVar419._0_8_ >> 0x20);
                    auVar273._8_4_ = iVar364 + (int)((unkuint10)Var81 >> 0x10) + auVar419._8_4_;
                    auVar273._12_4_ = iVar365 + iVar282 + auVar420._12_4_;
                    iVar281 = CONCAT22(auVar440._8_2_,sVar417 * auVar338._8_2_);
                    auVar426._0_8_ =
                         CONCAT26(auVar440._10_2_,CONCAT24(sVar418 * auVar339._10_2_,iVar281));
                    auVar426._8_2_ = sVar198 * auVar341._12_2_;
                    auVar426._10_2_ = auVar440._12_2_;
                    auVar427._12_2_ = auVar438._14_2_ * auVar342._14_2_;
                    auVar427._0_12_ = auVar426;
                    auVar427._14_2_ = auVar440._14_2_;
                    auVar361._0_4_ =
                         auVar361._0_4_ + CONCAT22(auVar440._0_2_,auVar432._0_2_ * auVar337._0_2_) +
                         iVar281;
                    auVar361._4_4_ = iVar306 + auVar87._0_4_ + (int)((ulong)auVar426._0_8_ >> 0x20);
                    auVar361._8_4_ = iVar309 + (int)((unkuint10)Var84 >> 0x10) + auVar426._8_4_;
                    auVar361._12_4_ = iVar312 + iVar283 + auVar427._12_4_;
                    iVar281 = CONCAT22(auVar424._8_2_,
                                       sVar417 * (short)((unkuint10)auVar286._0_10_ >> 0x40));
                    auVar429._0_8_ =
                         CONCAT26(auVar424._10_2_,CONCAT24(sVar418 * auVar286._10_2_,iVar281));
                    auVar429._8_2_ = sVar198 * auVar287._12_2_;
                    auVar429._10_2_ = auVar424._12_2_;
                    auVar430._12_2_ = auVar438._14_2_ * auVar288._14_2_;
                    auVar430._0_12_ = auVar429;
                    auVar430._14_2_ = auVar424._14_2_;
                    iVar228 = iVar228 + CONCAT22(auVar424._0_2_,auVar432._0_2_ * sVar263) + iVar281;
                    iVar232 = iVar232 + auVar88._0_4_ + (int)((ulong)auVar429._0_8_ >> 0x20);
                    iVar236 = iVar236 + (int)((unkuint10)Var105 >> 0x10) + auVar429._8_4_;
                    iVar266 = iVar266 + iVar285 + auVar430._12_4_;
                  }
                  pvVar144 = (void *)((long)pvVar144 + uVar107 * 0x20);
                }
                piVar171 = (int *)(local_6c8._0_8_ + uVar142 * 0x10);
                *piVar171 = iVar164 + iVar158 + iVar106 + iVar145;
                piVar171[1] = auVar273._12_4_ + auVar273._8_4_ + auVar273._4_4_ + auVar273._0_4_;
                piVar171[2] = auVar361._12_4_ + auVar361._8_4_ + auVar361._4_4_ + auVar361._0_4_;
                piVar171[3] = iVar266 + iVar236 + iVar232 + iVar228;
              }
              local_6c8._0_8_ = local_6c8._0_8_ + lVar131 * 0x10;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
        }
      }
LAB_001b251b:
      iVar164 = local_618.c;
      uVar179 = local_618.h;
      iVar158 = local_618.w;
      iVar106 = local_698.c;
      iVar145 = local_698.w;
      if ((iVar180 == 1) && (iVar140 == 4)) {
        p_Var45 = this->_vptr_Convolution_x86[-3];
        uVar135 = *(uint *)((long)&(this->weight_winograd23_data).w + (long)p_Var45);
        uVar107 = (ulong)uVar135;
        if (uVar135 == 7) {
          if ((((*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) != 7) ||
               (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1)) ||
             ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 2 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 2))))
          goto LAB_001b2da3;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_a53_a55_optimized_kernel = false;
          opt_q.use_reserved_7 = false;
          Mat::create((Mat *)&opt_q,local_618.h * local_618.w,0x31,local_698.c,1,1,
                      opt->workspace_allocator);
          uVar129 = 0;
          uVar107 = (ulong)uVar179;
          if ((int)uVar179 < 1) {
            uVar107 = uVar129;
          }
          uVar143 = (ulong)(uint)iVar106;
          if (iVar106 < 1) {
            uVar143 = uVar129;
          }
          for (; uVar129 != uVar143; uVar129 = uVar129 + 1) {
            lVar131 = opt_q._0_8_;
            for (lVar146 = 0; lVar146 != 7; lVar146 = lVar146 + 1) {
              for (lVar117 = 0; lVar117 != 7; lVar117 = lVar117 + 1) {
                puVar120 = (undefined1 *)
                           ((long)local_698.data +
                           lVar117 + (long)local_698.w * local_698.elemsize * lVar146 +
                                     local_698.cstep * uVar129 * local_698.elemsize);
                for (iVar106 = 0; iVar106 != (int)uVar107; iVar106 = iVar106 + 1) {
                  puVar141 = puVar120 + (iVar145 - iVar158) * 2;
                  puVar153 = puVar120;
                  for (lVar159 = 0; (int)lVar159 + 3 < iVar158; lVar159 = lVar159 + 4) {
                    *(undefined1 *)(lVar131 + lVar159) = *puVar153;
                    *(undefined1 *)(lVar131 + 1 + lVar159) = puVar153[2];
                    *(undefined1 *)(lVar131 + 2 + lVar159) = puVar153[4];
                    *(undefined1 *)(lVar131 + 3 + lVar159) = puVar153[6];
                    puVar153 = puVar153 + 8;
                    puVar141 = puVar141 + 8;
                  }
                  for (; (int)lVar159 + 1 < iVar158; lVar159 = lVar159 + 2) {
                    *(undefined1 *)(lVar131 + lVar159) = *puVar153;
                    *(undefined1 *)(lVar131 + 1 + lVar159) = puVar153[2];
                    puVar153 = puVar153 + 4;
                    puVar141 = puVar141 + 4;
                  }
                  for (; (int)lVar159 < iVar158; lVar159 = lVar159 + 1) {
                    *(undefined1 *)(lVar131 + lVar159) = puVar120[lVar159 * 2];
                    puVar141 = puVar141 + 2;
                  }
                  lVar131 = lVar131 + lVar159;
                  puVar120 = puVar141;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
          piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + -1;
            UNLOCK();
            if (*piVar171 == 0) {
              if (opt_q._32_8_ == 0) goto LAB_001b4b36;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
        else if (uVar135 == 3) {
          if (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) != 3)
          goto LAB_001b2da3;
          if (((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1) ||
              (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1)) ||
             ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)))) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1) ||
                 (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1)) ||
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 2)) ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 2))
            goto LAB_001b2da3;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_618.h * local_618.w,9,local_698.c,1,1,
                        opt->workspace_allocator);
            uVar129 = 0;
            uVar107 = (ulong)uVar179;
            if ((int)uVar179 < 1) {
              uVar107 = uVar129;
            }
            uVar143 = (ulong)(uint)iVar106;
            if (iVar106 < 1) {
              uVar143 = uVar129;
            }
            for (; uVar129 != uVar143; uVar129 = uVar129 + 1) {
              lVar131 = opt_q._0_8_;
              for (lVar146 = 0; lVar146 != 3; lVar146 = lVar146 + 1) {
                for (lVar117 = 0; lVar117 != 3; lVar117 = lVar117 + 1) {
                  puVar120 = (undefined1 *)
                             ((long)local_698.data +
                             lVar117 + (long)local_698.w * local_698.elemsize * lVar146 +
                                       local_698.cstep * uVar129 * local_698.elemsize);
                  for (iVar106 = 0; iVar106 != (int)uVar107; iVar106 = iVar106 + 1) {
                    puVar141 = puVar120 + (iVar145 - iVar158) * 2;
                    puVar153 = puVar120;
                    for (lVar159 = 0; (int)lVar159 + 3 < iVar158; lVar159 = lVar159 + 4) {
                      *(undefined1 *)(lVar131 + lVar159) = *puVar153;
                      *(undefined1 *)(lVar131 + 1 + lVar159) = puVar153[2];
                      *(undefined1 *)(lVar131 + 2 + lVar159) = puVar153[4];
                      *(undefined1 *)(lVar131 + 3 + lVar159) = puVar153[6];
                      puVar153 = puVar153 + 8;
                      puVar141 = puVar141 + 8;
                    }
                    for (; (int)lVar159 + 1 < iVar158; lVar159 = lVar159 + 2) {
                      *(undefined1 *)(lVar131 + lVar159) = *puVar153;
                      *(undefined1 *)(lVar131 + 1 + lVar159) = puVar153[2];
                      puVar153 = puVar153 + 4;
                      puVar141 = puVar141 + 4;
                    }
                    for (; (int)lVar159 < iVar158; lVar159 = lVar159 + 1) {
                      *(undefined1 *)(lVar131 + lVar159) = puVar120[lVar159 * 2];
                      puVar141 = puVar141 + 2;
                    }
                    lVar131 = lVar131 + lVar159;
                    puVar120 = puVar141;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
            piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar171 != (int *)0x0) {
              LOCK();
              *piVar171 = *piVar171 + -1;
              UNLOCK();
              if (*piVar171 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001b4b36;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
            goto LAB_001b32ea;
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_a53_a55_optimized_kernel = false;
          opt_q.use_reserved_7 = false;
          Mat::create((Mat *)&opt_q,local_618.h * local_618.w,9,local_698.c,1,1,
                      opt->workspace_allocator);
          uVar129 = 0;
          uVar107 = (ulong)uVar179;
          if ((int)uVar179 < 1) {
            uVar107 = uVar129;
          }
          uVar143 = (ulong)(uint)iVar106;
          if (iVar106 < 1) {
            uVar143 = uVar129;
          }
          for (; uVar129 != uVar143; uVar129 = uVar129 + 1) {
            lVar131 = opt_q._0_8_;
            for (lVar146 = 0; lVar146 != 3; lVar146 = lVar146 + 1) {
              for (lVar117 = 0; lVar117 != 3; lVar117 = lVar117 + 1) {
                lVar159 = (long)local_698.data +
                          lVar117 + (long)local_698.w * local_698.elemsize * lVar146 +
                                    local_698.cstep * uVar129 * local_698.elemsize;
                for (iVar106 = 0; iVar106 != (int)uVar107; iVar106 = iVar106 + 1) {
                  for (lVar127 = 0; (int)lVar127 + 3 < iVar158; lVar127 = lVar127 + 4) {
                    *(undefined1 *)(lVar131 + lVar127) = *(undefined1 *)(lVar159 + lVar127);
                    *(undefined1 *)(lVar131 + 1 + lVar127) = *(undefined1 *)(lVar159 + 1 + lVar127);
                    *(undefined1 *)(lVar131 + 2 + lVar127) = *(undefined1 *)(lVar159 + 2 + lVar127);
                    *(undefined1 *)(lVar131 + 3 + lVar127) = *(undefined1 *)(lVar159 + 3 + lVar127);
                  }
                  for (; (int)lVar127 + 1 < iVar158; lVar127 = lVar127 + 2) {
                    *(undefined1 *)(lVar131 + lVar127) = *(undefined1 *)(lVar159 + lVar127);
                    *(undefined1 *)(lVar131 + 1 + lVar127) = *(undefined1 *)(lVar159 + 1 + lVar127);
                  }
                  for (; (int)lVar127 < iVar158; lVar127 = lVar127 + 1) {
                    *(undefined1 *)(lVar131 + lVar127) = *(undefined1 *)(lVar159 + lVar127);
                  }
                  lVar159 = lVar159 + (iVar145 - iVar158) + lVar127;
                  lVar131 = lVar131 + lVar127;
                }
              }
            }
          }
          im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
          piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar171 == (int *)0x0) goto LAB_001b32ea;
          LOCK();
          *piVar171 = *piVar171 + -1;
          UNLOCK();
          if (*piVar171 != 0) goto LAB_001b32ea;
          if (opt_q._32_8_ != 0) {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            goto LAB_001b32ea;
          }
LAB_001b4b36:
          free((void *)opt_q._0_8_);
        }
        else {
          if ((uVar135 == 1) &&
             (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) == 1)) {
            if (((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) == 1) &&
                ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1 &&
                 (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1)))) &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1)) {
              conv1x1s1_sgemm_pack1to4_int8_sse(&local_698,&local_618,&this->weight_sgemm_data,opt);
              goto LAB_001b4773;
            }
            if ((((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) == 1) &&
                 (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1)) &&
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 2)) &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 2)) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_reserved_7 = false;
              Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_698.c,local_698.elemsize,
                          local_698.elempack,opt->workspace_allocator);
              uVar107 = 0;
              if ((int)uVar179 < 1) {
                uVar179 = 0;
              }
              uVar129 = (ulong)(uint)iVar106;
              if (iVar106 < 1) {
                uVar129 = uVar107;
              }
              for (; uVar107 != uVar129; uVar107 = uVar107 + 1) {
                puVar120 = (undefined1 *)
                           (local_698.cstep * uVar107 * local_698.elemsize + (long)local_698.data);
                lVar131 = opt_q._0_8_;
                for (uVar135 = 0; uVar135 != uVar179; uVar135 = uVar135 + 1) {
                  puVar141 = puVar120 + (iVar145 - iVar158) * 2;
                  puVar153 = puVar120;
                  for (lVar146 = 0; (int)lVar146 + 3 < iVar158; lVar146 = lVar146 + 4) {
                    *(undefined1 *)(lVar131 + lVar146) = *puVar153;
                    *(undefined1 *)(lVar131 + 1 + lVar146) = puVar153[2];
                    *(undefined1 *)(lVar131 + 2 + lVar146) = puVar153[4];
                    *(undefined1 *)(lVar131 + 3 + lVar146) = puVar153[6];
                    puVar153 = puVar153 + 8;
                    puVar141 = puVar141 + 8;
                  }
                  for (; (int)lVar146 + 1 < iVar158; lVar146 = lVar146 + 2) {
                    *(undefined1 *)(lVar131 + lVar146) = *puVar153;
                    *(undefined1 *)(lVar131 + 1 + lVar146) = puVar153[2];
                    puVar153 = puVar153 + 4;
                    puVar141 = puVar141 + 4;
                  }
                  for (; (int)lVar146 < iVar158; lVar146 = lVar146 + 1) {
                    *(undefined1 *)(lVar131 + lVar146) = puVar120[lVar146 * 2];
                    puVar141 = puVar141 + 2;
                  }
                  lVar131 = lVar131 + lVar146;
                  puVar120 = puVar141;
                }
              }
              conv1x1s1_sgemm_pack1to4_int8_sse
                        ((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
              piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + -1;
                UNLOCK();
                if (*piVar171 == 0) {
                  if (opt_q._32_8_ == 0) goto LAB_001b4b36;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001b32ea;
            }
          }
LAB_001b2da3:
          uVar200 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var45);
          iVar197 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
          iVar201 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
          iVar228 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
          lVar131 = (long)iVar228;
          iVar232 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
          lVar146 = (long)local_618.w;
          uVar165 = uVar200 * uVar135;
          if (opt->use_sgemm_convolution == true) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar165,local_698.c,1,1,
                        opt->workspace_allocator);
            local_648 = (short  [4])&this->weight_sgemm_data;
            lVar146 = (long)(iVar228 * 2);
            uVar129 = 0;
            if ((int)uVar179 < 1) {
              uVar179 = 0;
            }
            if ((int)uVar135 < 1) {
              uVar107 = uVar129;
            }
            uVar143 = (ulong)uVar200;
            if ((int)uVar200 < 1) {
              uVar143 = uVar129;
            }
            uVar113 = (ulong)(uint)iVar106;
            if (iVar106 < 1) {
              uVar113 = uVar129;
            }
            for (; uVar129 != uVar113; uVar129 = uVar129 + 1) {
              lVar117 = opt_q._0_8_;
              for (uVar166 = 0; uVar166 != uVar143; uVar166 = uVar166 + 1) {
                for (uVar119 = 0; uVar119 != uVar107; uVar119 = uVar119 + 1) {
                  puVar120 = (undefined1 *)
                             ((long)local_698.data +
                             uVar119 * (long)iVar197 +
                             (long)local_698.w * local_698.elemsize * (long)iVar201 * uVar166 +
                             local_698.cstep * uVar129 * local_698.elemsize);
                  for (uVar135 = 0; uVar135 != uVar179; uVar135 = uVar135 + 1) {
                    lVar127 = 0;
                    puVar141 = puVar120;
                    for (lVar159 = 0; (int)lVar159 + 3 < iVar158; lVar159 = lVar159 + 4) {
                      *(undefined1 *)(lVar117 + lVar159) = *puVar141;
                      *(undefined1 *)(lVar117 + 1 + lVar159) = puVar141[lVar131];
                      *(undefined1 *)(lVar117 + 2 + lVar159) = puVar141[lVar146];
                      *(undefined1 *)(lVar117 + 3 + lVar159) = puVar141[iVar228 * 3];
                      puVar141 = puVar141 + iVar228 * 4;
                      lVar127 = lVar127 + iVar228 * 4;
                    }
                    for (; (int)lVar159 + 1 < iVar158; lVar159 = lVar159 + 2) {
                      *(undefined1 *)(lVar117 + lVar159) = *puVar141;
                      *(undefined1 *)(lVar117 + 1 + lVar159) = puVar141[lVar131];
                      puVar141 = puVar141 + lVar146;
                      lVar127 = lVar127 + lVar146;
                    }
                    for (; (int)lVar159 < iVar158; lVar159 = lVar159 + 1) {
                      *(undefined1 *)(lVar117 + lVar159) = puVar120[lVar127];
                      lVar127 = lVar127 + lVar131;
                    }
                    puVar120 = puVar120 + lVar127 + (iVar145 * iVar232 - iVar158 * iVar228);
                    lVar117 = lVar117 + lVar159;
                  }
                }
              }
            }
            im2col_sgemm_pack1to4_int8_sse((Mat *)&opt_q,&local_618,(Mat *)local_648,opt);
            piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar171 != (int *)0x0) {
              LOCK();
              *piVar171 = *piVar171 + -1;
              UNLOCK();
              if (*piVar171 == 0) {
                if (opt_q._32_8_ == 0) goto LAB_001b4b36;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          else {
            uVar129 = (ulong)(uint)local_618.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar165,
                       (allocator_type *)&local_568);
            local_6c8._0_4_ = iVar145 * iVar201 - iVar197 * uVar135;
            uVar112 = 0;
            if ((int)uVar135 < 1) {
              uVar107 = 0;
            }
            if ((int)uVar200 < 1) {
              uVar200 = 0;
            }
            iVar228 = (int)uVar107;
            iVar201 = 0;
            iVar145 = 0;
            for (; uVar112 != uVar200; uVar112 = uVar112 + 1) {
              for (lVar117 = (long)iVar145; (int)uVar107 != lVar117; lVar117 = lVar117 + 1) {
                *(int *)(opt_q._0_8_ + lVar117 * 4) = iVar201;
                iVar201 = iVar201 + iVar197;
              }
              iVar201 = iVar201 + local_6c8._0_4_;
              uVar107 = (ulong)(uint)((int)uVar107 + iVar228);
              iVar145 = iVar145 + iVar228;
            }
            uVar143 = 0;
            uVar107 = (ulong)uVar165;
            if ((int)uVar165 < 1) {
              uVar107 = uVar143;
            }
            uVar113 = (ulong)(uint)iVar106;
            if (iVar106 < 1) {
              uVar113 = uVar143;
            }
            uVar166 = 0;
            if (0 < iVar158) {
              uVar166 = (ulong)(uint)iVar158;
            }
            uVar119 = (ulong)uVar179;
            if ((int)uVar179 < 1) {
              uVar119 = uVar143;
            }
            if (iVar164 < 1) {
              uVar129 = uVar143;
            }
            for (; uVar143 != uVar129; uVar143 = uVar143 + 1) {
              local_6c8._0_8_ =
                   (Mat *)(local_618.cstep * uVar143 * local_618.elemsize + (long)local_618.data);
              for (uVar147 = 0; uVar147 != uVar119; uVar147 = uVar147 + 1) {
                for (uVar142 = 0; uVar142 != uVar166; uVar142 = uVar142 + 1) {
                  pvVar144 = (void *)((this->weight_data_tm).cstep * uVar143 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  iVar145 = 0;
                  iVar106 = 0;
                  iVar158 = 0;
                  iVar164 = 0;
                  for (uVar121 = 0; uVar121 != uVar113; uVar121 = uVar121 + 1) {
                    for (uVar154 = 0; uVar107 != uVar154; uVar154 = uVar154 + 1) {
                      auVar424 = ZEXT416((uint)(int)*(char *)((long)local_698.data +
                                                             (long)*(int *)(opt_q._0_8_ +
                                                                           uVar154 * 4) +
                                                             local_698.cstep * local_698.elemsize *
                                                             uVar121 + uVar142 * lVar131 +
                                                                       (long)local_698.w *
                                                                       uVar147 * (long)iVar232 *
                                                                       local_698.elemsize));
                      auVar424 = pshuflw(auVar424,auVar424,0);
                      auVar208._0_4_ = auVar424._0_4_;
                      auVar208._4_4_ = auVar208._0_4_;
                      auVar208._8_4_ = auVar208._0_4_;
                      auVar208._12_4_ = auVar208._0_4_;
                      uVar7 = *(ulong *)((long)pvVar144 + uVar154 * 4);
                      cVar191 = (char)(uVar7 >> 8);
                      cVar192 = (char)(uVar7 >> 0x10);
                      cVar193 = (char)(uVar7 >> 0x18);
                      cVar194 = (char)(uVar7 >> 0x20);
                      cVar195 = (char)(uVar7 >> 0x28);
                      cVar196 = (char)(uVar7 >> 0x30);
                      auVar254._8_6_ = 0;
                      auVar254._0_8_ = uVar7;
                      auVar254[0xe] = (char)(uVar7 >> 0x38);
                      auVar254[0xf] = -((long)uVar7 < 0);
                      auVar253._14_2_ = auVar254._14_2_;
                      auVar253._8_5_ = 0;
                      auVar253._0_8_ = uVar7;
                      auVar253[0xd] = -(cVar196 < '\0');
                      auVar252._13_3_ = auVar253._13_3_;
                      auVar252._8_4_ = 0;
                      auVar252._0_8_ = uVar7;
                      auVar252[0xc] = cVar196;
                      auVar251._12_4_ = auVar252._12_4_;
                      auVar251._8_3_ = 0;
                      auVar251._0_8_ = uVar7;
                      auVar251[0xb] = -(cVar195 < '\0');
                      auVar250._11_5_ = auVar251._11_5_;
                      auVar250._8_2_ = 0;
                      auVar250._0_8_ = uVar7;
                      auVar250[10] = cVar195;
                      auVar249._10_6_ = auVar250._10_6_;
                      auVar249[8] = 0;
                      auVar249._0_8_ = uVar7;
                      auVar249[9] = -(cVar194 < '\0');
                      auVar248._9_7_ = auVar249._9_7_;
                      auVar248[8] = cVar194;
                      auVar248._0_8_ = uVar7;
                      Var78 = CONCAT91(CONCAT81(auVar248._8_8_,-(cVar193 < '\0')),cVar193);
                      auVar90._2_10_ = Var78;
                      auVar90[1] = -(cVar192 < '\0');
                      auVar90[0] = cVar192;
                      auVar89._2_12_ = auVar90;
                      auVar89[1] = -(cVar191 < '\0');
                      auVar89[0] = cVar191;
                      auVar247._0_2_ = CONCAT11(-((char)uVar7 < '\0'),(char)uVar7);
                      auVar247._2_14_ = auVar89;
                      sVar263 = auVar424._2_2_ * (short)Var78;
                      auVar423 = pmulhw(auVar247,auVar208);
                      iVar197 = CONCAT22(auVar423._6_2_,sVar263);
                      Var78 = CONCAT64(CONCAT42(iVar197,auVar423._4_2_),
                                       CONCAT22(auVar424._0_2_ * auVar90._0_2_,sVar263));
                      auVar91._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                      auVar91._2_2_ = auVar423._2_2_;
                      auVar91._0_2_ = auVar424._2_2_ * auVar89._0_2_;
                      iVar145 = iVar145 + CONCAT22(auVar423._0_2_,auVar424._0_2_ * auVar247._0_2_);
                      iVar106 = iVar106 + auVar91._0_4_;
                      iVar158 = iVar158 + (int)((unkuint10)Var78 >> 0x10);
                      iVar164 = iVar164 + iVar197;
                    }
                    pvVar144 = (void *)((long)pvVar144 + uVar107 * 4);
                  }
                  piVar171 = (int *)(local_6c8._0_8_ + uVar142 * 0x10);
                  *piVar171 = iVar145;
                  piVar171[1] = iVar106;
                  piVar171[2] = iVar158;
                  piVar171[3] = iVar164;
                }
                local_6c8._0_8_ = local_6c8._0_8_ + lVar146 * 0x10;
              }
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          }
        }
      }
LAB_001b32ea:
      iVar164 = local_618.c;
      uVar179 = local_618.h;
      iVar158 = local_618.w;
      sVar156 = local_698.cstep;
      iVar106 = local_698.c;
      iVar145 = local_698.w;
      if ((iVar180 == 8) && (iVar140 == 1)) {
        p_Var45 = this->_vptr_Convolution_x86[-3];
        uVar135 = *(uint *)((long)&(this->weight_winograd23_data).w + (long)p_Var45);
        uVar107 = (ulong)uVar135;
        if ((uVar135 == 1) &&
           (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) == 1)) {
          if ((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) == 1) &&
             (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1 &&
               (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1)))) {
            conv1x1s1_sgemm_pack8to1_int8_sse(&local_698,&local_618,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1) ||
                 (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1)) ||
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 2)) ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 2))
            goto LAB_001b3567;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar129 = 0;
            uVar107 = (ulong)(uint)iVar158;
            if (iVar158 < 1) {
              uVar107 = uVar129;
            }
            if ((int)uVar179 < 1) {
              uVar179 = 0;
            }
            uVar143 = (ulong)(uint)iVar106;
            if (iVar106 < 1) {
              uVar143 = uVar129;
            }
            for (; uVar129 != uVar143; uVar129 = uVar129 + 1) {
              puVar136 = (undefined8 *)
                         (local_698.cstep * uVar129 * local_698.elemsize + (long)local_698.data);
              puVar138 = (undefined8 *)opt_q._0_8_;
              for (uVar135 = 0; uVar113 = uVar107, uVar135 != uVar179; uVar135 = uVar135 + 1) {
                while (iVar180 = (int)uVar113, uVar113 = (ulong)(iVar180 - 1), iVar180 != 0) {
                  *puVar138 = *puVar136;
                  puVar136 = puVar136 + 2;
                  puVar138 = puVar138 + 1;
                }
                puVar136 = puVar136 + (iVar145 - iVar158) * 2;
              }
            }
            conv1x1s1_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt)
            ;
            piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar171 != (int *)0x0) {
              LOCK();
              *piVar171 = *piVar171 + -1;
              UNLOCK();
              if (*piVar171 == 0) {
                pvVar144 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001b8049;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001b3567:
          if (((opt->use_winograd_convolution == true) && (uVar135 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((((*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) == 3 &&
                 (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) == 1)) &&
                (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1)) &&
               ((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1 &&
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1))))))))
          {
            iVar106 = cpu_support_x86_xop();
            iVar180 = local_698.c;
            iVar145 = local_698.elempack;
            if (iVar106 == 0) {
              local_640 = (ulong)local_618.c;
              piVar171 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
              local_568.data = local_698.data;
              local_568.refcount._0_4_ = local_698.refcount._0_4_;
              local_568.refcount._4_4_ = local_698.refcount._4_4_;
              local_568.elemsize = local_698.elemsize;
              local_568.elempack = local_698.elempack;
              local_568.allocator = local_698.allocator;
              local_568.d = local_698.d;
              local_568.h = local_698.h;
              local_568.dims = local_698.dims;
              local_568.w = local_698.w;
              local_568.c = local_698.c;
              local_568.cstep = local_698.cstep;
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + 1;
                UNLOCK();
              }
              auVar258._0_4_ = ((uint)((int)(local_618.w + 3U) >> 0x1f) >> 0x1e) + local_618.w + 3U;
              auVar258._4_4_ = ((uint)((int)(local_618.h + 3U) >> 0x1f) >> 0x1e) + local_618.h + 3U;
              auVar258._8_8_ = 0;
              uVar200 = SUB164(_DAT_004ff130 & auVar258,0);
              uVar165 = SUB164(_DAT_004ff130 & auVar258,4);
              local_630 = (void *)(ulong)uVar165;
              local_638 = (short  [4])(ulong)uVar200;
              copy_make_border(&local_698,&local_568,0,(uVar165 + 2) - local_698.h,0,
                               (uVar200 + 2) - local_698.w,0,0.0,opt);
              uVar179 = auVar258._0_4_ >> 2;
              uVar135 = auVar258._4_4_ >> 2;
              local_578 = 0;
              iVar158 = uVar179 * 6;
              iVar164 = iVar158 * uVar135;
              d0[0] = 0;
              d0[1] = 0;
              d0[2] = 0;
              d0[3] = 0;
              local_598 = (Allocator *)0x0;
              iStack_590 = 0;
              iStack_58c = 0;
              auStack_588 = SUB1612((undefined1  [16])0x0,4);
              iVar140 = (int)((long)iVar164 / 6);
              Mat::create((Mat *)d0,iVar140,0x24,iVar180,(ulong)(uint)(iVar145 * 2),iVar145,
                          opt->workspace_allocator);
              iVar106 = local_698.c;
              auVar424 = _DAT_004ff140;
              asVar116[0] = 0;
              asVar116[1] = 0;
              asVar116[2] = 0;
              asVar116[3] = 0;
              asVar172[2] = 0;
              asVar172[3] = 0;
              asVar172[0] = (short)uVar179;
              asVar172[1] = (short)(uVar179 >> 0x10);
              if ((int)uVar179 < 1) {
                asVar172 = asVar116;
              }
              local_628[2] = 0;
              local_628[3] = 0;
              local_628[0] = (short)uVar135;
              local_628[1] = (short)(uVar135 >> 0x10);
              if ((int)uVar135 < 1) {
                local_628 = asVar116;
              }
              asVar170[0] = 0;
              asVar170[1] = 0;
              asVar170[2] = 0;
              asVar170[3] = 0;
              if (0 < iVar180) {
                asVar170[2] = 0;
                asVar170[3] = 0;
                local_698.c._0_2_ = (undefined2)iVar180;
                local_698.c._2_2_ = SUB42(iVar180,2);
                asVar170[0] = (undefined2)local_698.c;
                asVar170[1] = local_698.c._2_2_;
              }
              for (; asVar116 != asVar170; asVar116 = (short  [4])((long)asVar116 + 1)) {
                pauVar173 = (undefined1 (*) [16])
                            ((long)local_568.data +
                            local_568.cstep * local_568.elemsize * (long)asVar116 + 0x20);
                asVar115[0] = 0;
                asVar115[1] = 0;
                asVar115[2] = 0;
                asVar115[3] = 0;
                for (; asVar115 != local_628; asVar115 = (short  [4])((long)asVar115 + 1)) {
                  pauVar108 = (undefined1 (*) [16])
                              ((long)((iVar158 * asVar115._0_4_) / 6) * 0x10 + (long)d0);
                  asVar174[0] = 0;
                  asVar174[1] = 0;
                  asVar174[2] = 0;
                  asVar174[3] = 0;
                  pauVar124 = pauVar173;
                  for (; lVar131 = -0x60, pauVar122 = pauVar124, asVar174 != asVar172;
                      asVar174 = (short  [4])((long)asVar174 + 1)) {
                    while( true ) {
                      sVar263 = auVar424._0_2_;
                      sVar313 = auVar424._2_2_;
                      sVar414 = auVar424._4_2_;
                      sVar415 = auVar424._6_2_;
                      sVar416 = auVar424._8_2_;
                      sVar431 = auVar424._10_2_;
                      sVar417 = auVar424._12_2_;
                      sVar418 = auVar424._14_2_;
                      pauVar114 = pauVar108;
                      lVar146 = 0x50;
                      if (lVar131 == 0) break;
                      auVar423 = pauVar122[-2];
                      auVar361 = pauVar122[-1];
                      auVar273 = *pauVar122;
                      auVar360._0_14_ = auVar423._0_14_;
                      auVar360[0xe] = auVar423[7];
                      auVar360[0xf] = -(auVar423[7] < '\0');
                      auVar359._14_2_ = auVar360._14_2_;
                      auVar359._0_13_ = auVar423._0_13_;
                      auVar359[0xd] = -(auVar423[6] < '\0');
                      auVar358._13_3_ = auVar359._13_3_;
                      auVar358._0_12_ = auVar423._0_12_;
                      auVar358[0xc] = auVar423[6];
                      auVar357._12_4_ = auVar358._12_4_;
                      auVar357._0_11_ = auVar423._0_11_;
                      auVar357[0xb] = -(auVar423[5] < '\0');
                      auVar356._11_5_ = auVar357._11_5_;
                      auVar356._0_10_ = auVar423._0_10_;
                      auVar356[10] = auVar423[5];
                      auVar355._10_6_ = auVar356._10_6_;
                      auVar355._0_9_ = auVar423._0_9_;
                      auVar355[9] = -(auVar423[4] < '\0');
                      auVar354._9_7_ = auVar355._9_7_;
                      auVar354._0_8_ = auVar423._0_8_;
                      auVar354[8] = auVar423[4];
                      auVar353._8_8_ = auVar354._8_8_;
                      auVar353[7] = -(auVar423[3] < '\0');
                      auVar353[6] = auVar423[3];
                      auVar353[5] = -(auVar423[2] < '\0');
                      auVar353[4] = auVar423[2];
                      auVar353[3] = -(auVar423[1] < '\0');
                      auVar353[2] = auVar423[1];
                      auVar353[1] = -(auVar423[0] < '\0');
                      auVar353[0] = auVar423[0];
                      sVar238 = CONCAT11(-(auVar423[8] < '\0'),auVar423[8]);
                      uVar239 = CONCAT13(-(auVar423[9] < '\0'),CONCAT12(auVar423[9],sVar238));
                      uVar240 = CONCAT15(-(auVar423[10] < '\0'),CONCAT14(auVar423[10],uVar239));
                      uVar241 = CONCAT17(-(auVar423[0xb] < '\0'),CONCAT16(auVar423[0xb],uVar240));
                      auVar244._0_10_ =
                           CONCAT19(-(auVar423[0xc] < '\0'),CONCAT18(auVar423[0xc],uVar241));
                      auVar244[10] = auVar423[0xd];
                      auVar244[0xb] = -(auVar423[0xd] < '\0');
                      auVar246[0xc] = auVar423[0xe];
                      auVar246._0_12_ = auVar244;
                      auVar246[0xd] = -(auVar423[0xe] < '\0');
                      auVar259[0xe] = auVar423[0xf];
                      auVar259._0_14_ = auVar246;
                      auVar259[0xf] = -(auVar423[0xf] < '\0');
                      auVar413._0_14_ = auVar361._0_14_;
                      auVar413[0xe] = auVar361[7];
                      auVar413[0xf] = -(auVar361[7] < '\0');
                      auVar412._14_2_ = auVar413._14_2_;
                      auVar412._0_13_ = auVar361._0_13_;
                      auVar412[0xd] = -(auVar361[6] < '\0');
                      auVar411._13_3_ = auVar412._13_3_;
                      auVar411._0_12_ = auVar361._0_12_;
                      auVar411[0xc] = auVar361[6];
                      auVar410._12_4_ = auVar411._12_4_;
                      auVar410._0_11_ = auVar361._0_11_;
                      auVar410[0xb] = -(auVar361[5] < '\0');
                      auVar409._11_5_ = auVar410._11_5_;
                      auVar409._0_10_ = auVar361._0_10_;
                      auVar409[10] = auVar361[5];
                      auVar408._10_6_ = auVar409._10_6_;
                      auVar408._0_9_ = auVar361._0_9_;
                      auVar408[9] = -(auVar361[4] < '\0');
                      auVar407._9_7_ = auVar408._9_7_;
                      auVar407._0_8_ = auVar361._0_8_;
                      auVar407[8] = auVar361[4];
                      Var78 = CONCAT91(CONCAT81(auVar407._8_8_,-(auVar361[3] < '\0')),auVar361[3]);
                      auVar102._2_10_ = Var78;
                      auVar102[1] = -(auVar361[2] < '\0');
                      auVar102[0] = auVar361[2];
                      auVar101._2_12_ = auVar102;
                      auVar101[1] = -(auVar361[1] < '\0');
                      auVar101[0] = auVar361[1];
                      sVar314 = CONCAT11(-(auVar361[0] < '\0'),auVar361[0]);
                      sVar198 = CONCAT11(-(auVar361[8] < '\0'),auVar361[8]);
                      uVar199 = CONCAT13(-(auVar361[9] < '\0'),CONCAT12(auVar361[9],sVar198));
                      uVar202 = CONCAT15(-(auVar361[10] < '\0'),CONCAT14(auVar361[10],uVar199));
                      uVar203 = CONCAT17(-(auVar361[0xb] < '\0'),CONCAT16(auVar361[0xb],uVar202));
                      auVar205._0_10_ =
                           CONCAT19(-(auVar361[0xc] < '\0'),CONCAT18(auVar361[0xc],uVar203));
                      auVar205[10] = auVar361[0xd];
                      auVar205[0xb] = -(auVar361[0xd] < '\0');
                      auVar207[0xc] = auVar361[0xe];
                      auVar207._0_12_ = auVar205;
                      auVar207[0xd] = -(auVar361[0xe] < '\0');
                      auVar220[0xe] = auVar361[0xf];
                      auVar220._0_14_ = auVar207;
                      auVar220[0xf] = -(auVar361[0xf] < '\0');
                      auVar302._0_14_ = auVar273._0_14_;
                      auVar302[0xe] = auVar273[7];
                      auVar302[0xf] = -(auVar273[7] < '\0');
                      auVar301._14_2_ = auVar302._14_2_;
                      auVar301._0_13_ = auVar273._0_13_;
                      auVar301[0xd] = -(auVar273[6] < '\0');
                      auVar300._13_3_ = auVar301._13_3_;
                      auVar300._0_12_ = auVar273._0_12_;
                      auVar300[0xc] = auVar273[6];
                      auVar299._12_4_ = auVar300._12_4_;
                      auVar299._0_11_ = auVar273._0_11_;
                      auVar299[0xb] = -(auVar273[5] < '\0');
                      auVar298._11_5_ = auVar299._11_5_;
                      auVar298._0_10_ = auVar273._0_10_;
                      auVar298[10] = auVar273[5];
                      auVar297._10_6_ = auVar298._10_6_;
                      auVar297._0_9_ = auVar273._0_9_;
                      auVar297[9] = -(auVar273[4] < '\0');
                      auVar296._9_7_ = auVar297._9_7_;
                      auVar296._0_8_ = auVar273._0_8_;
                      auVar296[8] = auVar273[4];
                      Var81 = CONCAT91(CONCAT81(auVar296._8_8_,-(auVar273[3] < '\0')),auVar273[3]);
                      auVar104._2_10_ = Var81;
                      auVar104[1] = -(auVar273[2] < '\0');
                      auVar104[0] = auVar273[2];
                      auVar103._2_12_ = auVar104;
                      auVar103[1] = -(auVar273[1] < '\0');
                      auVar103[0] = auVar273[1];
                      sVar284 = CONCAT11(-(auVar273[0] < '\0'),auVar273[0]);
                      sVar264 = CONCAT11(-(auVar273[8] < '\0'),auVar273[8]);
                      uVar265 = CONCAT13(-(auVar273[9] < '\0'),CONCAT12(auVar273[9],sVar264));
                      uVar267 = CONCAT15(-(auVar273[10] < '\0'),CONCAT14(auVar273[10],uVar265));
                      uVar268 = CONCAT17(-(auVar273[0xb] < '\0'),CONCAT16(auVar273[0xb],uVar267));
                      auVar270._0_10_ =
                           CONCAT19(-(auVar273[0xc] < '\0'),CONCAT18(auVar273[0xc],uVar268));
                      auVar270[10] = auVar273[0xd];
                      auVar270[0xb] = -(auVar273[0xd] < '\0');
                      auVar272[0xc] = auVar273[0xe];
                      auVar272._0_12_ = auVar270;
                      auVar272[0xd] = -(auVar273[0xe] < '\0');
                      auVar276[0xe] = auVar273[0xf];
                      auVar276._0_14_ = auVar272;
                      auVar276[0xf] = -(auVar273[0xf] < '\0');
                      auVar361 = psllw(auVar353,2);
                      sVar304 = auVar103._0_2_;
                      sVar305 = auVar104._0_2_;
                      sVar307 = (short)Var81;
                      sVar308 = auVar296._8_2_;
                      sVar310 = auVar298._10_2_;
                      sVar311 = auVar300._12_2_;
                      auVar381._0_2_ = sVar238 - sVar314;
                      sVar385 = (short)((uint)uVar239 >> 0x10);
                      sVar326 = auVar101._0_2_;
                      auVar381._2_2_ = sVar385 - sVar326;
                      sVar386 = (short)((uint6)uVar240 >> 0x20);
                      sVar327 = auVar102._0_2_;
                      auVar381._4_2_ = sVar386 - sVar327;
                      sVar389 = (short)((ulong)uVar241 >> 0x30);
                      sVar329 = (short)Var78;
                      auVar381._6_2_ = sVar389 - sVar329;
                      sVar390 = (short)((unkuint10)auVar244._0_10_ >> 0x40);
                      sVar330 = auVar407._8_2_;
                      auVar381._8_2_ = sVar390 - sVar330;
                      sVar393 = auVar244._10_2_;
                      sVar332 = auVar409._10_2_;
                      auVar381._10_2_ = sVar393 - sVar332;
                      sVar394 = auVar246._12_2_;
                      sVar397 = auVar259._14_2_;
                      sVar333 = auVar411._12_2_;
                      auVar381._12_2_ = sVar394 - sVar333;
                      auVar381._14_2_ = sVar397 - auVar412._14_2_;
                      sVar425 = (short)((uint)uVar199 >> 0x10);
                      sVar428 = (short)((uint6)uVar202 >> 0x20);
                      sVar229 = (short)((ulong)uVar203 >> 0x30);
                      sVar230 = (short)((unkuint10)auVar205._0_10_ >> 0x40);
                      sVar233 = auVar205._10_2_;
                      sVar234 = auVar207._12_2_;
                      sVar237 = auVar220._14_2_;
                      auVar422._0_2_ = sVar314 + sVar238;
                      auVar422._2_2_ = sVar326 + sVar385;
                      auVar422._4_2_ = sVar327 + sVar386;
                      auVar422._6_2_ = sVar329 + sVar389;
                      auVar422._8_2_ = sVar330 + sVar390;
                      auVar422._10_2_ = sVar332 + sVar393;
                      auVar422._12_2_ = sVar333 + sVar394;
                      auVar422._14_2_ = auVar412._14_2_ + sVar397;
                      auVar423 = psllw(auVar422,2);
                      auVar321._0_2_ = (sVar284 + sVar198) - auVar423._0_2_;
                      auVar321._2_2_ = (sVar304 + sVar425) - auVar423._2_2_;
                      auVar321._4_2_ = (sVar305 + sVar428) - auVar423._4_2_;
                      auVar321._6_2_ = (sVar307 + sVar229) - auVar423._6_2_;
                      auVar321._8_2_ = (sVar308 + sVar230) - auVar423._8_2_;
                      auVar321._10_2_ = (sVar310 + sVar233) - auVar423._10_2_;
                      auVar321._12_2_ = (sVar311 + sVar234) - auVar423._12_2_;
                      auVar321._14_2_ = (auVar301._14_2_ + sVar237) - auVar423._14_2_;
                      auVar423 = psllw(auVar381,2);
                      auVar382._0_2_ = auVar423._0_2_ + (sVar284 - sVar198);
                      auVar382._2_2_ = auVar423._2_2_ + (sVar304 - sVar425);
                      auVar382._4_2_ = auVar423._4_2_ + (sVar305 - sVar428);
                      auVar382._6_2_ = auVar423._6_2_ + (sVar307 - sVar229);
                      auVar382._8_2_ = auVar423._8_2_ + (sVar308 - sVar230);
                      auVar382._10_2_ = auVar423._10_2_ + (sVar310 - sVar233);
                      auVar382._12_2_ = auVar423._12_2_ + (sVar311 - sVar234);
                      auVar382._14_2_ = auVar423._14_2_ + (auVar301._14_2_ - sVar237);
                      auVar362._0_2_ = (sVar238 - sVar198) * 2 + (sVar284 - sVar314);
                      auVar362._2_2_ = (sVar385 - sVar425) * 2 + (sVar304 - sVar326);
                      auVar362._4_2_ = (sVar386 - sVar428) * 2 + (sVar305 - sVar327);
                      auVar362._6_2_ = (sVar389 - sVar229) * 2 + (sVar307 - sVar329);
                      auVar362._8_2_ = (sVar390 - sVar230) * 2 + (sVar308 - sVar330);
                      auVar362._10_2_ = (sVar393 - sVar233) * 2 + (sVar310 - sVar332);
                      auVar362._12_2_ = (sVar394 - sVar234) * 2 + (sVar311 - sVar333);
                      auVar362._14_2_ =
                           (sVar397 - sVar237) * 2 + (auVar301._14_2_ - auVar412._14_2_);
                      auVar423 = psllw(auVar259,2);
                      auVar221._0_2_ = sVar198 * sVar263 + auVar423._0_2_ + sVar264;
                      auVar221._2_2_ =
                           sVar425 * sVar313 + auVar423._2_2_ + (short)((uint)uVar265 >> 0x10);
                      auVar221._4_2_ =
                           sVar428 * sVar414 + auVar423._4_2_ + (short)((uint6)uVar267 >> 0x20);
                      auVar221._6_2_ =
                           sVar229 * sVar415 + auVar423._6_2_ + (short)((ulong)uVar268 >> 0x30);
                      auVar221._8_2_ =
                           sVar230 * sVar416 +
                           auVar423._8_2_ + (short)((unkuint10)auVar270._0_10_ >> 0x40);
                      auVar221._10_2_ = sVar233 * sVar431 + auVar423._10_2_ + auVar270._10_2_;
                      auVar221._12_2_ = sVar234 * sVar417 + auVar423._12_2_ + auVar272._12_2_;
                      auVar221._14_2_ = sVar237 * sVar418 + auVar423._14_2_ + auVar276._14_2_;
                      *(short *)((long)&uStack_368 + lVar131) =
                           sVar314 * sVar263 + auVar361._0_2_ + sVar284;
                      *(short *)((long)&uStack_368 + lVar131 + 2) =
                           sVar326 * sVar313 + auVar361._2_2_ + sVar304;
                      *(short *)((long)&uStack_364 + lVar131) =
                           sVar327 * sVar414 + auVar361._4_2_ + sVar305;
                      *(short *)((long)&uStack_364 + lVar131 + 2) =
                           sVar329 * sVar415 + auVar361._6_2_ + sVar307;
                      *(short *)((long)&uStack_360 + lVar131) =
                           sVar330 * sVar416 + auVar361._8_2_ + sVar308;
                      *(short *)((long)&uStack_360 + lVar131 + 2) =
                           sVar332 * sVar431 + auVar361._10_2_ + sVar310;
                      *(short *)((long)&uStack_35c + lVar131) =
                           sVar333 * sVar417 + auVar361._12_2_ + sVar311;
                      *(short *)((long)&uStack_35c + lVar131 + 2) =
                           auVar412._14_2_ * sVar418 + auVar361._14_2_ + auVar301._14_2_;
                      *(undefined1 (*) [16])((long)aiStack_308 + lVar131) = auVar321;
                      *(undefined1 (*) [16])((long)&uStack_2a8 + lVar131) = auVar382;
                      *(short *)((long)asStack_248 + lVar131) =
                           (sVar284 - sVar314) + (sVar238 - sVar198) * -2;
                      *(short *)((long)asStack_248 + lVar131 + 2) =
                           (sVar304 - sVar326) + (sVar385 - sVar425) * -2;
                      *(short *)((long)asStack_248 + lVar131 + 4) =
                           (sVar305 - sVar327) + (sVar386 - sVar428) * -2;
                      *(short *)((long)asStack_248 + lVar131 + 6) =
                           (sVar307 - sVar329) + (sVar389 - sVar229) * -2;
                      *(short *)((long)asStack_248 + lVar131 + 8) =
                           (sVar308 - sVar330) + (sVar390 - sVar230) * -2;
                      *(short *)((long)asStack_248 + lVar131 + 10) =
                           (sVar310 - sVar332) + (sVar393 - sVar233) * -2;
                      *(short *)((long)asStack_248 + lVar131 + 0xc) =
                           (sVar311 - sVar333) + (sVar394 - sVar234) * -2;
                      *(short *)((long)asStack_248 + lVar131 + 0xe) =
                           (auVar301._14_2_ - auVar412._14_2_) + (sVar397 - sVar237) * -2;
                      *(undefined1 (*) [16])(auStack_1e8 + lVar131) = auVar362;
                      *(undefined1 (*) [16])((long)&local_188 + lVar131) = auVar221;
                      lVar131 = lVar131 + 0x10;
                      pauVar122 = (undefined1 (*) [16])(*pauVar122 + (int)((uVar200 + 2) * 8));
                    }
                    for (; lVar146 != 0x290; lVar146 = lVar146 + 0x60) {
                      auVar423 = *(undefined1 (*) [16])((long)&local_408 + lVar146);
                      sVar198 = *(short *)((long)&local_3f8 + lVar146);
                      sVar425 = *(short *)((long)&local_3f8 + lVar146 + 2);
                      sVar428 = *(short *)((long)&local_3f8 + lVar146 + 4);
                      sVar229 = *(short *)((long)&local_3f8 + lVar146 + 6);
                      sVar230 = *(short *)((long)&local_3f0 + lVar146);
                      sVar233 = *(short *)((long)&local_3f0 + lVar146 + 2);
                      sVar234 = *(short *)((long)&local_3f0 + lVar146 + 4);
                      sVar237 = *(short *)((long)&local_3f0 + lVar146 + 6);
                      sVar238 = *(short *)((long)w1 + lVar146);
                      sVar264 = *(short *)((long)w1 + lVar146 + 2);
                      sVar284 = *(short *)((long)w1 + lVar146 + 4);
                      sVar304 = *(short *)((long)w1 + lVar146 + 6);
                      sVar305 = *(short *)((long)&uStack_3d0 + lVar146);
                      sVar307 = *(short *)((long)&uStack_3d0 + lVar146 + 2);
                      sVar308 = *(short *)((long)&uStack_3cc + lVar146);
                      sVar310 = *(short *)((long)&uStack_3cc + lVar146 + 2);
                      auVar361 = psllw(*(undefined1 (*) [16])((long)w2 + lVar146),2);
                      sVar314 = auVar423._0_2_;
                      auVar322._0_2_ = sVar314 - sVar198;
                      sVar326 = auVar423._2_2_;
                      auVar322._2_2_ = sVar326 - sVar425;
                      sVar327 = auVar423._4_2_;
                      auVar322._4_2_ = sVar327 - sVar428;
                      sVar329 = auVar423._6_2_;
                      auVar322._6_2_ = sVar329 - sVar229;
                      sVar330 = auVar423._8_2_;
                      auVar322._8_2_ = sVar330 - sVar230;
                      sVar332 = auVar423._10_2_;
                      auVar322._10_2_ = sVar332 - sVar233;
                      sVar333 = auVar423._12_2_;
                      sVar335 = auVar423._14_2_;
                      auVar322._12_2_ = sVar333 - sVar234;
                      auVar322._14_2_ = sVar335 - sVar237;
                      auVar222._0_2_ = auVar361._0_2_ + sVar238 + sVar198 * sVar263;
                      auVar222._2_2_ = auVar361._2_2_ + sVar264 + sVar425 * sVar313;
                      auVar222._4_2_ = auVar361._4_2_ + sVar284 + sVar428 * sVar414;
                      auVar222._6_2_ = auVar361._6_2_ + sVar304 + sVar229 * sVar415;
                      auVar222._8_2_ = auVar361._8_2_ + sVar305 + sVar230 * sVar416;
                      auVar222._10_2_ = auVar361._10_2_ + sVar307 + sVar233 * sVar431;
                      auVar222._12_2_ = auVar361._12_2_ + sVar308 + sVar234 * sVar417;
                      auVar222._14_2_ = auVar361._14_2_ + sVar310 + sVar237 * sVar418;
                      sVar311 = *(short *)((long)&uStack_3e8 + lVar146);
                      sVar385 = *(short *)((long)&uStack_3e8 + lVar146 + 2);
                      sVar386 = *(short *)((long)&local_3e4 + lVar146);
                      sVar389 = *(short *)((long)&local_3e4 + lVar146 + 2);
                      sVar390 = *(short *)((long)&local_3e0 + lVar146);
                      sVar393 = *(short *)((long)&local_3e0 + lVar146 + 2);
                      sVar394 = *(short *)((long)w1 + lVar146 + -4);
                      sVar397 = *(short *)((long)w1 + lVar146 + -2);
                      auVar383._0_2_ = sVar198 + sVar314;
                      auVar383._2_2_ = sVar425 + sVar326;
                      auVar383._4_2_ = sVar428 + sVar327;
                      auVar383._6_2_ = sVar229 + sVar329;
                      auVar383._8_2_ = sVar230 + sVar330;
                      auVar383._10_2_ = sVar233 + sVar332;
                      auVar383._12_2_ = sVar234 + sVar333;
                      auVar383._14_2_ = sVar237 + sVar335;
                      auVar361 = psllw(auVar383,2);
                      auVar277._0_2_ = (sVar238 + sVar311) - auVar361._0_2_;
                      auVar277._2_2_ = (sVar264 + sVar385) - auVar361._2_2_;
                      auVar277._4_2_ = (sVar284 + sVar386) - auVar361._4_2_;
                      auVar277._6_2_ = (sVar304 + sVar389) - auVar361._6_2_;
                      auVar277._8_2_ = (sVar305 + sVar390) - auVar361._8_2_;
                      auVar277._10_2_ = (sVar307 + sVar393) - auVar361._10_2_;
                      auVar277._12_2_ = (sVar308 + sVar394) - auVar361._12_2_;
                      auVar277._14_2_ = (sVar310 + sVar397) - auVar361._14_2_;
                      auVar361 = psllw(auVar322,2);
                      auVar323._0_2_ = auVar361._0_2_ + (sVar238 - sVar311);
                      auVar323._2_2_ = auVar361._2_2_ + (sVar264 - sVar385);
                      auVar323._4_2_ = auVar361._4_2_ + (sVar284 - sVar386);
                      auVar323._6_2_ = auVar361._6_2_ + (sVar304 - sVar389);
                      auVar323._8_2_ = auVar361._8_2_ + (sVar305 - sVar390);
                      auVar323._10_2_ = auVar361._10_2_ + (sVar307 - sVar393);
                      auVar323._12_2_ = auVar361._12_2_ + (sVar308 - sVar394);
                      auVar323._14_2_ = auVar361._14_2_ + (sVar310 - sVar397);
                      auVar384._0_2_ = (sVar314 - sVar311) * 2 + (sVar238 - sVar198);
                      auVar384._2_2_ = (sVar326 - sVar385) * 2 + (sVar264 - sVar425);
                      auVar384._4_2_ = (sVar327 - sVar386) * 2 + (sVar284 - sVar428);
                      auVar384._6_2_ = (sVar329 - sVar389) * 2 + (sVar304 - sVar229);
                      auVar384._8_2_ = (sVar330 - sVar390) * 2 + (sVar305 - sVar230);
                      auVar384._10_2_ = (sVar332 - sVar393) * 2 + (sVar307 - sVar233);
                      auVar384._12_2_ = (sVar333 - sVar394) * 2 + (sVar308 - sVar234);
                      auVar384._14_2_ = (sVar335 - sVar397) * 2 + (sVar310 - sVar237);
                      auVar423 = psllw(auVar423,2);
                      auVar363._0_2_ =
                           sVar311 * sVar263 + auVar423._0_2_ +
                           *(short *)(&opt_q.lightmode + lVar146);
                      auVar363._2_2_ =
                           sVar385 * sVar313 + auVar423._2_2_ +
                           *(short *)(&opt_q.field_0x2 + lVar146);
                      auVar363._4_2_ =
                           sVar386 * sVar414 + auVar423._4_2_ +
                           *(short *)((long)&opt_q.num_threads + lVar146);
                      auVar363._6_2_ =
                           sVar389 * sVar415 + auVar423._6_2_ +
                           *(short *)((long)&opt_q.num_threads + lVar146 + 2);
                      auVar363._8_2_ =
                           sVar390 * sVar416 + auVar423._8_2_ +
                           *(short *)((long)&opt_q.blob_allocator + lVar146);
                      auVar363._10_2_ =
                           sVar393 * sVar431 + auVar423._10_2_ +
                           *(short *)((long)&opt_q.blob_allocator + lVar146 + 2);
                      auVar363._12_2_ =
                           sVar394 * sVar417 + auVar423._12_2_ +
                           *(short *)((long)&opt_q.blob_allocator + lVar146 + 4);
                      auVar363._14_2_ =
                           sVar397 * sVar418 + auVar423._14_2_ +
                           *(short *)((long)&opt_q.blob_allocator + lVar146 + 6);
                      *pauVar114 = auVar222;
                      *(undefined1 (*) [16])(*pauVar114 + (long)(iVar140 * 8) * 2) = auVar277;
                      *(undefined1 (*) [16])(*pauVar114 + (long)(iVar140 << 4) * 2) = auVar323;
                      psVar1 = (short *)(*pauVar114 + (long)(iVar140 * 0x18) * 2);
                      *psVar1 = (sVar238 - sVar198) + (sVar314 - sVar311) * -2;
                      psVar1[1] = (sVar264 - sVar425) + (sVar326 - sVar385) * -2;
                      psVar1[2] = (sVar284 - sVar428) + (sVar327 - sVar386) * -2;
                      psVar1[3] = (sVar304 - sVar229) + (sVar329 - sVar389) * -2;
                      psVar1[4] = (sVar305 - sVar230) + (sVar330 - sVar390) * -2;
                      psVar1[5] = (sVar307 - sVar233) + (sVar332 - sVar393) * -2;
                      psVar1[6] = (sVar308 - sVar234) + (sVar333 - sVar394) * -2;
                      psVar1[7] = (sVar310 - sVar237) + (sVar335 - sVar397) * -2;
                      *(undefined1 (*) [16])(*pauVar114 + (long)(iVar140 << 5) * 2) = auVar384;
                      *(undefined1 (*) [16])(*pauVar114 + (long)(iVar140 * 0x28) * 2) = auVar363;
                      pauVar114 = (undefined1 (*) [16])(*pauVar114 + (long)(iVar140 * 0x30) * 2);
                    }
                    pauVar124 = pauVar124 + 2;
                    pauVar108 = pauVar108 + 1;
                  }
                  pauVar173 = (undefined1 (*) [16])
                              (*pauVar173 + (long)local_568.w * local_568.elemsize * 4);
                }
              }
              piVar171 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
              local_698.c = iVar106;
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + -1;
                UNLOCK();
                if (*piVar171 == 0) {
                  if (local_568.allocator == (Allocator *)0x0) {
                    free(local_568.data);
                  }
                  else {
                    (*(local_568.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_568.cstep = 0;
              local_568.data = (void *)0x0;
              local_568.refcount._0_4_ = 0;
              local_568.refcount._4_4_ = 0;
              local_568.elemsize = 0;
              local_568.elempack = 0;
              local_568.h = 0;
              local_568.d = 0;
              local_568.c = 0;
              local_568.allocator = (Allocator *)0x0;
              local_568.dims = 0;
              local_568.w = 0;
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_reserved_7 = false;
              iVar106 = 0;
              if (0xb < iVar164) {
                iVar106 = (int)(((long)iVar164 / 6 & 0xffffffffU) >> 1);
              }
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              Mat::create((Mat *)&opt_q,iVar180 << (0xb < iVar164),iVar140 - iVar106,0x24,
                          (ulong)(uint)(iVar145 * 2),iVar145,opt->workspace_allocator);
              lVar146 = (long)iVar140;
              for (lVar131 = 0; lVar131 != 0x24; lVar131 = lVar131 + 1) {
                lVar117 = (long)(int)opt_q._44_4_ *
                          CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
                for (uVar107 = 0; (long)(uVar107 | 1) < lVar146; uVar107 = uVar107 + 2) {
                  puVar138 = (undefined8 *)((uVar107 >> 1) * lVar117 + opt_q._0_8_);
                  puVar136 = (undefined8 *)((uVar107 + lVar131 * lVar146) * 0x10 + (long)d0);
                  asVar148 = asVar170;
                  while (iVar145 = asVar148._0_4_, asVar148._0_4_ = iVar145 - 1, asVar148[2] = 0,
                        asVar148[3] = 0, iVar145 != 0) {
                    uVar203 = puVar136[1];
                    auVar424 = *(undefined1 (*) [16])(puVar136 + 2);
                    *puVar138 = *puVar136;
                    puVar138[1] = uVar203;
                    *(undefined1 (*) [16])(puVar138 + 2) = auVar424;
                    puVar136 = puVar136 + local_578 * 2;
                    puVar138 = puVar138 + 4;
                  }
                }
                for (; (long)uVar107 < lVar146; uVar107 = uVar107 + 1) {
                  puVar138 = (undefined8 *)
                             ((ulong)(((uint)uVar107 & 1) + ((uint)(uVar107 >> 1) & 0x7fffffff)) *
                              lVar117 + opt_q._0_8_);
                  puVar136 = (undefined8 *)((uVar107 + lVar131 * lVar146) * 0x10 + (long)d0);
                  asVar149 = asVar170;
                  while (iVar145 = asVar149._0_4_, asVar149._0_4_ = iVar145 - 1, asVar149[2] = 0,
                        asVar149[3] = 0, iVar145 != 0) {
                    uVar203 = puVar136[1];
                    *puVar138 = *puVar136;
                    puVar138[1] = uVar203;
                    puVar136 = puVar136 + local_578 * 2;
                    puVar138 = puVar138 + 2;
                  }
                }
              }
              local_578 = 0;
              d0[0] = 0;
              d0[1] = 0;
              d0[2] = 0;
              d0[3] = 0;
              auStack_588 = SUB1612((undefined1  [16])0x0,4);
              local_598 = (Allocator *)0x0;
              iStack_590 = 0;
              iStack_58c = 0;
              Mat::create((Mat *)d1,iVar140,0x24,(int)local_640,4,1,opt->workspace_allocator);
              uVar179 = (int)local_640 >> 2;
              pvVar144 = (this->weight_winograd43_data).data;
              sVar156 = (this->weight_winograd43_data).elemsize;
              uVar129 = 0;
              uVar107 = (ulong)uVar179;
              if ((int)uVar179 < 1) {
                uVar107 = uVar129;
              }
              local_648 = (short  [4])((this->weight_winograd43_data).cstep * sVar156);
              for (; uVar129 != uVar107; uVar129 = uVar129 + 1) {
                iVar145 = (this->weight_winograd43_data).w;
                asVar109 = d1;
                pvVar123 = pvVar144;
                asVar132 = d1;
                asVar139 = d1;
                asVar175 = d1;
                for (lVar131 = 0; lVar131 != 0x24; lVar131 = lVar131 + 1) {
                  lVar159 = (long)(int)opt_q._44_4_ *
                            CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_
                                    );
                  lVar117 = opt_q._0_8_;
                  for (uVar143 = 0; (long)(uVar143 | 1) < lVar146; uVar143 = uVar143 + 2) {
                    iVar285 = 0;
                    iVar306 = 0;
                    iVar309 = 0;
                    iVar312 = 0;
                    lVar127 = 0;
                    auVar261 = (undefined1  [16])0x0;
                    auVar325 = (undefined1  [16])0x0;
                    iVar180 = 0;
                    iVar106 = 0;
                    iVar164 = 0;
                    iVar197 = 0;
                    iVar336 = 0;
                    iVar364 = 0;
                    iVar365 = 0;
                    iVar366 = 0;
                    iVar266 = 0;
                    iVar281 = 0;
                    iVar282 = 0;
                    iVar283 = 0;
                    iVar367 = 0;
                    iVar388 = 0;
                    iVar392 = 0;
                    iVar396 = 0;
                    iVar201 = 0;
                    iVar228 = 0;
                    iVar232 = 0;
                    iVar236 = 0;
                    asVar150 = asVar170;
                    while( true ) {
                      iVar387 = asVar150._0_4_;
                      asVar150._0_4_ = iVar387 - 1;
                      asVar150[2] = 0;
                      asVar150[3] = 0;
                      iVar227 = auVar325._4_4_;
                      iVar169 = auVar261._12_4_;
                      iVar235 = auVar325._12_4_;
                      iVar391 = auVar261._4_4_;
                      iVar395 = auVar261._8_4_;
                      iVar231 = auVar325._8_4_;
                      if (iVar387 == 0) break;
                      auVar424 = *(undefined1 (*) [16])(lVar117 + lVar127);
                      auVar423 = *(undefined1 (*) [16])(lVar117 + 0x10 + lVar127);
                      auVar361 = *(undefined1 (*) [16])((long)pvVar123 + lVar127 * 2);
                      auVar273 = *(undefined1 (*) [16])((long)pvVar123 + lVar127 * 2 + 0x10);
                      auVar288 = *(undefined1 (*) [16])((long)pvVar123 + lVar127 * 2 + 0x20);
                      auVar317 = *(undefined1 (*) [16])((long)pvVar123 + lVar127 * 2 + 0x30);
                      auVar440 = pmaddwd(auVar424,auVar361);
                      iVar201 = iVar201 + auVar440._0_4_;
                      iVar228 = iVar228 + auVar440._4_4_;
                      iVar232 = iVar232 + auVar440._8_4_;
                      iVar236 = iVar236 + auVar440._12_4_;
                      auVar440 = pmaddwd(auVar424,auVar273);
                      iVar367 = iVar367 + auVar440._0_4_;
                      iVar388 = iVar388 + auVar440._4_4_;
                      iVar392 = iVar392 + auVar440._8_4_;
                      iVar396 = iVar396 + auVar440._12_4_;
                      auVar440 = pmaddwd(auVar424,auVar288);
                      iVar266 = iVar266 + auVar440._0_4_;
                      iVar281 = iVar281 + auVar440._4_4_;
                      iVar282 = iVar282 + auVar440._8_4_;
                      iVar283 = iVar283 + auVar440._12_4_;
                      auVar424 = pmaddwd(auVar424,auVar317);
                      iVar336 = iVar336 + auVar424._0_4_;
                      iVar364 = iVar364 + auVar424._4_4_;
                      iVar365 = iVar365 + auVar424._8_4_;
                      iVar366 = iVar366 + auVar424._12_4_;
                      auVar424 = pmaddwd(auVar361,auVar423);
                      iVar180 = iVar180 + auVar424._0_4_;
                      iVar106 = iVar106 + auVar424._4_4_;
                      iVar164 = iVar164 + auVar424._8_4_;
                      iVar197 = iVar197 + auVar424._12_4_;
                      auVar424 = pmaddwd(auVar273,auVar423);
                      auVar325._0_4_ = auVar325._0_4_ + auVar424._0_4_;
                      auVar325._4_4_ = iVar227 + auVar424._4_4_;
                      auVar325._8_4_ = iVar231 + auVar424._8_4_;
                      auVar325._12_4_ = iVar235 + auVar424._12_4_;
                      auVar424 = pmaddwd(auVar288,auVar423);
                      auVar261._0_4_ = auVar261._0_4_ + auVar424._0_4_;
                      auVar261._4_4_ = iVar391 + auVar424._4_4_;
                      auVar261._8_4_ = iVar395 + auVar424._8_4_;
                      auVar261._12_4_ = iVar169 + auVar424._12_4_;
                      auVar424 = pmaddwd(auVar423,auVar317);
                      iVar285 = iVar285 + auVar424._0_4_;
                      iVar306 = iVar306 + auVar424._4_4_;
                      iVar309 = iVar309 + auVar424._8_4_;
                      iVar312 = iVar312 + auVar424._12_4_;
                      lVar127 = lVar127 + 0x20;
                    }
                    *(int *)asVar139 = iVar236 + iVar232 + iVar228 + iVar201;
                    *(int *)asVar132 = iVar396 + iVar392 + iVar388 + iVar367;
                    *(int *)asVar175 = iVar283 + iVar282 + iVar281 + iVar266;
                    *(int *)asVar109 = iVar366 + iVar365 + iVar364 + iVar336;
                    *(int *)((long)asVar139 + 4) = iVar197 + iVar164 + iVar106 + iVar180;
                    *(int *)((long)asVar132 + 4) = iVar235 + iVar231 + iVar227 + auVar325._0_4_;
                    *(int *)((long)asVar175 + 4) = iVar169 + iVar395 + iVar391 + auVar261._0_4_;
                    *(int *)((long)asVar109 + 4) = iVar312 + iVar309 + iVar306 + iVar285;
                    asVar139 = (short  [4])((long)asVar139 + 8);
                    asVar132 = (short  [4])((long)asVar132 + 8);
                    asVar175 = (short  [4])((long)asVar175 + 8);
                    asVar109 = (short  [4])((long)asVar109 + 8);
                    lVar117 = lVar117 + lVar159;
                  }
                  while (uVar179 = (uint)uVar143, (int)uVar179 < iVar140) {
                    iVar180 = 0;
                    iVar106 = 0;
                    iVar164 = 0;
                    iVar197 = 0;
                    lVar117 = 0;
                    iVar201 = 0;
                    iVar228 = 0;
                    iVar232 = 0;
                    iVar236 = 0;
                    auVar225 = (undefined1  [16])0x0;
                    auVar279 = (undefined1  [16])0x0;
                    asVar125 = asVar170;
                    while( true ) {
                      iVar266 = asVar125._0_4_;
                      asVar125._0_4_ = iVar266 - 1;
                      asVar125[2] = 0;
                      asVar125[3] = 0;
                      iVar283 = auVar225._12_4_;
                      iVar285 = auVar279._4_4_;
                      iVar281 = auVar225._4_4_;
                      iVar309 = auVar279._12_4_;
                      iVar282 = auVar225._8_4_;
                      iVar306 = auVar279._8_4_;
                      if (iVar266 == 0) break;
                      auVar424 = *(undefined1 (*) [16])
                                  ((ulong)((uVar179 & 1) + ((uint)(uVar143 >> 1) & 0x7fffffff)) *
                                   lVar159 + opt_q._0_8_ + lVar117);
                      auVar423 = pmaddwd(*(undefined1 (*) [16])((long)pvVar123 + lVar117 * 4),
                                         auVar424);
                      iVar180 = iVar180 + auVar423._0_4_;
                      iVar106 = iVar106 + auVar423._4_4_;
                      iVar164 = iVar164 + auVar423._8_4_;
                      iVar197 = iVar197 + auVar423._12_4_;
                      auVar423 = pmaddwd(*(undefined1 (*) [16])((long)pvVar123 + lVar117 * 4 + 0x10)
                                         ,auVar424);
                      iVar201 = iVar201 + auVar423._0_4_;
                      iVar228 = iVar228 + auVar423._4_4_;
                      iVar232 = iVar232 + auVar423._8_4_;
                      iVar236 = iVar236 + auVar423._12_4_;
                      auVar423 = pmaddwd(*(undefined1 (*) [16])((long)pvVar123 + lVar117 * 4 + 0x20)
                                         ,auVar424);
                      auVar225._0_4_ = auVar225._0_4_ + auVar423._0_4_;
                      auVar225._4_4_ = iVar281 + auVar423._4_4_;
                      auVar225._8_4_ = iVar282 + auVar423._8_4_;
                      auVar225._12_4_ = iVar283 + auVar423._12_4_;
                      auVar424 = pmaddwd(*(undefined1 (*) [16])((long)pvVar123 + lVar117 * 4 + 0x30)
                                         ,auVar424);
                      auVar279._0_4_ = auVar279._0_4_ + auVar424._0_4_;
                      auVar279._4_4_ = iVar285 + auVar424._4_4_;
                      auVar279._8_4_ = iVar306 + auVar424._8_4_;
                      auVar279._12_4_ = iVar309 + auVar424._12_4_;
                      lVar117 = lVar117 + 0x10;
                    }
                    *(int *)asVar139 = iVar197 + iVar164 + iVar106 + iVar180;
                    *(int *)asVar132 = iVar236 + iVar232 + iVar228 + iVar201;
                    *(int *)asVar175 = iVar283 + iVar282 + iVar281 + auVar225._0_4_;
                    *(int *)asVar109 = iVar309 + iVar306 + iVar285 + auVar279._0_4_;
                    asVar139 = (short  [4])((long)asVar139 + 4);
                    asVar132 = (short  [4])((long)asVar132 + 4);
                    asVar175 = (short  [4])((long)asVar175 + 4);
                    asVar109 = (short  [4])((long)asVar109 + 4);
                    uVar143 = (ulong)(uVar179 + 1);
                  }
                  pvVar123 = (void *)((long)pvVar123 + (long)iVar145 * sVar156);
                }
                pvVar144 = (void *)((long)pvVar144 + (long)local_648);
              }
              pvVar144 = (this->weight_winograd43_data).data;
              sVar156 = (this->weight_winograd43_data).elemsize;
              sVar47 = (this->weight_winograd43_data).cstep;
              for (uVar107 = local_640 & 0xfffffffffffffffc; (long)uVar107 < (long)local_640;
                  uVar107 = uVar107 + 1) {
                uVar129 = (ulong)(uint)((int)uVar107 >> 0x1f) << 0x20 | uVar107 & 0xffffffff;
                iVar145 = (this->weight_winograd43_data).w;
                pvVar123 = (void *)((long)((int)((long)uVar129 % 4) + (int)((long)uVar129 / 4)) *
                                    sVar47 * sVar156 + (long)pvVar144);
                asVar109 = d1;
                for (lVar131 = 0; lVar131 != 0x24; lVar131 = lVar131 + 1) {
                  lVar159 = (long)(int)opt_q._44_4_ *
                            CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_
                                    );
                  lVar117 = opt_q._0_8_;
                  for (uVar129 = 0; (long)(uVar129 | 1) < lVar146; uVar129 = uVar129 + 2) {
                    iVar180 = 0;
                    iVar106 = 0;
                    iVar164 = 0;
                    iVar197 = 0;
                    lVar127 = 0;
                    iVar201 = 0;
                    iVar228 = 0;
                    iVar232 = 0;
                    iVar236 = 0;
                    asVar160 = asVar170;
                    while (iVar266 = asVar160._0_4_, asVar160._0_4_ = iVar266 - 1, asVar160[2] = 0,
                          asVar160[3] = 0, iVar266 != 0) {
                      auVar424 = pmaddwd(*(undefined1 (*) [16])(lVar117 + lVar127 * 2),
                                         *(undefined1 (*) [16])((long)pvVar123 + lVar127));
                      iVar180 = iVar180 + auVar424._0_4_;
                      iVar106 = iVar106 + auVar424._4_4_;
                      iVar164 = iVar164 + auVar424._8_4_;
                      iVar197 = iVar197 + auVar424._12_4_;
                      auVar424 = pmaddwd(*(undefined1 (*) [16])(lVar117 + 0x10 + lVar127 * 2),
                                         *(undefined1 (*) [16])((long)pvVar123 + lVar127));
                      iVar201 = iVar201 + auVar424._0_4_;
                      iVar228 = iVar228 + auVar424._4_4_;
                      iVar232 = iVar232 + auVar424._8_4_;
                      iVar236 = iVar236 + auVar424._12_4_;
                      lVar127 = lVar127 + 0x10;
                    }
                    *(ulong *)asVar109 =
                         CONCAT44(iVar232 + iVar201 + iVar236 + iVar228,
                                  iVar164 + iVar180 + iVar197 + iVar106);
                    asVar109 = (short  [4])((long)asVar109 + 8);
                    lVar117 = lVar117 + lVar159;
                  }
                  while (uVar179 = (uint)uVar129, (int)uVar179 < iVar140) {
                    iVar180 = 0;
                    iVar106 = 0;
                    iVar164 = 0;
                    iVar197 = 0;
                    lVar117 = 0;
                    asVar151 = asVar170;
                    while (iVar201 = asVar151._0_4_, asVar151._0_4_ = iVar201 - 1, asVar151[2] = 0,
                          asVar151[3] = 0, iVar201 != 0) {
                      auVar424 = pmaddwd(*(undefined1 (*) [16])((long)pvVar123 + lVar117),
                                         *(undefined1 (*) [16])
                                          ((ulong)((uVar179 & 1) +
                                                  ((uint)(uVar129 >> 1) & 0x7fffffff)) * lVar159 +
                                           opt_q._0_8_ + lVar117));
                      iVar180 = iVar180 + auVar424._0_4_;
                      iVar106 = iVar106 + auVar424._4_4_;
                      iVar164 = iVar164 + auVar424._8_4_;
                      iVar197 = iVar197 + auVar424._12_4_;
                      lVar117 = lVar117 + 0x10;
                    }
                    *(int *)asVar109 = iVar197 + iVar106 + iVar164 + iVar180;
                    asVar109 = (short  [4])((long)asVar109 + 4);
                    uVar129 = (ulong)(uVar179 + 1);
                  }
                  pvVar123 = (void *)((long)pvVar123 + (long)iVar145 * sVar156);
                }
              }
              piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + -1;
                UNLOCK();
                if (*piVar171 == 0) {
                  if (opt_q._32_8_ == 0) {
                    free((void *)opt_q._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                  }
                }
              }
              local_578 = 0;
              d0[0] = 0;
              d0[1] = 0;
              d0[2] = 0;
              d0[3] = 0;
              auStack_588 = SUB1612((undefined1  [16])0x0,4);
              local_598 = (Allocator *)0x0;
              iStack_590 = 0;
              iStack_58c = 0;
              opt_b.lightmode = false;
              opt_b._1_3_ = 0;
              opt_b.num_threads = 0;
              opt_b.blob_allocator._0_4_ = 0;
              opt_b.blob_allocator._4_4_ = 0;
              opt_b.workspace_allocator = (Allocator *)0x0;
              opt_b.openmp_blocktime = 0;
              opt_b.use_bf16_storage = false;
              opt_b.use_fp16_packed = false;
              opt_b.use_fp16_storage = false;
              opt_b.use_fp16_arithmetic = false;
              opt_b.use_int8_packed = false;
              opt_b.use_int8_storage = false;
              opt_b.use_int8_arithmetic = false;
              opt_b.use_packing_layout = false;
              opt_b.use_shader_pack8 = false;
              opt_b.use_subgroup_basic = false;
              opt_b.use_subgroup_vote = false;
              opt_b.use_subgroup_ballot = false;
              opt_b.use_subgroup_shuffle = false;
              opt_b.use_image_storage = false;
              opt_b.use_tensor_storage = false;
              opt_b.use_reserved_0 = false;
              opt_b.flush_denormals = 0;
              opt_b.use_local_pool_allocator = false;
              opt_b.use_shader_local_memory = false;
              opt_b.use_cooperative_matrix = false;
              opt_b.use_winograd23_convolution = false;
              opt_b.use_winograd43_convolution = false;
              opt_b.use_winograd63_convolution = false;
              opt_b.use_a53_a55_optimized_kernel = false;
              opt_b.use_reserved_7 = false;
              auVar190._4_4_ = -(uint)(uVar200 == local_618.w);
              auVar190._0_4_ = -(uint)(uVar200 == local_618.w);
              auVar190._8_4_ = -(uint)(uVar165 == local_618.h);
              auVar190._12_4_ = -(uint)(uVar165 == local_618.h);
              iVar145 = movmskpd((int)&local_598,auVar190);
              if (iVar145 == 3) {
                piVar171 = (int *)CONCAT44(local_618.refcount._4_4_,local_618.refcount._0_4_);
                if (piVar171 != (int *)0x0) {
                  LOCK();
                  *piVar171 = *piVar171 + 1;
                  UNLOCK();
                }
                opt_b._0_8_ = local_618.data;
                opt_b.blob_allocator._0_4_ = local_618.refcount._0_4_;
                opt_b.blob_allocator._4_4_ = local_618.refcount._4_4_;
                opt_b.workspace_allocator = (Allocator *)local_618.elemsize;
                opt_b.openmp_blocktime = local_618.elempack;
                opt_b._32_8_ = local_618.allocator;
                opt_b.use_shader_pack8 = (bool)(undefined1)local_618.dims;
                opt_b.use_subgroup_basic = (bool)local_618.dims._1_1_;
                opt_b.use_subgroup_vote = (bool)local_618.dims._2_1_;
                opt_b.use_subgroup_ballot = (bool)local_618.dims._3_1_;
                opt_b.use_subgroup_shuffle = (bool)(undefined1)local_618.w;
                opt_b.use_image_storage = (bool)local_618.w._1_1_;
                opt_b.use_tensor_storage = (bool)local_618.w._2_1_;
                opt_b.use_reserved_0 = (bool)local_618.w._3_1_;
                opt_b.flush_denormals = local_618.h;
                opt_b.use_local_pool_allocator = (bool)(undefined1)local_618.d;
                opt_b.use_shader_local_memory = (bool)local_618.d._1_1_;
                opt_b.use_cooperative_matrix = (bool)local_618.d._2_1_;
                opt_b.use_winograd23_convolution = (bool)local_618.d._3_1_;
                opt_b.use_winograd43_convolution = (bool)(undefined1)local_618.c;
                opt_b.use_winograd63_convolution = (bool)local_618.c._1_1_;
                opt_b.use_a53_a55_optimized_kernel = (bool)local_618.c._2_1_;
                opt_b.use_reserved_7 = (bool)local_618.c._3_1_;
                sVar156 = local_618.cstep;
              }
              else {
                Mat::create((Mat *)&opt_b,local_638._0_4_,(int)local_630,(int)local_640,4,1,
                            opt->workspace_allocator);
                sVar156 = 0;
              }
              iVar145 = (int)local_640;
              local_640 = local_640 & 0xffffffff;
              if (iVar145 < 1) {
                local_640 = 0;
              }
              lVar131 = (long)(int)local_638._0_4_;
              local_3f8._0_2_ = 0;
              local_3f8._2_2_ = 0;
              local_3f8._4_2_ = 0;
              local_3f8._6_2_ = 0;
              lVar117 = (long)(iVar140 * 6) * 4;
              local_630 = (void *)((long)d1 + (long)(iVar140 * 2) * 4);
              local_5c8 = (void *)((long)d1 + (long)(iVar140 * 4) * 4);
              local_638[0] = d1[0];
              local_638[1] = d1[1];
              local_638[2] = d1[2];
              local_638[3] = d1[3];
              local_5c0 = (long)d1 + (long)(iVar140 * 5) * 4;
              local_448 = (int *)(opt_b._0_8_ + 0xc);
              local_620 = sVar156 * (long)opt_b.workspace_allocator;
              local_408 = (short  [4])((long)opt_b.workspace_allocator * 4);
              for (uVar107 = 0; uVar107 != local_640; uVar107 = uVar107 + 1) {
                local_6b0 = local_448;
                asVar118[0] = 0;
                asVar118[1] = 0;
                asVar118[2] = 0;
                asVar118[3] = 0;
                local_520 = uVar107;
                while (asVar109 = asVar118, asVar109 != local_628) {
                  lVar168 = (long)((iVar158 * asVar109._0_4_) / 6);
                  asVar157[0] = 0;
                  asVar157[1] = 0;
                  asVar157[2] = 0;
                  asVar157[3] = 0;
                  lVar159 = (long)local_630;
                  asVar132 = d1;
                  uVar107 = local_5c0;
                  lVar127 = (long)local_5c8;
                  piVar171 = local_6b0;
                  lVar163 = (long)d1 + (long)(iVar140 * 3) * 4;
                  lVar178 = (long)d1 + lVar146 * 4;
                  for (; asVar157 != asVar172; asVar157 = (short  [4])((long)asVar157 + 1)) {
                    asVar139 = asVar132;
                    uVar129 = uVar107;
                    lVar128 = lVar159;
                    lVar134 = lVar127;
                    lVar162 = lVar163;
                    lVar177 = lVar178;
                    for (lVar130 = -5; lVar130 != 0; lVar130 = lVar130 + 1) {
                      iVar106 = *(int *)(lVar177 + lVar168 * 4);
                      iVar180 = *(int *)(lVar128 + lVar168 * 4);
                      iVar145 = iVar180 + iVar106;
                      iVar106 = iVar106 - iVar180;
                      iVar164 = *(int *)(lVar162 + lVar168 * 4);
                      iVar197 = *(int *)(lVar134 + lVar168 * 4);
                      iVar180 = iVar197 + iVar164;
                      iVar164 = iVar164 - iVar197;
                      *(int *)((long)&opt_q.workspace_allocator + lVar130 * 4 + 4) =
                           iVar145 + *(int *)((long)asVar139 + lVar168 * 4) + iVar180;
                      *(int *)(&opt_q.use_subgroup_shuffle + lVar130 * 4) = iVar106 + iVar164 * 2;
                      aiStack_380[lVar130 + -1] = iVar145 + iVar180 * 4;
                      *(int *)(local_378 + lVar130 * 4 + 0xc) =
                           iVar106 + iVar164 * 8 + *(int *)(uVar129 + lVar168 * 4) * 4;
                      asVar139 = (short  [4])((long)asVar139 + lVar117);
                      lVar177 = lVar177 + lVar117;
                      lVar128 = lVar128 + lVar117;
                      lVar162 = lVar162 + lVar117;
                      lVar134 = lVar134 + lVar117;
                      uVar129 = uVar129 + lVar117;
                    }
                    iVar145 = *(int *)(lVar162 + lVar168 * 4);
                    iVar180 = *(int *)(lVar134 + lVar168 * 4);
                    iVar197 = iVar145 - iVar180;
                    iVar106 = *(int *)(lVar177 + lVar168 * 4);
                    iVar164 = *(int *)(lVar128 + lVar168 * 4);
                    iVar201 = iVar106 - iVar164;
                    opt_q.workspace_allocator._4_4_ =
                         (iVar164 + iVar106 + iVar180 + iVar145 +
                         *(int *)((long)asVar139 + lVar168 * 4)) * 4;
                    opt_q._44_4_ = iVar197 * 8 + iVar201 * 4;
                    local_378._12_4_ =
                         *(int *)(uVar129 + lVar168 * 4) * 0x10 + iVar197 * 0x20 + iVar201 * 4;
                    piVar110 = piVar171;
                    for (lVar130 = 0x14; lVar130 != 0x74; lVar130 = lVar130 + 0x18) {
                      iVar106 = *(int *)((long)w1 + lVar130 + 4);
                      iVar145 = iVar106 + *(int *)((long)w1 + lVar130);
                      iVar106 = *(int *)((long)w1 + lVar130) - iVar106;
                      iVar180 = *(int *)((long)&uStack_3cc + lVar130) +
                                *(int *)((long)&uStack_3d0 + lVar130);
                      iVar164 = *(int *)((long)&uStack_3d0 + lVar130) -
                                *(int *)((long)&uStack_3cc + lVar130);
                      piVar110[-3] = (*(int *)((long)w1 + lVar130 + -4) + iVar145 + iVar180) / 0x240
                      ;
                      piVar110[-2] = (iVar106 + iVar164 * 2) / 0x240;
                      piVar110[-1] = (iVar145 + iVar180 * 4) / 0x240;
                      *piVar110 = (iVar106 + iVar164 * 8 + *(int *)(&opt_q.lightmode + lVar130)) /
                                  0x240;
                      piVar110 = piVar110 + lVar131;
                    }
                    asVar132 = (short  [4])((long)asVar132 + 4);
                    lVar178 = lVar178 + 4;
                    lVar159 = lVar159 + 4;
                    lVar163 = lVar163 + 4;
                    lVar127 = lVar127 + 4;
                    uVar107 = uVar107 + 4;
                    piVar171 = piVar171 + 4;
                  }
                  local_6b0 = (int *)((long)local_6b0 +
                                     (long)(int)opt_b._44_4_ * (long)opt_b.workspace_allocator * 4);
                  uVar107 = local_520;
                  local_648 = asVar109;
                  asVar118 = (short  [4])((long)asVar109 + 1);
                }
                local_448 = (int *)((long)local_448 + local_620);
              }
              copy_cut_border((Mat *)&opt_b,&local_618,0,opt_b.flush_denormals - local_618.h,0,
                              opt_b._44_4_ - local_618.w,opt);
              piVar171 = (int *)CONCAT44(opt_b.blob_allocator._4_4_,opt_b.blob_allocator._0_4_);
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + -1;
                UNLOCK();
                if (*piVar171 == 0) {
                  if (opt_b._32_8_ == 0) {
                    free((void *)opt_b._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt_b._32_8_ + 0x18))();
                  }
                }
              }
              piVar171 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + -1;
                UNLOCK();
                if (*piVar171 == 0) {
                  pvVar144 = local_568.data;
                  if (local_568.allocator == (Allocator *)0x0) {
LAB_001b8049:
                    free(pvVar144);
                  }
                  else {
                    (*(local_568.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            else {
              conv3x3s1_winograd43_pack8to1_int8_sse_xop
                        (&local_698,&local_618,&this->weight_winograd43_data,opt);
            }
          }
          else {
            uVar200 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var45);
            iVar180 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
            iVar140 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
            iVar197 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
            iVar201 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
            lVar131 = (long)local_618.w;
            uVar165 = uVar200 * uVar135;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_reserved_7 = false;
              Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar165,local_698.c,8,8,
                          opt->workspace_allocator);
              uVar129 = 0;
              uVar165 = iVar158;
              if (iVar158 < 1) {
                uVar165 = 0;
              }
              if ((int)uVar179 < 1) {
                uVar179 = 0;
              }
              if ((int)uVar135 < 1) {
                uVar107 = uVar129;
              }
              uVar143 = (ulong)uVar200;
              if ((int)uVar200 < 1) {
                uVar143 = uVar129;
              }
              uVar113 = (ulong)(uint)iVar106;
              if (iVar106 < 1) {
                uVar113 = uVar129;
              }
              for (; uVar129 != uVar113; uVar129 = uVar129 + 1) {
                puVar138 = (undefined8 *)opt_q._0_8_;
                for (uVar166 = 0; uVar166 != uVar143; uVar166 = uVar166 + 1) {
                  for (uVar119 = 0; uVar119 != uVar107; uVar119 = uVar119 + 1) {
                    puVar136 = (undefined8 *)
                               ((long)local_698.data +
                               uVar119 * (long)iVar180 * 8 +
                               local_698.elemsize * (long)local_698.w * (long)iVar140 * uVar166 +
                               local_698.cstep * uVar129 * local_698.elemsize);
                    for (uVar135 = 0; uVar200 = uVar165, uVar135 != uVar179; uVar135 = uVar135 + 1)
                    {
                      while (uVar200 != 0) {
                        *puVar138 = *puVar136;
                        puVar138 = puVar138 + 1;
                        puVar136 = puVar136 + iVar197;
                        uVar200 = uVar200 - 1;
                      }
                      puVar136 = puVar136 + ((long)(iVar145 * iVar201) - (long)(iVar197 * iVar158));
                    }
                  }
                }
              }
              im2col_sgemm_pack8to1_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
              piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + -1;
                UNLOCK();
                if (*piVar171 == 0) {
                  pvVar144 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001b8049;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
            }
            else {
              uVar129 = (ulong)(uint)local_618.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar165,
                         (allocator_type *)&local_568);
              uVar112 = 0;
              if ((int)uVar135 < 1) {
                uVar107 = 0;
              }
              if ((int)uVar200 < 1) {
                uVar200 = uVar112;
              }
              iVar232 = 0;
              uVar143 = uVar107;
              iVar228 = 0;
              for (; uVar112 != uVar200; uVar112 = uVar112 + 1) {
                for (lVar146 = (long)iVar228; (int)uVar143 != lVar146; lVar146 = lVar146 + 1) {
                  *(int *)(opt_q._0_8_ + lVar146 * 4) = iVar232;
                  iVar232 = iVar232 + iVar180;
                }
                iVar232 = iVar232 + (iVar145 * iVar140 - iVar180 * uVar135);
                uVar143 = (ulong)(uint)((int)uVar143 + (int)uVar107);
                iVar228 = iVar228 + (int)uVar107;
              }
              if ((int)uVar165 < 1) {
                uVar165 = 0;
              }
              uVar107 = (ulong)(uint)iVar106;
              if (iVar106 < 1) {
                uVar107 = 0;
              }
              uVar143 = 0;
              if (0 < iVar158) {
                uVar143 = (ulong)(uint)iVar158;
              }
              if ((int)uVar179 < 1) {
                uVar179 = 0;
              }
              if (iVar164 < 1) {
                uVar129 = 0;
              }
              for (uVar113 = 0; uVar113 != uVar129; uVar113 = uVar113 + 1) {
                local_710 = (Mat *)(local_618.elemsize * local_618.cstep * uVar113 +
                                   (long)local_618.data);
                for (uVar166 = 0; uVar166 != uVar179; uVar166 = uVar166 + 1) {
                  sVar156 = (this->weight_data_tm).cstep;
                  sVar47 = (this->weight_data_tm).elemsize;
                  pvVar144 = (this->weight_data_tm).data;
                  for (uVar119 = 0; uVar119 != uVar143; uVar119 = uVar119 + 1) {
                    iVar145 = 0;
                    pvVar123 = (void *)(sVar156 * uVar113 * sVar47 + (long)pvVar144);
                    for (uVar147 = 0; uVar147 != uVar107; uVar147 = uVar147 + 1) {
                      for (uVar142 = 0; uVar165 != uVar142; uVar142 = uVar142 + 1) {
                        uVar121 = *(ulong *)((long)local_698.data +
                                            (long)*(int *)(opt_q._0_8_ + uVar142 * 4) * 8 +
                                            local_698.cstep * local_698.elemsize * uVar147 +
                                            (long)(iVar197 * 8 * (int)uVar119) +
                                            (long)local_698.w * uVar166 * (long)iVar201 *
                                            local_698.elemsize);
                        cVar191 = (char)(uVar121 >> 8);
                        cVar192 = (char)(uVar121 >> 0x10);
                        cVar193 = (char)(uVar121 >> 0x18);
                        cVar194 = (char)(uVar121 >> 0x20);
                        cVar195 = (char)(uVar121 >> 0x28);
                        cVar196 = (char)(uVar121 >> 0x30);
                        auVar188._8_6_ = 0;
                        auVar188._0_8_ = uVar121;
                        auVar188[0xe] = (char)(uVar121 >> 0x38);
                        auVar188[0xf] = -((long)uVar121 < 0);
                        auVar187._14_2_ = auVar188._14_2_;
                        auVar187._8_5_ = 0;
                        auVar187._0_8_ = uVar121;
                        auVar187[0xd] = -(cVar196 < '\0');
                        auVar186._13_3_ = auVar187._13_3_;
                        auVar186._8_4_ = 0;
                        auVar186._0_8_ = uVar121;
                        auVar186[0xc] = cVar196;
                        auVar185._12_4_ = auVar186._12_4_;
                        auVar185._8_3_ = 0;
                        auVar185._0_8_ = uVar121;
                        auVar185[0xb] = -(cVar195 < '\0');
                        auVar184._11_5_ = auVar185._11_5_;
                        auVar184._8_2_ = 0;
                        auVar184._0_8_ = uVar121;
                        auVar184[10] = cVar195;
                        auVar183._10_6_ = auVar184._10_6_;
                        auVar183[8] = 0;
                        auVar183._0_8_ = uVar121;
                        auVar183[9] = -(cVar194 < '\0');
                        auVar182._9_7_ = auVar183._9_7_;
                        auVar182[8] = cVar194;
                        auVar182._0_8_ = uVar121;
                        Var78 = CONCAT91(CONCAT81(auVar182._8_8_,-(cVar193 < '\0')),cVar193);
                        auVar93._2_10_ = Var78;
                        auVar93[1] = -(cVar192 < '\0');
                        auVar93[0] = cVar192;
                        auVar92._2_12_ = auVar93;
                        auVar92[1] = -(cVar191 < '\0');
                        auVar92[0] = cVar191;
                        auVar181._0_2_ = CONCAT11(-((char)uVar121 < '\0'),(char)uVar121);
                        auVar181._2_14_ = auVar92;
                        uVar121 = *(ulong *)((long)pvVar123 + uVar142 * 8);
                        cVar191 = (char)(uVar121 >> 8);
                        cVar192 = (char)(uVar121 >> 0x10);
                        cVar193 = (char)(uVar121 >> 0x18);
                        cVar194 = (char)(uVar121 >> 0x20);
                        cVar195 = (char)(uVar121 >> 0x28);
                        cVar196 = (char)(uVar121 >> 0x30);
                        auVar216._8_6_ = 0;
                        auVar216._0_8_ = uVar121;
                        auVar216[0xe] = (char)(uVar121 >> 0x38);
                        auVar216[0xf] = -((long)uVar121 < 0);
                        auVar215._14_2_ = auVar216._14_2_;
                        auVar215._8_5_ = 0;
                        auVar215._0_8_ = uVar121;
                        auVar215[0xd] = -(cVar196 < '\0');
                        auVar214._13_3_ = auVar215._13_3_;
                        auVar214._8_4_ = 0;
                        auVar214._0_8_ = uVar121;
                        auVar214[0xc] = cVar196;
                        auVar213._12_4_ = auVar214._12_4_;
                        auVar213._8_3_ = 0;
                        auVar213._0_8_ = uVar121;
                        auVar213[0xb] = -(cVar195 < '\0');
                        auVar212._11_5_ = auVar213._11_5_;
                        auVar212._8_2_ = 0;
                        auVar212._0_8_ = uVar121;
                        auVar212[10] = cVar195;
                        auVar211._10_6_ = auVar212._10_6_;
                        auVar211[8] = 0;
                        auVar211._0_8_ = uVar121;
                        auVar211[9] = -(cVar194 < '\0');
                        auVar210._9_7_ = auVar211._9_7_;
                        auVar210[8] = cVar194;
                        auVar210._0_8_ = uVar121;
                        Var81 = CONCAT91(CONCAT81(auVar210._8_8_,-(cVar193 < '\0')),cVar193);
                        auVar95._2_10_ = Var81;
                        auVar95[1] = -(cVar192 < '\0');
                        auVar95[0] = cVar192;
                        auVar94._2_12_ = auVar95;
                        auVar94[1] = -(cVar191 < '\0');
                        auVar94[0] = cVar191;
                        auVar209._0_2_ = CONCAT11(-((char)uVar121 < '\0'),(char)uVar121);
                        auVar209._2_14_ = auVar94;
                        sVar263 = (short)Var81 * (short)Var78;
                        auVar424 = pmulhw(auVar209,auVar181);
                        iVar180 = CONCAT22(auVar424._6_2_,sVar263);
                        Var78 = CONCAT64(CONCAT42(iVar180,auVar424._4_2_),
                                         CONCAT22(auVar95._0_2_ * auVar93._0_2_,sVar263));
                        auVar96._4_8_ = (long)((unkuint10)Var78 >> 0x10);
                        auVar96._2_2_ = auVar424._2_2_;
                        auVar96._0_2_ = auVar94._0_2_ * auVar92._0_2_;
                        iVar106 = CONCAT22(auVar424._8_2_,auVar210._8_2_ * auVar182._8_2_);
                        auVar242._0_8_ =
                             CONCAT26(auVar424._10_2_,
                                      CONCAT24(auVar212._10_2_ * auVar184._10_2_,iVar106));
                        auVar242._8_2_ = auVar214._12_2_ * auVar186._12_2_;
                        auVar242._10_2_ = auVar424._12_2_;
                        auVar255._12_2_ = auVar215._14_2_ * auVar187._14_2_;
                        auVar255._0_12_ = auVar242;
                        auVar255._14_2_ = auVar424._14_2_;
                        iVar145 = iVar145 + auVar255._12_4_ + iVar180 +
                                            (int)((ulong)auVar242._0_8_ >> 0x20) + auVar96._0_4_ +
                                            auVar242._8_4_ + (int)((unkuint10)Var78 >> 0x10) +
                                            iVar106 + CONCAT22(auVar424._0_2_,
                                                               auVar209._0_2_ * auVar181._0_2_);
                      }
                      pvVar123 = (void *)((long)pvVar123 + (ulong)uVar165 * 8);
                    }
                    *(int *)((long)&local_710->data + uVar119 * 4) = iVar145;
                  }
                  local_710 = (Mat *)((long)&local_710->data + lVar131 * 4);
                }
              }
LAB_001b4766:
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
            }
          }
        }
      }
      else if (iVar180 == 1 && iVar140 == 1) {
        p_Var45 = this->_vptr_Convolution_x86[-3];
        uVar135 = *(uint *)((long)&(this->weight_winograd23_data).w + (long)p_Var45);
        uVar107 = (ulong)uVar135;
        if ((uVar135 == 1) &&
           (*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) == 1)) {
          if ((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) == 1) &&
             (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) == 1 &&
               (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) == 1)))) {
            conv1x1s1_sgemm_int8_sse(&local_698,&local_618,&this->weight_sgemm_data,opt);
          }
          else {
            if ((((*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1) ||
                 (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1)) ||
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 2)) ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 2))
            goto LAB_001b3c7c;
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator._0_4_ = 0;
            opt_q.blob_allocator._4_4_ = 0;
            opt_q.workspace_allocator._0_4_ = 0;
            opt_q.workspace_allocator._4_4_ = 0;
            opt_q.openmp_blocktime = 0;
            opt_q.use_bf16_storage = false;
            opt_q.use_fp16_packed = false;
            opt_q.use_fp16_storage = false;
            opt_q.use_fp16_arithmetic = false;
            opt_q.use_int8_packed = false;
            opt_q.use_int8_storage = false;
            opt_q.use_int8_arithmetic = false;
            opt_q.use_packing_layout = false;
            opt_q.use_shader_pack8 = false;
            opt_q.use_subgroup_basic = false;
            opt_q.use_subgroup_vote = false;
            opt_q.use_subgroup_ballot = false;
            opt_q.use_subgroup_shuffle = false;
            opt_q.use_image_storage = false;
            opt_q.use_tensor_storage = false;
            opt_q.use_reserved_0 = false;
            opt_q.flush_denormals = 0;
            opt_q.use_local_pool_allocator = false;
            opt_q.use_shader_local_memory = false;
            opt_q.use_cooperative_matrix = false;
            opt_q.use_winograd23_convolution = false;
            opt_q.use_winograd43_convolution = false;
            opt_q.use_winograd63_convolution = false;
            opt_q.use_a53_a55_optimized_kernel = false;
            opt_q.use_reserved_7 = false;
            Mat::create((Mat *)&opt_q,local_618.w,local_618.h,local_698.c,local_698.elemsize,
                        local_698.elempack,opt->workspace_allocator);
            uVar107 = 0;
            if ((int)uVar179 < 1) {
              uVar179 = 0;
            }
            uVar129 = (ulong)(uint)iVar106;
            if (iVar106 < 1) {
              uVar129 = uVar107;
            }
            for (; uVar107 != uVar129; uVar107 = uVar107 + 1) {
              puVar120 = (undefined1 *)
                         (local_698.cstep * uVar107 * local_698.elemsize + (long)local_698.data);
              lVar131 = opt_q._0_8_;
              for (uVar135 = 0; uVar135 != uVar179; uVar135 = uVar135 + 1) {
                puVar141 = puVar120 + (iVar145 - iVar158) * 2;
                puVar153 = puVar120;
                for (lVar146 = 0; (int)lVar146 + 3 < iVar158; lVar146 = lVar146 + 4) {
                  *(undefined1 *)(lVar131 + lVar146) = *puVar153;
                  *(undefined1 *)(lVar131 + 1 + lVar146) = puVar153[2];
                  *(undefined1 *)(lVar131 + 2 + lVar146) = puVar153[4];
                  *(undefined1 *)(lVar131 + 3 + lVar146) = puVar153[6];
                  puVar153 = puVar153 + 8;
                  puVar141 = puVar141 + 8;
                }
                for (; (int)lVar146 + 1 < iVar158; lVar146 = lVar146 + 2) {
                  *(undefined1 *)(lVar131 + lVar146) = *puVar153;
                  *(undefined1 *)(lVar131 + 1 + lVar146) = puVar153[2];
                  puVar153 = puVar153 + 4;
                  puVar141 = puVar141 + 4;
                }
                for (; (int)lVar146 < iVar158; lVar146 = lVar146 + 1) {
                  *(undefined1 *)(lVar131 + lVar146) = puVar120[lVar146 * 2];
                  puVar141 = puVar141 + 2;
                }
                lVar131 = lVar131 + lVar146;
                puVar120 = puVar141;
              }
            }
            conv1x1s1_sgemm_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
            piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
            if (piVar171 != (int *)0x0) {
              LOCK();
              *piVar171 = *piVar171 + -1;
              UNLOCK();
              if (*piVar171 == 0) {
                pvVar144 = (void *)opt_q._0_8_;
                if (opt_q._32_8_ == 0) goto LAB_001b8049;
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
LAB_001b3c7c:
          if ((((opt->use_winograd_convolution != true) || (uVar135 != 3)) ||
              ((opt->use_winograd23_convolution == false ||
               (((*(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var45) != 3 ||
                 (*(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45) != 1)))))) ||
             (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45) != 1)) ||
              ((iVar180 * local_628._0_4_ < 0x10 ||
               (*(int *)((long)&(this->weight_winograd23_data).dims + (long)p_Var45) < 0x10)))))) {
            uVar200 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var45);
            iVar180 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var45);
            iVar140 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var45);
            iVar197 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var45);
            lVar131 = (long)iVar197;
            iVar201 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var45);
            lVar146 = (long)local_618.w;
            uVar129 = (ulong)(uint)local_618.h;
            uVar165 = uVar200 * uVar135;
            uVar143 = (ulong)uVar165;
            if (opt->use_sgemm_convolution == true) {
              opt_q.lightmode = false;
              opt_q._1_3_ = 0;
              opt_q.num_threads = 0;
              opt_q.blob_allocator._0_4_ = 0;
              opt_q.blob_allocator._4_4_ = 0;
              opt_q.workspace_allocator._0_4_ = 0;
              opt_q.workspace_allocator._4_4_ = 0;
              opt_q.openmp_blocktime = 0;
              opt_q.use_bf16_storage = false;
              opt_q.use_fp16_packed = false;
              opt_q.use_fp16_storage = false;
              opt_q.use_fp16_arithmetic = false;
              opt_q.use_int8_packed = false;
              opt_q.use_int8_storage = false;
              opt_q.use_int8_arithmetic = false;
              opt_q.use_packing_layout = false;
              opt_q.use_shader_pack8 = false;
              opt_q.use_subgroup_basic = false;
              opt_q.use_subgroup_vote = false;
              opt_q.use_subgroup_ballot = false;
              opt_q.use_subgroup_shuffle = false;
              opt_q.use_image_storage = false;
              opt_q.use_tensor_storage = false;
              opt_q.use_reserved_0 = false;
              opt_q.flush_denormals = 0;
              opt_q.use_local_pool_allocator = false;
              opt_q.use_shader_local_memory = false;
              opt_q.use_cooperative_matrix = false;
              opt_q.use_winograd23_convolution = false;
              opt_q.use_winograd43_convolution = false;
              opt_q.use_winograd63_convolution = false;
              opt_q.use_a53_a55_optimized_kernel = false;
              opt_q.use_reserved_7 = false;
              Mat::create((Mat *)&opt_q,local_618.h * local_618.w,uVar165,local_698.c,1,1,
                          opt->workspace_allocator);
              lVar146 = (long)(iVar197 * 2);
              uVar129 = 0;
              if ((int)uVar179 < 1) {
                uVar179 = 0;
              }
              if ((int)uVar135 < 1) {
                uVar107 = uVar129;
              }
              uVar143 = (ulong)uVar200;
              if ((int)uVar200 < 1) {
                uVar143 = uVar129;
              }
              uVar113 = (ulong)(uint)iVar106;
              if (iVar106 < 1) {
                uVar113 = uVar129;
              }
              for (; uVar129 != uVar113; uVar129 = uVar129 + 1) {
                lVar117 = opt_q._0_8_;
                for (uVar166 = 0; uVar166 != uVar143; uVar166 = uVar166 + 1) {
                  for (uVar119 = 0; uVar119 != uVar107; uVar119 = uVar119 + 1) {
                    puVar120 = (undefined1 *)
                               ((long)local_698.data +
                               uVar119 * (long)iVar180 +
                               (long)local_698.w * local_698.elemsize * (long)iVar140 * uVar166 +
                               local_698.cstep * uVar129 * local_698.elemsize);
                    for (uVar135 = 0; uVar135 != uVar179; uVar135 = uVar135 + 1) {
                      lVar127 = 0;
                      puVar141 = puVar120;
                      for (lVar159 = 0; (int)lVar159 + 3 < iVar158; lVar159 = lVar159 + 4) {
                        *(undefined1 *)(lVar117 + lVar159) = *puVar141;
                        *(undefined1 *)(lVar117 + 1 + lVar159) = puVar141[lVar131];
                        *(undefined1 *)(lVar117 + 2 + lVar159) = puVar141[lVar146];
                        *(undefined1 *)(lVar117 + 3 + lVar159) = puVar141[iVar197 * 3];
                        puVar141 = puVar141 + iVar197 * 4;
                        lVar127 = lVar127 + iVar197 * 4;
                      }
                      for (; (int)lVar159 + 1 < iVar158; lVar159 = lVar159 + 2) {
                        *(undefined1 *)(lVar117 + lVar159) = *puVar141;
                        *(undefined1 *)(lVar117 + 1 + lVar159) = puVar141[lVar131];
                        puVar141 = puVar141 + lVar146;
                        lVar127 = lVar127 + lVar146;
                      }
                      for (; (int)lVar159 < iVar158; lVar159 = lVar159 + 1) {
                        *(undefined1 *)(lVar117 + lVar159) = puVar120[lVar127];
                        lVar127 = lVar127 + lVar131;
                      }
                      puVar120 = puVar120 + lVar127 + (iVar145 * iVar201 - iVar158 * iVar197);
                      lVar117 = lVar117 + lVar159;
                    }
                  }
                }
              }
              im2col_sgemm_int8_sse((Mat *)&opt_q,&local_618,&this->weight_sgemm_data,opt);
              piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
              if (piVar171 != (int *)0x0) {
                LOCK();
                *piVar171 = *piVar171 + -1;
                UNLOCK();
                if (*piVar171 == 0) {
                  pvVar144 = (void *)opt_q._0_8_;
                  if (opt_q._32_8_ == 0) goto LAB_001b8049;
                  (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
                }
              }
              goto LAB_001b4773;
            }
            uVar113 = (ulong)(uint)local_618.c;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar165,
                       (allocator_type *)&local_568);
            iVar197 = 0;
            if ((int)uVar135 < 1) {
              uVar107 = 0;
            }
            if ((int)uVar200 < 1) {
              uVar200 = 0;
            }
            uVar166 = uVar107;
            iVar228 = 0;
            for (uVar112 = 0; uVar112 != uVar200; uVar112 = uVar112 + 1) {
              for (lVar117 = (long)iVar228; (int)uVar166 != lVar117; lVar117 = lVar117 + 1) {
                *(int *)(opt_q._0_8_ + lVar117 * 4) = iVar197;
                iVar197 = iVar197 + iVar180;
              }
              iVar197 = iVar197 + (iVar145 * iVar140 - iVar180 * uVar135);
              uVar166 = (ulong)(uint)((int)uVar166 + (int)uVar107);
              iVar228 = iVar228 + (int)uVar107;
            }
            local_628 = (short  [4])(local_618.elemsize * local_618.cstep);
            if ((int)uVar165 < 1) {
              uVar143 = 0;
            }
            uVar107 = (ulong)(uint)iVar106;
            if (iVar106 < 1) {
              uVar107 = 0;
            }
            uVar166 = 0;
            if (0 < iVar158) {
              uVar166 = (ulong)(uint)iVar158;
            }
            if ((int)uVar179 < 1) {
              uVar129 = 0;
            }
            local_648 = (short  [4])local_618.data;
            if (iVar164 < 1) {
              uVar113 = 0;
            }
            for (uVar119 = 0; uVar119 != uVar113; uVar119 = uVar119 + 1) {
              local_710 = (Mat *)((long)local_628 * uVar119 + (long)local_618.data);
              for (uVar147 = 0; uVar147 != uVar129; uVar147 = uVar147 + 1) {
                pvVar144 = (this->weight_data_tm).data;
                for (uVar142 = 0; uVar142 != uVar166; uVar142 = uVar142 + 1) {
                  iVar145 = 0;
                  lVar117 = (long)pvVar144 + (long)(int)(iVar106 * uVar165 * (int)uVar119);
                  for (uVar121 = 0; uVar121 != uVar107; uVar121 = uVar121 + 1) {
                    for (uVar154 = 0; uVar143 != uVar154; uVar154 = uVar154 + 1) {
                      iVar145 = iVar145 + (int)*(char *)(lVar117 + uVar154) *
                                          (int)*(char *)((long)local_698.data +
                                                        (long)*(int *)(opt_q._0_8_ + uVar154 * 4) +
                                                        local_698.cstep * local_698.elemsize *
                                                        uVar121 + uVar142 * lVar131 +
                                                                  (long)local_698.w *
                                                                  uVar147 * (long)iVar201 *
                                                                  local_698.elemsize);
                    }
                    lVar117 = lVar117 + (int)uVar165;
                  }
                  *(int *)((long)&local_710->data + uVar142 * 4) = iVar145;
                }
                local_710 = (Mat *)((long)&local_710->data + lVar146 * 4);
              }
            }
            goto LAB_001b4766;
          }
          lVar131 = (long)local_698.c;
          local_620 = (ulong)local_618.c;
          piVar171 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
          opt_q._0_8_ = local_698.data;
          opt_q.blob_allocator._0_4_ = local_698.refcount._0_4_;
          opt_q.blob_allocator._4_4_ = local_698.refcount._4_4_;
          opt_q.workspace_allocator._0_4_ = (undefined4)local_698.elemsize;
          opt_q.workspace_allocator._4_4_ = (int)(local_698.elemsize >> 0x20);
          opt_q.openmp_blocktime = local_698.elempack;
          opt_q._32_8_ = local_698.allocator;
          opt_q._52_4_ = local_698.d;
          opt_q.flush_denormals = local_698.h;
          opt_q.use_shader_pack8 = (bool)(undefined1)local_698.dims;
          opt_q.use_subgroup_basic = (bool)local_698.dims._1_1_;
          opt_q.use_subgroup_vote = (bool)local_698.dims._2_1_;
          opt_q.use_subgroup_ballot = (bool)local_698.dims._3_1_;
          opt_q.use_subgroup_shuffle = (bool)(undefined1)local_698.w;
          opt_q.use_image_storage = (bool)local_698.w._1_1_;
          opt_q.use_tensor_storage = (bool)local_698.w._2_1_;
          opt_q.use_reserved_0 = (bool)local_698.w._3_1_;
          opt_q.use_winograd43_convolution = (bool)(undefined1)local_698.c;
          opt_q.use_winograd63_convolution = (bool)local_698.c._1_1_;
          opt_q.use_a53_a55_optimized_kernel = (bool)local_698.c._2_1_;
          opt_q.use_reserved_7 = (bool)local_698.c._3_1_;
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + 1;
            UNLOCK();
          }
          uVar107 = (long)(int)(local_618.w + 1) / 2;
          local_400 = uVar107 & 0xffffffff;
          uVar129 = (long)(int)(local_618.h + 1) / 2;
          iVar145 = (int)uVar129;
          local_3e0 = iVar145 * 2;
          iVar180 = (int)uVar107 * 2 + 2;
          opt_b.lightmode = opt->lightmode;
          opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
          opt_b.num_threads = opt->num_threads;
          opt_b.workspace_allocator = opt->workspace_allocator;
          uVar48 = opt->openmp_blocktime;
          uVar49 = opt->use_winograd_convolution;
          uVar51 = opt->use_sgemm_convolution;
          uVar53 = opt->use_int8_inference;
          uVar55 = opt->use_vulkan_compute;
          uVar54 = CONCAT11(uVar55,uVar53);
          uVar52 = CONCAT21(uVar54,uVar51);
          uVar50 = CONCAT31(uVar52,uVar49);
          opt_b.use_bf16_storage = opt->use_bf16_storage;
          opt_b.use_fp16_packed = opt->use_fp16_packed;
          opt_b.use_fp16_storage = opt->use_fp16_storage;
          opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
          opt_b.use_int8_packed = opt->use_int8_packed;
          opt_b.use_int8_storage = opt->use_int8_storage;
          opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
          opt_b.use_packing_layout = opt->use_packing_layout;
          uVar203._0_1_ = opt->use_shader_pack8;
          uVar203._1_1_ = opt->use_subgroup_basic;
          uVar203._2_1_ = opt->use_subgroup_vote;
          uVar203._3_1_ = opt->use_subgroup_ballot;
          uVar56 = opt->use_subgroup_shuffle;
          uVar57 = opt->use_image_storage;
          uVar59 = opt->use_tensor_storage;
          uVar61 = opt->use_reserved_0;
          uVar60 = CONCAT11(uVar61,uVar59);
          uVar58 = CONCAT21(uVar60,uVar57);
          uVar203._4_4_ = CONCAT31(uVar58,uVar56);
          uVar62 = opt->flush_denormals;
          uVar63 = opt->use_local_pool_allocator;
          uVar65 = opt->use_shader_local_memory;
          uVar67 = opt->use_cooperative_matrix;
          uVar69 = opt->use_winograd23_convolution;
          uVar68 = CONCAT11(uVar69,uVar67);
          uVar66 = CONCAT21(uVar68,uVar65);
          uVar64 = CONCAT31(uVar66,uVar63);
          uVar241._0_1_ = opt->use_winograd43_convolution;
          uVar241._1_1_ = opt->use_winograd63_convolution;
          uVar241._2_1_ = opt->use_a53_a55_optimized_kernel;
          uVar241._3_1_ = opt->use_reserved_7;
          uVar70 = opt->use_reserved_8;
          uVar71 = opt->use_reserved_9;
          uVar73 = opt->use_reserved_10;
          uVar75 = opt->use_reserved_11;
          uVar74 = CONCAT11(uVar75,uVar73);
          uVar72 = CONCAT21(uVar74,uVar71);
          uVar241._4_4_ = CONCAT31(uVar72,uVar70);
          opt_b._56_4_ = SUB84(uVar241,0);
          opt_b._40_4_ = SUB84(uVar203,0);
          opt_b.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
          opt_b.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
          opt_b.openmp_blocktime = uVar48;
          opt_b._28_4_ = uVar50;
          opt_b._44_4_ = uVar203._4_4_;
          opt_b.flush_denormals = uVar62;
          opt_b._52_4_ = uVar64;
          opt_b._60_4_ = uVar241._4_4_;
          copy_make_border(&local_698,(Mat *)&opt_q,0,(local_3e0 - local_698.h) + 2,0,
                           iVar180 - local_698.w,0,0.0,&opt_b);
          local_568.cstep = 0;
          asVar109._0_4_ = iVar145 * (int)local_400;
          asVar109[2] = 0;
          asVar109[3] = 0;
          local_568.data = (void *)0x0;
          local_568.refcount._0_4_ = 0;
          local_568.refcount._4_4_ = 0;
          local_568.elemsize = 0;
          local_568.elempack = 0;
          local_568.allocator = (Allocator *)0x0;
          local_568.dims = 0;
          local_568.w = 0;
          local_568.h = 0;
          local_568.d = 0;
          local_568.c = 0;
          Mat::create(&local_568,0x10,asVar109._0_4_,iVar106,2,opt->workspace_allocator);
          uVar203 = opt_q._0_8_;
          pvVar144 = local_568.data;
          uVar179 = (uint)local_400;
          local_3e4 = uVar179 * 2;
          lVar146 = CONCAT44(opt_q.workspace_allocator._4_4_,opt_q.workspace_allocator._0_4_);
          lVar117 = local_568.elemsize * local_568.cstep;
          lVar159 = (long)iVar180;
          uVar107 = 0;
          uVar135 = 0;
          if (0 < (int)uVar179) {
            uVar135 = uVar179;
          }
          uVar129 = uVar129 & 0xffffffff;
          if (iVar145 < 1) {
            uVar129 = uVar107;
          }
          uVar143 = 0;
          if (0 < iVar106) {
            uVar143 = (ulong)(uint)iVar106;
          }
          for (; uVar107 != uVar143; uVar107 = uVar107 + 1) {
            pvVar123 = (void *)(lVar117 * uVar107 + (long)pvVar144);
            for (uVar113 = 0; uVar113 != uVar129; uVar113 = uVar113 + 1) {
              lVar168 = (long)(iVar180 * 2 * (int)uVar113) + lVar146 * sVar156 * uVar107 + uVar203;
              lVar127 = lVar168 + lVar159;
              lVar163 = lVar159 + lVar127;
              lVar178 = lVar163 + lVar159;
              for (uVar179 = 0; uVar179 != uVar135; uVar179 = uVar179 + 1) {
                for (lVar130 = 0; lVar130 != 4; lVar130 = lVar130 + 1) {
                  d0[lVar130] = (short)*(char *)(lVar168 + lVar130);
                  d1[lVar130] = (short)*(char *)(lVar127 + lVar130);
                  d2[lVar130] = (short)*(char *)(lVar163 + lVar130);
                  d3[lVar130] = (short)*(char *)(lVar178 + lVar130);
                }
                for (lVar130 = 0; lVar130 != 8; lVar130 = lVar130 + 2) {
                  sVar263 = *(short *)((long)d2 + lVar130);
                  *(short *)((long)w0 + lVar130) = *(short *)((long)d0 + lVar130) - sVar263;
                  sVar313 = *(short *)((long)d1 + lVar130);
                  *(short *)((long)w1 + lVar130) = sVar313 + sVar263;
                  *(short *)((long)w2 + lVar130) = sVar263 - sVar313;
                  *(short *)((long)w3 + lVar130) = *(short *)((long)d3 + lVar130) - sVar313;
                }
                t0[1] = w1[0];
                t0[0] = w0[0];
                t1[1] = w1[1];
                t1[0] = w0[1];
                t2[1] = w1[2];
                t2[0] = w0[2];
                t3[1] = w1[3];
                t3[0] = w0[3];
                t0[2] = (short)w2._0_4_;
                t0[3] = w3[0];
                t1[3] = w3[1];
                t1[2] = w2[1];
                t2[2] = (short)w2._4_4_;
                t2[3] = w3[2];
                t3[3] = w3[3];
                t3[2] = w2[3];
                for (lVar130 = 0; lVar130 != 8; lVar130 = lVar130 + 2) {
                  sVar263 = *(short *)((long)t2 + lVar130);
                  *(short *)((long)d0 + lVar130) = *(short *)((long)t0 + lVar130) - sVar263;
                  sVar313 = *(short *)((long)t1 + lVar130);
                  *(short *)((long)d1 + lVar130) = sVar313 + sVar263;
                  *(short *)((long)d2 + lVar130) = sVar263 - sVar313;
                  *(short *)((long)d3 + lVar130) = *(short *)((long)t3 + lVar130) - sVar313;
                }
                for (lVar130 = 0; lVar130 != 8; lVar130 = lVar130 + 2) {
                  *(undefined2 *)((long)pvVar123 + lVar130) = *(undefined2 *)((long)d0 + lVar130);
                  *(undefined2 *)((long)pvVar123 + lVar130 + 8) =
                       *(undefined2 *)((long)d1 + lVar130);
                  *(undefined2 *)((long)pvVar123 + lVar130 + 0x10) =
                       *(undefined2 *)((long)d2 + lVar130);
                  *(undefined2 *)((long)pvVar123 + lVar130 + 0x18) =
                       *(undefined2 *)((long)d3 + lVar130);
                }
                lVar168 = lVar168 + 2;
                lVar127 = lVar127 + 2;
                lVar163 = lVar163 + 2;
                lVar178 = lVar178 + 2;
                pvVar123 = (void *)((long)pvVar123 + 0x20);
              }
            }
          }
          piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + -1;
            UNLOCK();
            if (*piVar171 == 0) {
              if (opt_q._32_8_ == 0) {
                free((void *)opt_q._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator._0_4_ = 0;
          opt_q.workspace_allocator._4_4_ = 0;
          opt_q.openmp_blocktime = 0;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_shader_local_memory = false;
          opt_q.use_cooperative_matrix = false;
          opt_q.use_winograd23_convolution = false;
          opt_q.use_winograd43_convolution = false;
          opt_q.use_winograd63_convolution = false;
          opt_q.use_a53_a55_optimized_kernel = false;
          opt_q.use_reserved_7 = false;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_reserved_0 = false;
          local_578 = 0;
          d0[0] = 0;
          d0[1] = 0;
          d0[2] = 0;
          d0[3] = 0;
          local_598 = (Allocator *)0x0;
          iStack_590 = 0;
          iStack_58c = 0;
          auStack_588 = SUB1612((undefined1  [16])0x0,4);
          Mat::create((Mat *)d0,0x10,asVar109._0_4_,(int)local_620,4,opt->workspace_allocator);
          asVar132._0_4_ = (int)local_620 >> 2;
          local_168 = 0;
          local_170 = (this->weight_winograd23_data).elemsize;
          lVar146 = (this->weight_winograd23_data).cstep * local_170;
          asVar139[0] = 0;
          asVar139[1] = 0;
          asVar139[2] = 0;
          asVar139[3] = 0;
          if ((int)asVar109._0_4_ < 1) {
            asVar109 = asVar139;
          }
          asVar132[2] = 0;
          asVar132[3] = 0;
          if ((int)asVar132._0_4_ < 1) {
            asVar132 = asVar139;
          }
          local_160[0] = asVar132[0];
          local_160[1] = asVar132[1];
          local_160[2] = asVar132[2];
          local_160[3] = asVar132[3];
          local_4a8 = (this->weight_winograd23_data).data;
          local_178 = lVar146 * 4;
          local_180 = local_170 * 4;
          local_630 = (void *)(lVar146 * 3 + (long)local_4a8);
          local_438 = (void *)((long)local_4a8 + lVar146 * 2);
          local_188 = 0;
          local_408._0_2_ = d0[0];
          local_408._2_2_ = d0[1];
          local_408._4_2_ = d0[2];
          local_408._6_2_ = d0[3];
          local_5c8 = (void *)((long)local_4a8 + lVar146);
          for (; asVar139 != asVar132; asVar139 = (short  [4])((long)asVar139 + 1)) {
            lVar117 = (long)(this->weight_winograd23_data).w;
            local_520 = 0;
            lVar159 = local_170 * lVar117;
            lVar117 = lVar117 * local_170 * 4;
            local_3f8._0_2_ = d0[0];
            local_3f8._2_2_ = d0[1];
            local_3f8._4_2_ = d0[2];
            local_3f8._6_2_ = d0[3];
            asVar175[0] = 0;
            asVar175[1] = 0;
            asVar175[2] = 0;
            asVar175[3] = 0;
            while (asVar133 = asVar175, asVar133 != asVar109) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              _d2 = (undefined1  [16])0x0;
              _d3 = (undefined1  [16])0x0;
              _w0 = (undefined1  [16])0x0;
              local_638 = (short  [4])(local_568.elemsize * local_568.cstep);
              lVar163 = (long)local_568.w * (long)asVar133;
              pvVar155 = (void *)((local_568.cstep * 3 + lVar163) * local_568.elemsize +
                                 (long)local_568.data);
              lVar127 = (long)local_638 * 4;
              pvVar161 = (void *)((lVar163 + local_568.cstep * 2) * local_568.elemsize +
                                 (long)local_568.data);
              pvVar176 = (void *)((local_568.cstep + lVar163) * local_568.elemsize +
                                 (long)local_568.data);
              pvVar152 = (void *)(lVar163 * local_568.elemsize + (long)local_568.data);
              local_6f8 = local_438;
              pvVar144 = local_5c8;
              pvVar123 = local_630;
              pvVar167 = local_4a8;
              for (uVar107 = 0; (long)(uVar107 | 3) < lVar131; uVar107 = uVar107 + 4) {
                for (lVar163 = 0; lVar163 != 0x20; lVar163 = lVar163 + 2) {
                  iVar158 = (int)*(short *)((long)pvVar152 + lVar163);
                  iVar145 = (int)*(short *)((long)pvVar176 + lVar163);
                  iVar180 = (int)*(short *)((long)pvVar161 + lVar163);
                  iVar106 = (int)*(short *)((long)pvVar155 + lVar163);
                  *(int *)(d1 + lVar163) =
                       *(short *)((long)pvVar167 + lVar163 + 0x60) * iVar106 +
                       *(short *)((long)pvVar167 + lVar163 + 0x40) * iVar180 +
                       *(short *)((long)pvVar167 + lVar163 + 0x20) * iVar145 +
                       *(short *)((long)pvVar167 + lVar163) * iVar158 + *(int *)(d1 + lVar163);
                  lVar178 = lVar146 + lVar163;
                  *(int *)(d2 + lVar163) =
                       *(short *)((long)pvVar167 + lVar146 + 0x60 + lVar163) * iVar106 +
                       *(short *)((long)pvVar167 + lVar146 + 0x40 + lVar163) * iVar180 +
                       *(short *)((long)pvVar167 + lVar146 + 0x20 + lVar163) * iVar145 +
                       *(short *)((long)pvVar167 + lVar146 + lVar163) * iVar158 +
                       *(int *)(d2 + lVar163);
                  lVar168 = lVar146 + lVar178;
                  *(int *)(d3 + lVar163) =
                       *(short *)((long)pvVar167 + lVar146 + 0x60 + lVar178) * iVar106 +
                       *(short *)((long)pvVar167 + lVar146 + 0x40 + lVar178) * iVar180 +
                       *(short *)((long)pvVar167 + lVar146 + 0x20 + lVar178) * iVar145 +
                       *(short *)((long)pvVar167 + lVar146 + lVar178) * iVar158 +
                       *(int *)(d3 + lVar163);
                  *(int *)(w0 + lVar163) =
                       *(short *)((long)pvVar167 + lVar146 + 0x60 + lVar168) * iVar106 +
                       *(short *)((long)pvVar167 + lVar146 + 0x40 + lVar168) * iVar180 +
                       *(short *)((long)pvVar167 + lVar146 + 0x20 + lVar168) * iVar145 +
                       *(short *)((long)pvVar167 + lVar146 + lVar168) * iVar158 +
                       *(int *)(w0 + lVar163);
                }
                pvVar155 = (void *)((long)pvVar155 + lVar127);
                pvVar161 = (void *)((long)pvVar161 + lVar127);
                pvVar176 = (void *)((long)pvVar176 + lVar127);
                pvVar167 = (void *)((long)pvVar167 + lVar117);
                pvVar152 = (void *)((long)pvVar152 + lVar127);
                pvVar123 = (void *)((long)pvVar123 + lVar117);
                local_6f8 = (void *)((long)local_6f8 + lVar117);
                pvVar144 = (void *)((long)pvVar144 + lVar117);
              }
              for (; (long)uVar107 < lVar131; uVar107 = uVar107 + 1) {
                for (lVar127 = 0; lVar127 != 0x20; lVar127 = lVar127 + 2) {
                  iVar145 = (int)*(short *)((long)pvVar152 + lVar127);
                  *(int *)(d1 + lVar127) =
                       *(int *)(d1 + lVar127) + *(short *)((long)pvVar167 + lVar127) * iVar145;
                  *(int *)(d2 + lVar127) =
                       *(int *)(d2 + lVar127) + *(short *)((long)pvVar144 + lVar127) * iVar145;
                  *(int *)(d3 + lVar127) =
                       *(int *)(d3 + lVar127) + *(short *)((long)local_6f8 + lVar127) * iVar145;
                  *(int *)(w0 + lVar127) =
                       *(int *)(w0 + lVar127) + *(short *)((long)pvVar123 + lVar127) * iVar145;
                }
                pvVar123 = (void *)((long)pvVar123 + lVar159);
                local_6f8 = (void *)((long)local_6f8 + lVar159);
                pvVar144 = (void *)((long)pvVar144 + lVar159);
                pvVar167 = (void *)((long)pvVar167 + lVar159);
                pvVar152 = (void *)((long)pvVar152 + (long)local_638);
              }
              for (lVar127 = 0; lVar127 != 0x40; lVar127 = lVar127 + 4) {
                *(undefined4 *)((long)d0 + lVar127) = *(undefined4 *)((long)d1 + lVar127);
                *(undefined4 *)((long)d0 + lVar127) = *(undefined4 *)((long)d2 + lVar127);
                *(undefined4 *)((long)local_408 + lVar127) = *(undefined4 *)((long)d3 + lVar127);
                *(undefined4 *)((long)d0 + lVar127) = *(undefined4 *)((long)w0 + lVar127);
              }
              local_648 = asVar133;
              local_628 = local_408;
              asVar175 = (short  [4])((long)asVar133 + 1);
            }
            local_4a8 = (void *)((long)local_4a8 + local_178);
            local_630 = (void *)((long)local_630 + local_178);
            local_438 = (void *)((long)local_438 + local_178);
            local_5c8 = (void *)((long)local_5c8 + local_178);
          }
          uVar107 = local_620 & 0xfffffffffffffffc;
          sVar156 = (this->weight_winograd23_data).elemsize;
          local_5c8 = (void *)((this->weight_winograd23_data).cstep * sVar156);
          local_6f0 = (void *)((long)local_5c8 * uVar107 + (long)(this->weight_winograd23_data).data
                              );
          local_5c0 = sVar156 * 3;
          local_520 = sVar156 * 4;
          local_630 = (void *)0x0;
          local_640 = 0;
          for (; (long)uVar107 < (long)local_620; uVar107 = uVar107 + 1) {
            lVar146 = (long)(this->weight_winograd23_data).w;
            local_648 = (short  [4])(local_5c0 * lVar146 + (long)local_6f0);
            lVar117 = sVar156 * 4 * lVar146;
            local_628 = (short  [4])(lVar146 * sVar156 * 2 + (long)local_6f0);
            local_638 = (short  [4])((long)local_6f0 + sVar156 * lVar146);
            asVar133[0] = 0;
            asVar133[1] = 0;
            asVar133[2] = 0;
            asVar133[3] = 0;
            for (; asVar133 != asVar109; asVar133 = (short  [4])((long)asVar133 + 1)) {
              d1[0] = 0;
              d1[1] = 0;
              d1[2] = 0;
              d1[3] = 0;
              lVar127 = (long)local_568.w * (long)asVar133;
              pvVar152 = (void *)((local_568.cstep * 3 + lVar127) * local_568.elemsize +
                                 (long)local_568.data);
              lVar159 = local_568.elemsize * local_568.cstep * 4;
              pvVar123 = (void *)((lVar127 + local_568.cstep * 2) * local_568.elemsize +
                                 (long)local_568.data);
              pvVar155 = (void *)((local_568.cstep + lVar127) * local_568.elemsize +
                                 (long)local_568.data);
              pvVar167 = (void *)(lVar127 * local_568.elemsize + (long)local_568.data);
              pvVar144 = local_6f0;
              asVar132 = local_638;
              asVar139 = local_648;
              asVar175 = local_628;
              for (uVar143 = 0; (long)(uVar143 | 3) < lVar131; uVar143 = uVar143 + 4) {
                for (lVar127 = 0; lVar127 != 0x20; lVar127 = lVar127 + 2) {
                  *(int *)(d1 + lVar127) =
                       (int)*(short *)((long)asVar139 + lVar127) *
                       (int)*(short *)((long)pvVar152 + lVar127) +
                       (int)*(short *)((long)asVar175 + lVar127) *
                       (int)*(short *)((long)pvVar123 + lVar127) +
                       (int)*(short *)((long)asVar132 + lVar127) *
                       (int)*(short *)((long)pvVar155 + lVar127) +
                       (int)*(short *)((long)pvVar144 + lVar127) *
                       (int)*(short *)((long)pvVar167 + lVar127) + *(int *)(d1 + lVar127);
                }
                asVar139 = (short  [4])((long)asVar139 + lVar117);
                pvVar152 = (void *)((long)pvVar152 + lVar159);
                asVar175 = (short  [4])((long)asVar175 + lVar117);
                pvVar123 = (void *)((long)pvVar123 + lVar159);
                asVar132 = (short  [4])((long)asVar132 + lVar117);
                pvVar155 = (void *)((long)pvVar155 + lVar159);
                pvVar144 = (void *)((long)pvVar144 + lVar117);
                pvVar167 = (void *)((long)pvVar167 + lVar159);
              }
              for (; (long)uVar143 < lVar131; uVar143 = uVar143 + 1) {
                for (lVar159 = 0; lVar159 != 0x10; lVar159 = lVar159 + 1) {
                  *(int *)(d1 + lVar159 * 2) =
                       *(int *)(d1 + lVar159 * 2) +
                       (int)*(short *)((long)pvVar144 + lVar159 * 2) *
                       (int)*(short *)((long)pvVar167 + lVar159 * 2);
                }
                pvVar144 = (void *)((long)pvVar144 + sVar156 * lVar146);
                pvVar167 = (void *)((long)pvVar167 + local_568.elemsize * local_568.cstep);
              }
              for (lVar159 = 0; lVar159 != 0x10; lVar159 = lVar159 + 1) {
                *(undefined4 *)((long)d0 + lVar159 * 4) = *(undefined4 *)(d1 + lVar159 * 2);
              }
            }
            local_6f0 = (void *)((long)local_6f0 + (long)local_5c8);
          }
          piVar171 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + -1;
            UNLOCK();
            if (*piVar171 == 0) {
              if (local_568.allocator == (Allocator *)0x0) {
                free(local_568.data);
              }
              else {
                (*(local_568.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_568.cstep = 0;
          local_568.data = (void *)0x0;
          local_568.refcount._0_4_ = 0;
          local_568.refcount._4_4_ = 0;
          local_568.elemsize = 0;
          local_568.elempack = 0;
          local_568.h = 0;
          local_568.d = 0;
          local_568.c = 0;
          local_568.allocator = (Allocator *)0x0;
          local_568.dims = 0;
          local_568.w = 0;
          d1[0] = 0;
          d1[1] = 0;
          d1[2] = 0;
          d1[3] = 0;
          Mat::create((Mat *)d1,local_3e4,local_3e0,(int)local_620,4,opt->workspace_allocator);
          uVar107 = 0;
          iVar145 = (int)local_620;
          local_620 = local_620 & 0xffffffff;
          if (iVar145 < 1) {
            local_620 = uVar107;
          }
          for (; uVar107 != local_620; uVar107 = uVar107 + 1) {
            for (uVar143 = 0; uVar143 != uVar129; uVar143 = uVar143 + 1) {
              asVar109 = d1;
              asVar132 = d1;
              for (uVar113 = 0; uVar113 != uVar135; uVar113 = uVar113 + 1) {
                for (lVar131 = 0; lVar131 != 0x10; lVar131 = lVar131 + 4) {
                  *(undefined4 *)((long)d2 + lVar131) = *(undefined4 *)((long)d0 + lVar131);
                  *(undefined4 *)((long)d3 + lVar131) = *(undefined4 *)((long)d0 + 0x10 + lVar131);
                  *(undefined4 *)((long)w0 + lVar131) = *(undefined4 *)((long)d0 + 0x20 + lVar131);
                  *(undefined4 *)((long)w1 + lVar131) = *(undefined4 *)((long)d0 + 0x30 + lVar131);
                }
                for (lVar131 = 0; lVar131 != 0x10; lVar131 = lVar131 + 4) {
                  *(int *)((long)w2 + lVar131) =
                       *(int *)((long)d2 + lVar131) + *(int *)((long)d3 + lVar131) +
                       *(int *)((long)w0 + lVar131);
                  *(int *)((long)w3 + lVar131) =
                       (*(int *)((long)d3 + lVar131) - *(int *)((long)w0 + lVar131)) +
                       *(int *)((long)w1 + lVar131);
                }
                t0[0] = w2[0];
                t0[1] = w2[1];
                t0[2] = w3[0];
                t0[3] = w3[1];
                t1[0] = w2[2];
                t1[1] = w2[3];
                t1[2] = w3[2];
                t1[3] = w3[3];
                t2[0] = (undefined2)local_410;
                t2[1] = local_410._2_2_;
                t2._4_4_ = local_420;
                t3[0] = (undefined2)local_40c;
                t3[1] = local_40c._2_2_;
                t3._4_4_ = local_41c;
                for (lVar131 = 0; lVar131 != 8; lVar131 = lVar131 + 4) {
                  *(int *)((long)o0 + lVar131) =
                       *(int *)((long)t0 + lVar131) + *(int *)((long)t1 + lVar131) +
                       *(int *)((long)t2 + lVar131);
                  *(int *)((long)local_158 + lVar131) =
                       (*(int *)((long)t1 + lVar131) - *(int *)((long)t2 + lVar131)) +
                       *(int *)((long)t3 + lVar131);
                }
                *(ulong *)asVar109 = CONCAT44(o0[1] >> 2,o0[0] >> 2);
                *(ulong *)asVar132 = CONCAT44(local_158[1] >> 2,local_158[0] >> 2);
                asVar109 = (short  [4])((long)asVar109 + 8);
                asVar132 = (short  [4])((long)asVar132 + 8);
              }
            }
          }
          copy_cut_border((Mat *)d1,&local_618,0,-local_618.h,0,-local_618.w,opt);
          piVar171 = (int *)CONCAT44(local_568.refcount._4_4_,local_568.refcount._0_4_);
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + -1;
            UNLOCK();
            if (*piVar171 == 0) {
              if (local_568.allocator == (Allocator *)0x0) {
                free(local_568.data);
              }
              else {
                (*(local_568.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar171 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar171 != (int *)0x0) {
            LOCK();
            *piVar171 = *piVar171 + -1;
            UNLOCK();
            if (*piVar171 == 0) {
              pvVar144 = (void *)opt_q._0_8_;
              if (opt_q._32_8_ == 0) goto LAB_001b8049;
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
LAB_001b4773:
    p_Var45 = this->_vptr_Convolution_x86[-3];
    if (local_3dc < 0x65) {
      dequantize_from_int32
                (&local_618,local_3f0,&this->scale_in_data,
                 (Mat *)((long)&(this->scale_in_data).elempack + (long)p_Var45),opt);
      pLVar46 = this->activation;
      iVar145 = 0;
      if (pLVar46 != (Layer *)0x0) {
        (*pLVar46->_vptr_Layer[9])(pLVar46,local_3f0,opt);
      }
    }
    else {
      iVar145 = 0;
      requantize_from_int32_to_int8
                (&local_618,local_3f0,&this->scale_in_data,
                 (Mat *)(&this->field_0x280 + (long)p_Var45),
                 (Mat *)((long)&(this->scale_in_data).elempack + (long)p_Var45),
                 *(int *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var45),
                 (Mat *)((long)&(this->weight_winograd43_data).allocator + (long)p_Var45),opt);
    }
  }
  piVar171 = (int *)CONCAT44(local_618.refcount._4_4_,local_618.refcount._0_4_);
  if (piVar171 != (int *)0x0) {
    LOCK();
    *piVar171 = *piVar171 + -1;
    UNLOCK();
    if (*piVar171 == 0) {
      if (local_618.allocator == (Allocator *)0x0) {
        free(local_618.data);
      }
      else {
        (*(local_618.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001b4854:
  piVar171 = (int *)CONCAT44(local_698.refcount._4_4_,local_698.refcount._0_4_);
  if (piVar171 != (int *)0x0) {
    LOCK();
    *piVar171 = *piVar171 + -1;
    UNLOCK();
    if (*piVar171 == 0) {
      if (local_698.allocator == (Allocator *)0x0) {
        free(local_698.data);
      }
      else {
        (*(local_698.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if (*local_100.refcount == 0) {
      if (local_100.allocator == (Allocator *)0x0) {
        free(local_100.data);
      }
      else {
        (*(local_100.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar145;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}